

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void av1_highbd_dr_prediction_z3_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_left,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint16_t uVar4;
  undefined8 uVar5;
  ushort uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  uint16_t *puVar13;
  ptrdiff_t pitchDst;
  uint uVar14;
  uint uVar15;
  undefined1 (*pauVar16) [32];
  undefined1 (*pauVar17) [16];
  int iVar18;
  uint uVar19;
  ptrdiff_t pitchSrc;
  undefined1 (*pauVar20) [32];
  uint uVar21;
  long lVar22;
  int iVar23;
  undefined8 *puVar24;
  long lVar25;
  bool bVar26;
  undefined1 (*pauVar27) [16];
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  ushort uVar118;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar188 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar299 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar297 [16];
  undefined1 auVar306 [32];
  undefined1 auVar298 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar300 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar301 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar302 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [32];
  undefined1 auVar387 [16];
  undefined1 auVar391 [32];
  undefined1 auVar388 [16];
  undefined1 auVar392 [32];
  __m256i dstvec_1 [16];
  __m128i dstvec [8];
  undefined8 auStackY_27e0 [16];
  undefined8 auStackY_2760 [2];
  undefined1 auStackY_2750 [16];
  undefined1 auStackY_2740 [32];
  undefined1 auStackY_2720 [32];
  undefined1 auStackY_2700 [32];
  undefined8 auStackY_26e0 [2];
  undefined1 auStackY_26d0 [16];
  undefined1 auStackY_26c0 [16];
  undefined1 auStackY_26b0 [8];
  undefined8 uStackY_26a8;
  int in_stack_ffffffffffffd960;
  ptrdiff_t local_2690;
  uint16_t *local_2688;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [24];
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 auStack_2360 [256];
  undefined8 auStack_2260 [32];
  undefined1 auStack_2160 [16];
  undefined1 auStack_2150 [16];
  undefined1 auStack_2140 [32];
  undefined1 auStack_2120 [32];
  undefined1 auStack_2100 [32];
  undefined1 auStack_20e0 [16];
  undefined1 auStack_20d0 [16];
  undefined1 auStack_20c0 [16];
  undefined1 auStack_20b0 [16];
  undefined1 auStack_20a0 [16];
  undefined1 auStack_2090 [16];
  undefined1 auStack_2080 [16];
  undefined1 auStack_2070 [16];
  undefined1 local_2060 [32];
  undefined1 local_2040 [32];
  undefined1 local_2020 [32];
  undefined1 local_2000 [32];
  undefined1 local_1fe0 [32];
  undefined1 local_1fc0 [32];
  undefined1 local_1fa0 [32];
  undefined1 local_1f80 [32];
  undefined1 local_1f60 [32];
  undefined1 local_1f40 [32];
  undefined1 local_1f20 [32];
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [32];
  undefined1 local_1ec0 [32];
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [32];
  undefined1 local_1e20 [32];
  undefined1 local_1e00 [32];
  undefined1 local_1de0 [32];
  undefined1 local_1dc0 [32];
  undefined1 local_1da0 [32];
  undefined1 local_1d80 [32];
  undefined1 local_1d60 [32];
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined1 local_1c20 [32];
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  undefined1 local_1ae0 [32];
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined1 local_1920 [32];
  undefined1 local_1900 [32];
  undefined1 local_18e0 [32];
  undefined1 local_18c0 [32];
  undefined1 local_18a0 [32];
  undefined1 local_1880 [32];
  undefined1 auStack_1860 [6192];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  
  iVar18 = (int)left;
  bVar10 = (byte)upsample_left;
  local_2690 = stride;
  local_2688 = dst;
  if (bw == bh) {
    if (bw < 0x10) {
      if (bw == 4) {
        iVar18 = 7 << (bVar10 & 0x1f);
        uVar4 = left[iVar18];
        auVar36._2_2_ = uVar4;
        auVar36._0_2_ = uVar4;
        auVar36._4_2_ = uVar4;
        auVar36._6_2_ = uVar4;
        auVar36._8_2_ = uVar4;
        auVar36._10_2_ = uVar4;
        auVar36._12_2_ = uVar4;
        auVar36._14_2_ = uVar4;
        if (bd < 0xc) {
          auVar64._0_2_ = (undefined2)iVar18;
          auVar64._2_2_ = auVar64._0_2_;
          auVar64._4_2_ = auVar64._0_2_;
          auVar64._6_2_ = auVar64._0_2_;
          auVar64._8_2_ = auVar64._0_2_;
          auVar64._10_2_ = auVar64._0_2_;
          auVar64._12_2_ = auVar64._0_2_;
          auVar64._14_2_ = auVar64._0_2_;
          lVar9 = 0;
          auVar93._8_2_ = 0x10;
          auVar93._0_8_ = 0x10001000100010;
          auVar93._10_2_ = 0x10;
          auVar93._12_2_ = 0x10;
          auVar93._14_2_ = 0x10;
          auVar207._8_2_ = 0x1f;
          auVar207._0_8_ = 0x1f001f001f001f;
          auVar207._10_2_ = 0x1f;
          auVar207._12_2_ = 0x1f;
          auVar207._14_2_ = 0x1f;
          auVar207._16_2_ = 0x1f;
          auVar207._18_2_ = 0x1f;
          auVar207._20_2_ = 0x1f;
          auVar207._22_2_ = 0x1f;
          auVar207._24_2_ = 0x1f;
          auVar207._26_2_ = 0x1f;
          auVar207._28_2_ = 0x1f;
          auVar207._30_2_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 4) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar36;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x40);
              }
              break;
            }
            auVar284 = *(undefined1 (*) [16])(left + (int)uVar15);
            auVar345._0_2_ = (undefined2)uVar15;
            if (upsample_left == 0) {
              auVar184 = *(undefined1 (*) [16])(left + (long)(int)uVar15 + 1);
              auVar346._2_2_ = auVar345._0_2_;
              auVar346._0_2_ = auVar345._0_2_;
              auVar346._4_2_ = auVar345._0_2_;
              auVar346._6_2_ = auVar345._0_2_;
              auVar346._8_2_ = auVar345._0_2_;
              auVar346._10_2_ = auVar345._0_2_;
              auVar346._12_2_ = auVar345._0_2_;
              auVar346._14_2_ = auVar345._0_2_;
              auVar283 = vpaddw_avx(auVar346,ZEXT816(0x7000600050004));
              auVar299 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar299 = vpinsrw_avx(auVar299,uVar15 + 2,2);
              auVar299 = vpinsrw_avx(auVar299,uVar15 + 3,3);
              auVar283 = vpunpcklqdq_avx(auVar299,auVar283);
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar389._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar389._8_2_ = uVar118;
              auVar389._10_2_ = uVar118;
              auVar389._12_2_ = uVar118;
              auVar389._14_2_ = uVar118;
            }
            else {
              auVar284 = vpshufb_avx(auVar284,_DAT_0051e800);
              auVar184 = vpsrldq_avx(auVar284,8);
              auVar345._2_2_ = auVar345._0_2_;
              auVar345._4_2_ = auVar345._0_2_;
              auVar345._6_2_ = auVar345._0_2_;
              auVar345._8_2_ = auVar345._0_2_;
              auVar345._10_2_ = auVar345._0_2_;
              auVar345._12_2_ = auVar345._0_2_;
              auVar345._14_2_ = auVar345._0_2_;
              auVar283 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 4,2);
              auVar299 = vpinsrw_avx(auVar283,uVar15 + 6,3);
              auVar283 = vpaddw_avx(auVar345,ZEXT816(0xe000c000a0008));
              auVar283 = vpunpcklqdq_avx(auVar299,auVar283);
              auVar392._0_2_ = (undefined2)uVar14;
              auVar392._2_2_ = auVar392._0_2_;
              auVar392._4_2_ = auVar392._0_2_;
              auVar392._6_2_ = auVar392._0_2_;
              auVar392._8_2_ = auVar392._0_2_;
              auVar392._10_2_ = auVar392._0_2_;
              auVar392._12_2_ = auVar392._0_2_;
              auVar392._14_2_ = auVar392._0_2_;
              auVar392._16_2_ = auVar392._0_2_;
              auVar392._18_2_ = auVar392._0_2_;
              auVar392._20_2_ = auVar392._0_2_;
              auVar392._22_2_ = auVar392._0_2_;
              auVar392._24_2_ = auVar392._0_2_;
              auVar392._26_2_ = auVar392._0_2_;
              auVar392._28_2_ = auVar392._0_2_;
              auVar392._30_2_ = auVar392._0_2_;
              auVar167 = vpsllw_avx2(auVar392,ZEXT416((uint)upsample_left));
              auVar167 = vpsrlw_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar207);
              auVar389 = auVar167._0_16_;
            }
            auVar283 = vpcmpgtw_avx(auVar64,auVar283);
            auVar184 = vpsubw_avx(auVar184,auVar284);
            auVar184 = vpmullw_avx(auVar184,auVar389);
            auVar284 = vpsllw_avx(auVar284,5);
            auVar284 = vpaddw_avx(auVar284,auVar93);
            auVar284 = vpaddw_avx(auVar184,auVar284);
            auVar284 = vpsrlw_avx(auVar284,5);
            auVar284 = vpblendvb_avx(auVar36,auVar284,auVar283);
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 4);
        }
        else {
          auVar65._4_4_ = iVar18;
          auVar65._0_4_ = iVar18;
          auVar65._8_4_ = iVar18;
          auVar65._12_4_ = iVar18;
          lVar9 = 0;
          auVar94._8_4_ = 0x10;
          auVar94._0_8_ = 0x1000000010;
          auVar94._12_4_ = 0x10;
          auVar124._8_4_ = 0x1f;
          auVar124._0_8_ = 0x1f0000001f;
          auVar124._12_4_ = 0x1f;
          auVar124._16_4_ = 0x1f;
          auVar124._20_4_ = 0x1f;
          auVar124._24_4_ = 0x1f;
          auVar124._28_4_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 4) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar36;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x40);
              }
              break;
            }
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
            auVar284 = auVar167._0_16_;
            if (upsample_left == 0) {
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
              auVar283 = auVar167._0_16_;
              auVar184 = vpinsrd_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 2,2);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 3,3);
              uVar15 = uVar14 >> 1;
              auVar286._0_8_ = CONCAT44(uVar15,uVar15) & 0x1f0000001f;
              auVar286._8_4_ = uVar15 & 0x1f;
              auVar286._12_4_ = uVar15 & 0x1f;
            }
            else {
              auVar167 = vpshufd_avx2(auVar167,0xd8);
              auVar167 = vpermq_avx2(auVar167,0xd8);
              auVar284 = auVar167._0_16_;
              auVar283 = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar167._16_16_;
              auVar184 = vpinsrd_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 4,2);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 6,3);
              auVar292._4_4_ = uVar14;
              auVar292._0_4_ = uVar14;
              auVar292._8_4_ = uVar14;
              auVar292._12_4_ = uVar14;
              auVar292._16_4_ = uVar14;
              auVar292._20_4_ = uVar14;
              auVar292._24_4_ = uVar14;
              auVar292._28_4_ = uVar14;
              auVar167 = vpslld_avx2(auVar292,ZEXT416((uint)upsample_left));
              auVar167 = vpsrld_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar124);
              auVar286 = auVar167._0_16_;
            }
            auVar299 = vpcmpgtd_avx(auVar65,auVar184);
            auVar184 = vpsubd_avx(auVar283,auVar284);
            auVar184 = vpmulld_avx(auVar184,auVar286);
            auVar284 = vpslld_avx(auVar284,5);
            auVar284 = vpaddd_avx(auVar284,auVar94);
            auVar284 = vpaddd_avx(auVar184,auVar284);
            auVar284 = vpsrld_avx(auVar284,5);
            auVar184 = vpackusdw_avx(auVar284,auVar284);
            auVar284 = vpackssdw_avx(auVar299,auVar299);
            auVar284 = vpblendvb_avx(auVar36,auVar184,auVar284);
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 4);
        }
        auVar284 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
        auVar184 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
        auVar283 = vpunpckldq_avx(auVar284,auVar184);
        *(long *)dst = auVar283._0_8_;
        uVar5 = vpextrq_avx(auVar283,1);
        *(undefined8 *)(dst + stride) = uVar5;
        auVar284 = vpunpckhdq_avx(auVar284,auVar184);
        *(long *)(dst + stride * 2) = auVar284._0_8_;
        uVar5 = vpextrq_avx(auVar284,1);
        *(undefined8 *)(dst + stride * 3) = uVar5;
        return;
      }
      if (bw != 8) {
        return;
      }
      iVar18 = 0xf << (bVar10 & 0x1f);
      uVar4 = left[iVar18];
      auVar31._2_2_ = uVar4;
      auVar31._0_2_ = uVar4;
      auVar31._4_2_ = uVar4;
      auVar31._6_2_ = uVar4;
      auVar31._8_2_ = uVar4;
      auVar31._10_2_ = uVar4;
      auVar31._12_2_ = uVar4;
      auVar31._14_2_ = uVar4;
      auVar43._16_2_ = uVar4;
      auVar43._0_16_ = auVar31;
      auVar43._18_2_ = uVar4;
      auVar43._20_2_ = uVar4;
      auVar43._22_2_ = uVar4;
      auVar43._24_2_ = uVar4;
      auVar43._26_2_ = uVar4;
      auVar43._28_2_ = uVar4;
      auVar43._30_2_ = uVar4;
      if (bd < 0xc) {
        auVar62._0_2_ = (undefined2)iVar18;
        auVar62._2_2_ = auVar62._0_2_;
        auVar62._4_2_ = auVar62._0_2_;
        auVar62._6_2_ = auVar62._0_2_;
        auVar62._8_2_ = auVar62._0_2_;
        auVar62._10_2_ = auVar62._0_2_;
        auVar62._12_2_ = auVar62._0_2_;
        auVar62._14_2_ = auVar62._0_2_;
        lVar9 = 0;
        auVar91._8_2_ = 0x10;
        auVar91._0_8_ = 0x10001000100010;
        auVar91._10_2_ = 0x10;
        auVar91._12_2_ = 0x10;
        auVar91._14_2_ = 0x10;
        auVar148._8_2_ = 0x1f;
        auVar148._0_8_ = 0x1f001f001f001f;
        auVar148._10_2_ = 0x1f;
        auVar148._12_2_ = 0x1f;
        auVar148._14_2_ = 0x1f;
        auVar148._16_2_ = 0x1f;
        auVar148._18_2_ = 0x1f;
        auVar148._20_2_ = 0x1f;
        auVar148._22_2_ = 0x1f;
        auVar148._24_2_ = 0x1f;
        auVar148._26_2_ = 0x1f;
        auVar148._28_2_ = 0x1f;
        auVar148._30_2_ = 0x1f;
        uVar11 = 0;
        uVar14 = dy;
        do {
          uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
          if (iVar18 <= (int)uVar15) {
            if (uVar11 < 8) {
              do {
                *(undefined1 (*) [16])(local_2060 + lVar9) = auVar31;
                lVar9 = lVar9 + 0x10;
              } while (lVar9 != 0x80);
            }
            break;
          }
          auVar284 = *(undefined1 (*) [16])(left + (int)uVar15);
          if (upsample_left == 0) {
            auVar184 = *(undefined1 (*) [16])(left + (long)(int)uVar15 + 1);
            auVar283 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 1,1);
            auVar283 = vpinsrw_avx(auVar283,uVar15 + 2,2);
            auVar283 = vpinsrw_avx(auVar283,uVar15 + 3,3);
            auVar283 = vpinsrw_avx(auVar283,uVar15 + 4,4);
            auVar283 = vpinsrw_avx(auVar283,uVar15 + 5,5);
            auVar283 = vpinsrw_avx(auVar283,uVar15 + 6,6);
            auVar283 = vpinsrw_avx(auVar283,uVar15 + 7,7);
            uVar6 = (ushort)(uVar14 >> 1);
            uVar118 = uVar6 & 0x1f;
            auVar298._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar298._8_2_ = uVar118;
            auVar298._10_2_ = uVar118;
            auVar298._12_2_ = uVar118;
            auVar298._14_2_ = uVar118;
          }
          else {
            auVar184 = vpblendw_avx(auVar284,(undefined1  [16])0x0,0xaa);
            auVar283 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),
                                    (undefined1  [16])0x0,0xaa);
            auVar342 = vpsrld_avx(auVar284,0x10);
            auVar284 = vpackusdw_avx(auVar184,auVar283);
            auVar299 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),0x10);
            auVar184 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 2,1);
            auVar184 = vpinsrw_avx(auVar184,uVar15 + 4,2);
            auVar184 = vpinsrw_avx(auVar184,uVar15 + 6,3);
            auVar184 = vpinsrw_avx(auVar184,uVar15 + 8,4);
            auVar184 = vpinsrw_avx(auVar184,uVar15 + 10,5);
            auVar184 = vpinsrw_avx(auVar184,uVar15 + 0xc,6);
            auVar283 = vpinsrw_avx(auVar184,uVar15 + 0xe,7);
            auVar306._0_2_ = (undefined2)uVar14;
            auVar306._2_2_ = auVar306._0_2_;
            auVar306._4_2_ = auVar306._0_2_;
            auVar306._6_2_ = auVar306._0_2_;
            auVar306._8_2_ = auVar306._0_2_;
            auVar306._10_2_ = auVar306._0_2_;
            auVar306._12_2_ = auVar306._0_2_;
            auVar306._14_2_ = auVar306._0_2_;
            auVar306._16_2_ = auVar306._0_2_;
            auVar306._18_2_ = auVar306._0_2_;
            auVar306._20_2_ = auVar306._0_2_;
            auVar306._22_2_ = auVar306._0_2_;
            auVar306._24_2_ = auVar306._0_2_;
            auVar306._26_2_ = auVar306._0_2_;
            auVar306._28_2_ = auVar306._0_2_;
            auVar306._30_2_ = auVar306._0_2_;
            auVar167 = vpsllw_avx2(auVar306,ZEXT416((uint)upsample_left));
            auVar184 = vpackusdw_avx(auVar342,auVar299);
            auVar167 = vpsrlw_avx2(auVar167,1);
            auVar167 = vpand_avx2(auVar167,auVar148);
            auVar298 = auVar167._0_16_;
          }
          auVar299 = vpsllw_avx(auVar284,5);
          auVar299 = vpaddw_avx(auVar299,auVar91);
          auVar284 = vpsubw_avx(auVar184,auVar284);
          auVar284 = vpmullw_avx(auVar298,auVar284);
          auVar284 = vpaddw_avx(auVar299,auVar284);
          auVar184 = vpsrlw_avx(auVar284,5);
          auVar284 = vpcmpgtw_avx(auVar62,auVar283);
          auVar284 = vpblendvb_avx(auVar31,auVar184,auVar284);
          *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
          uVar14 = uVar14 + dy;
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar11 != 8);
      }
      else {
        auVar75._4_4_ = iVar18;
        auVar75._0_4_ = iVar18;
        auVar75._8_4_ = iVar18;
        auVar75._12_4_ = iVar18;
        auVar75._16_4_ = iVar18;
        auVar75._20_4_ = iVar18;
        auVar75._24_4_ = iVar18;
        auVar75._28_4_ = iVar18;
        lVar9 = 0;
        auVar284 = vpmovsxbd_avx(ZEXT416(0x3020104));
        auVar104._8_4_ = 0x10;
        auVar104._0_8_ = 0x1000000010;
        auVar104._12_4_ = 0x10;
        auVar104._16_4_ = 0x10;
        auVar104._20_4_ = 0x10;
        auVar104._24_4_ = 0x10;
        auVar104._28_4_ = 0x10;
        auVar184 = vpmovsxbd_avx(ZEXT416(0x6040208));
        auVar172._8_4_ = 0x1f;
        auVar172._0_8_ = 0x1f0000001f;
        auVar172._12_4_ = 0x1f;
        auVar172._16_4_ = 0x1f;
        auVar172._20_4_ = 0x1f;
        auVar172._24_4_ = 0x1f;
        auVar172._28_4_ = 0x1f;
        uVar11 = 0;
        uVar14 = dy;
        do {
          iVar23 = (int)uVar14 >> (6 - bVar10 & 0x1f);
          if (iVar18 <= iVar23) {
            if (uVar11 < 8) {
              do {
                *(undefined1 (*) [16])(local_2060 + lVar9) = auVar31;
                lVar9 = lVar9 + 0x10;
              } while (lVar9 != 0x80);
            }
            break;
          }
          auVar219 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
          if (upsample_left == 0) {
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
            auVar300._4_4_ = iVar23;
            auVar300._0_4_ = iVar23;
            auVar300._8_4_ = iVar23;
            auVar300._12_4_ = iVar23;
            iVar1 = iVar23 + 5;
            iVar2 = iVar23 + 6;
            iVar23 = iVar23 + 7;
            auVar283 = vpaddd_avx(auVar300,auVar284);
            auVar170 = vpermq_avx2(ZEXT1632(auVar283),0xc4);
            auVar170 = vpblendd_avx2(auVar170,ZEXT1632(auVar300),1);
            auVar355._4_4_ = iVar1;
            auVar355._0_4_ = iVar1;
            auVar355._8_4_ = iVar1;
            auVar355._12_4_ = iVar1;
            auVar355._16_4_ = iVar1;
            auVar355._20_4_ = iVar1;
            auVar355._24_4_ = iVar1;
            auVar355._28_4_ = iVar1;
            auVar170 = vpblendd_avx2(auVar170,auVar355,0x20);
            auVar356._4_4_ = iVar2;
            auVar356._0_4_ = iVar2;
            auVar356._8_4_ = iVar2;
            auVar356._12_4_ = iVar2;
            auVar356._16_4_ = iVar2;
            auVar356._20_4_ = iVar2;
            auVar356._24_4_ = iVar2;
            auVar356._28_4_ = iVar2;
            auVar170 = vpblendd_avx2(auVar170,auVar356,0x40);
            auVar357._4_4_ = iVar23;
            auVar357._0_4_ = iVar23;
            auVar357._8_4_ = iVar23;
            auVar357._12_4_ = iVar23;
            auVar357._16_4_ = iVar23;
            auVar357._20_4_ = iVar23;
            auVar357._24_4_ = iVar23;
            auVar357._28_4_ = iVar23;
            auVar170 = vpblendd_avx2(auVar170,auVar357,0x80);
            uVar15 = uVar14 >> 1;
            uVar21 = uVar15 & 0x1f;
            auVar358._0_8_ = CONCAT44(uVar15,uVar15) & 0x1f0000001f;
            auVar358._8_4_ = uVar21;
            auVar358._12_4_ = uVar21;
            auVar358._16_4_ = uVar21;
            auVar358._20_4_ = uVar21;
            auVar358._24_4_ = uVar21;
            auVar358._28_4_ = uVar21;
          }
          else {
            auVar170 = vpshufd_avx2(auVar219,0xd8);
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
            auVar168 = vpermq_avx2(auVar170,0xd8);
            auVar167 = vpshufd_avx2(auVar167,0xd8);
            auVar130 = vpermq_avx2(auVar167,0xd8);
            auVar185._4_4_ = iVar23;
            auVar185._0_4_ = iVar23;
            auVar185._8_4_ = iVar23;
            auVar185._12_4_ = iVar23;
            iVar1 = iVar23 + 10;
            iVar2 = iVar23 + 0xc;
            iVar23 = iVar23 + 0xe;
            auVar283 = vpaddd_avx(auVar185,auVar184);
            auVar167 = vpermq_avx2(ZEXT1632(auVar283),0xc4);
            auVar167 = vpblendd_avx2(auVar167,ZEXT1632(auVar185),1);
            auVar314._4_4_ = iVar1;
            auVar314._0_4_ = iVar1;
            auVar314._8_4_ = iVar1;
            auVar314._12_4_ = iVar1;
            auVar314._16_4_ = iVar1;
            auVar314._20_4_ = iVar1;
            auVar314._24_4_ = iVar1;
            auVar314._28_4_ = iVar1;
            auVar167 = vpblendd_avx2(auVar167,auVar314,0x20);
            auVar315._4_4_ = iVar2;
            auVar315._0_4_ = iVar2;
            auVar315._8_4_ = iVar2;
            auVar315._12_4_ = iVar2;
            auVar315._16_4_ = iVar2;
            auVar315._20_4_ = iVar2;
            auVar315._24_4_ = iVar2;
            auVar315._28_4_ = iVar2;
            auVar167 = vpblendd_avx2(auVar167,auVar315,0x40);
            auVar316._4_4_ = iVar23;
            auVar316._0_4_ = iVar23;
            auVar316._8_4_ = iVar23;
            auVar316._12_4_ = iVar23;
            auVar316._16_4_ = iVar23;
            auVar316._20_4_ = iVar23;
            auVar316._24_4_ = iVar23;
            auVar316._28_4_ = iVar23;
            auVar170 = vpblendd_avx2(auVar167,auVar316,0x80);
            auVar218._4_4_ = uVar14;
            auVar218._0_4_ = uVar14;
            auVar218._8_4_ = uVar14;
            auVar218._12_4_ = uVar14;
            auVar218._16_4_ = uVar14;
            auVar218._20_4_ = uVar14;
            auVar218._24_4_ = uVar14;
            auVar218._28_4_ = uVar14;
            auVar167 = vpslld_avx2(auVar218,ZEXT416((uint)upsample_left));
            auVar219._0_16_ = ZEXT116(0) * auVar130._0_16_ + ZEXT116(1) * auVar168._0_16_;
            auVar219._16_16_ = ZEXT116(0) * auVar168._16_16_ + ZEXT116(1) * auVar130._0_16_;
            auVar167 = vpsrld_avx2(auVar167,1);
            auVar358 = vpand_avx2(auVar167,auVar172);
            auVar167 = vperm2i128_avx2(auVar168,auVar130,0x31);
          }
          auVar170 = vpcmpgtd_avx2(auVar75,auVar170);
          auVar167 = vpsubd_avx2(auVar167,auVar219);
          auVar168 = vpmulld_avx2(auVar167,auVar358);
          auVar167 = vpslld_avx2(auVar219,5);
          auVar167 = vpaddd_avx2(auVar167,auVar104);
          auVar167 = vpaddd_avx2(auVar168,auVar167);
          auVar167 = vpsrld_avx2(auVar167,5);
          auVar299 = vpackusdw_avx(auVar167._0_16_,auVar167._16_16_);
          auVar283 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
          auVar167 = vpblendvb_avx2(auVar43,ZEXT1632(auVar299),ZEXT1632(auVar283));
          *(undefined1 (*) [16])(local_2060 + lVar9) = auVar167._0_16_;
          uVar14 = uVar14 + dy;
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar11 != 8);
      }
      auVar284 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
      auVar184 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
      auVar283 = vpunpcklwd_avx(local_2020._0_16_,local_2020._16_16_);
      auVar299 = vpunpcklwd_avx(local_2000._0_16_,local_2000._16_16_);
      auVar342 = vpunpckldq_avx(auVar284,auVar184);
      auVar347 = vpunpckldq_avx(auVar283,auVar299);
      local_2660._0_16_ = vpunpcklqdq_avx(auVar342,auVar347);
      unique0x00102d80 = vpunpckhqdq_avx(auVar342,auVar347);
      auVar284 = vpunpckhdq_avx(auVar284,auVar184);
      auVar184 = vpunpckhdq_avx(auVar283,auVar299);
      local_2640._0_16_ = vpunpcklqdq_avx(auVar284,auVar184);
      local_2640._16_16_ = vpunpckhqdq_avx(auVar284,auVar184);
      auVar284 = vpunpckhwd_avx(local_2060._0_16_,local_2060._16_16_);
      auVar184 = vpunpckhwd_avx(local_2040._0_16_,local_2040._16_16_);
      auVar283 = vpunpckhwd_avx(local_2020._0_16_,local_2020._16_16_);
      auVar299 = vpunpckhwd_avx(local_2000._0_16_,local_2000._16_16_);
      auVar342 = vpunpckldq_avx(auVar284,auVar184);
      auVar347 = vpunpckldq_avx(auVar283,auVar299);
      local_2620._0_16_ = vpunpcklqdq_avx(auVar342,auVar347);
      local_2620._16_16_ = vpunpckhqdq_avx(auVar342,auVar347);
      auVar284 = vpunpckhdq_avx(auVar284,auVar184);
      auVar184 = vpunpckhdq_avx(auVar283,auVar299);
      local_2600._0_16_ = vpunpcklqdq_avx(auVar284,auVar184);
      local_2600._16_16_ = vpunpckhqdq_avx(auVar284,auVar184);
      lVar9 = 0;
      do {
        uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_2660 + lVar9);
        *(undefined8 *)(dst + 4) = uVar5;
        lVar9 = lVar9 + 0x10;
        dst = dst + stride;
      } while (lVar9 != 0x80);
      return;
    }
    if (bw == 0x10) {
      uVar4 = left[0x1f];
      auVar34._2_2_ = uVar4;
      auVar34._0_2_ = uVar4;
      auVar34._4_2_ = uVar4;
      auVar34._6_2_ = uVar4;
      auVar34._8_2_ = uVar4;
      auVar34._10_2_ = uVar4;
      auVar34._12_2_ = uVar4;
      auVar34._14_2_ = uVar4;
      auVar45._16_2_ = uVar4;
      auVar45._0_16_ = auVar34;
      auVar45._18_2_ = uVar4;
      auVar45._20_2_ = uVar4;
      auVar45._22_2_ = uVar4;
      auVar45._24_2_ = uVar4;
      auVar45._26_2_ = uVar4;
      auVar45._28_2_ = uVar4;
      auVar45._30_2_ = uVar4;
      lVar9 = 0;
      if (bd < 0xc) {
        auVar71._8_2_ = 0x10;
        auVar71._0_8_ = 0x10001000100010;
        auVar71._10_2_ = 0x10;
        auVar71._12_2_ = 0x10;
        auVar71._14_2_ = 0x10;
        auVar71._16_2_ = 0x10;
        auVar71._18_2_ = 0x10;
        auVar71._20_2_ = 0x10;
        auVar71._22_2_ = 0x10;
        auVar71._24_2_ = 0x10;
        auVar71._26_2_ = 0x10;
        auVar71._28_2_ = 0x10;
        auVar71._30_2_ = 0x10;
        auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar100._8_2_ = 0x1e;
        auVar100._0_8_ = 0x1e001e001e001e;
        auVar100._10_2_ = 0x1e;
        auVar100._12_2_ = 0x1e;
        auVar100._14_2_ = 0x1e;
        auVar100._16_2_ = 0x1e;
        auVar100._18_2_ = 0x1e;
        auVar100._20_2_ = 0x1e;
        auVar100._22_2_ = 0x1e;
        auVar100._24_2_ = 0x1e;
        auVar100._26_2_ = 0x1e;
        auVar100._28_2_ = 0x1e;
        auVar100._30_2_ = 0x1e;
        uVar11 = 0;
        uVar14 = dy;
        do {
          uVar15 = (int)uVar14 >> 6;
          if (0x1e < (int)uVar15) {
            if (uVar11 < 0x10) {
              do {
                *(undefined1 (*) [32])(local_2660 + lVar9) = auVar45;
                lVar9 = lVar9 + 0x20;
              } while (lVar9 != 0x200);
            }
            break;
          }
          uVar6 = (ushort)(uVar14 >> 1);
          uVar118 = uVar6 & 0x1f;
          auVar120._0_8_ = CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
          auVar120._8_2_ = uVar118;
          auVar120._10_2_ = uVar118;
          auVar120._12_2_ = uVar118;
          auVar120._14_2_ = uVar118;
          auVar120._16_2_ = uVar118;
          auVar120._18_2_ = uVar118;
          auVar120._20_2_ = uVar118;
          auVar120._22_2_ = uVar118;
          auVar120._24_2_ = uVar118;
          auVar120._26_2_ = uVar118;
          auVar120._28_2_ = uVar118;
          auVar120._30_2_ = uVar118;
          auVar167 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar15 + 1),
                                 *(undefined1 (*) [32])(left + (int)uVar15));
          auVar170 = vpmullw_avx2(auVar167,auVar120);
          auVar167 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar15),5);
          auVar167 = vpaddw_avx2(auVar167,auVar71);
          auVar167 = vpaddw_avx2(auVar170,auVar167);
          auVar170 = vpsrlw_avx2(auVar167,5);
          auVar140._0_2_ = (undefined2)uVar15;
          auVar140._2_2_ = auVar140._0_2_;
          auVar140._4_2_ = auVar140._0_2_;
          auVar140._6_2_ = auVar140._0_2_;
          auVar140._8_2_ = auVar140._0_2_;
          auVar140._10_2_ = auVar140._0_2_;
          auVar140._12_2_ = auVar140._0_2_;
          auVar140._14_2_ = auVar140._0_2_;
          auVar184 = vpaddw_avx(auVar140,auVar284);
          auVar283 = vpslldq_avx(auVar184,2);
          auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
          auVar184 = vpsrldq_avx(auVar184,0xe);
          auVar150._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar34;
          auVar150._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar184;
          auVar199._0_2_ = (undefined2)(uVar15 + 9);
          auVar199._2_2_ = auVar199._0_2_;
          auVar199._4_2_ = auVar199._0_2_;
          auVar199._6_2_ = auVar199._0_2_;
          auVar199._8_2_ = auVar199._0_2_;
          auVar199._10_2_ = auVar199._0_2_;
          auVar199._12_2_ = auVar199._0_2_;
          auVar199._14_2_ = auVar199._0_2_;
          auVar199._16_2_ = auVar199._0_2_;
          auVar199._18_2_ = auVar199._0_2_;
          auVar199._20_2_ = auVar199._0_2_;
          auVar199._22_2_ = auVar199._0_2_;
          auVar199._24_2_ = auVar199._0_2_;
          auVar199._26_2_ = auVar199._0_2_;
          auVar199._28_2_ = auVar199._0_2_;
          auVar199._30_2_ = auVar199._0_2_;
          auVar167 = vpblendw_avx2(auVar150,auVar199,2);
          auVar200._0_2_ = (undefined2)(uVar15 + 10);
          auVar200._2_2_ = auVar200._0_2_;
          auVar200._4_2_ = auVar200._0_2_;
          auVar200._6_2_ = auVar200._0_2_;
          auVar200._8_2_ = auVar200._0_2_;
          auVar200._10_2_ = auVar200._0_2_;
          auVar200._12_2_ = auVar200._0_2_;
          auVar200._14_2_ = auVar200._0_2_;
          auVar200._16_2_ = auVar200._0_2_;
          auVar200._18_2_ = auVar200._0_2_;
          auVar200._20_2_ = auVar200._0_2_;
          auVar200._22_2_ = auVar200._0_2_;
          auVar200._24_2_ = auVar200._0_2_;
          auVar200._26_2_ = auVar200._0_2_;
          auVar200._28_2_ = auVar200._0_2_;
          auVar200._30_2_ = auVar200._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar200,4);
          auVar201._0_2_ = (undefined2)(uVar15 + 0xb);
          auVar201._2_2_ = auVar201._0_2_;
          auVar201._4_2_ = auVar201._0_2_;
          auVar201._6_2_ = auVar201._0_2_;
          auVar201._8_2_ = auVar201._0_2_;
          auVar201._10_2_ = auVar201._0_2_;
          auVar201._12_2_ = auVar201._0_2_;
          auVar201._14_2_ = auVar201._0_2_;
          auVar201._16_2_ = auVar201._0_2_;
          auVar201._18_2_ = auVar201._0_2_;
          auVar201._20_2_ = auVar201._0_2_;
          auVar201._22_2_ = auVar201._0_2_;
          auVar201._24_2_ = auVar201._0_2_;
          auVar201._26_2_ = auVar201._0_2_;
          auVar201._28_2_ = auVar201._0_2_;
          auVar201._30_2_ = auVar201._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar201,8);
          auVar202._0_2_ = (undefined2)(uVar15 + 0xc);
          auVar202._2_2_ = auVar202._0_2_;
          auVar202._4_2_ = auVar202._0_2_;
          auVar202._6_2_ = auVar202._0_2_;
          auVar202._8_2_ = auVar202._0_2_;
          auVar202._10_2_ = auVar202._0_2_;
          auVar202._12_2_ = auVar202._0_2_;
          auVar202._14_2_ = auVar202._0_2_;
          auVar202._16_2_ = auVar202._0_2_;
          auVar202._18_2_ = auVar202._0_2_;
          auVar202._20_2_ = auVar202._0_2_;
          auVar202._22_2_ = auVar202._0_2_;
          auVar202._24_2_ = auVar202._0_2_;
          auVar202._26_2_ = auVar202._0_2_;
          auVar202._28_2_ = auVar202._0_2_;
          auVar202._30_2_ = auVar202._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar202,0x10);
          auVar203._0_2_ = (undefined2)(uVar15 + 0xd);
          auVar203._2_2_ = auVar203._0_2_;
          auVar203._4_2_ = auVar203._0_2_;
          auVar203._6_2_ = auVar203._0_2_;
          auVar203._8_2_ = auVar203._0_2_;
          auVar203._10_2_ = auVar203._0_2_;
          auVar203._12_2_ = auVar203._0_2_;
          auVar203._14_2_ = auVar203._0_2_;
          auVar203._16_2_ = auVar203._0_2_;
          auVar203._18_2_ = auVar203._0_2_;
          auVar203._20_2_ = auVar203._0_2_;
          auVar203._22_2_ = auVar203._0_2_;
          auVar203._24_2_ = auVar203._0_2_;
          auVar203._26_2_ = auVar203._0_2_;
          auVar203._28_2_ = auVar203._0_2_;
          auVar203._30_2_ = auVar203._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar203,0x20);
          auVar204._0_2_ = (undefined2)(uVar15 + 0xe);
          auVar204._2_2_ = auVar204._0_2_;
          auVar204._4_2_ = auVar204._0_2_;
          auVar204._6_2_ = auVar204._0_2_;
          auVar204._8_2_ = auVar204._0_2_;
          auVar204._10_2_ = auVar204._0_2_;
          auVar204._12_2_ = auVar204._0_2_;
          auVar204._14_2_ = auVar204._0_2_;
          auVar204._16_2_ = auVar204._0_2_;
          auVar204._18_2_ = auVar204._0_2_;
          auVar204._20_2_ = auVar204._0_2_;
          auVar204._22_2_ = auVar204._0_2_;
          auVar204._24_2_ = auVar204._0_2_;
          auVar204._26_2_ = auVar204._0_2_;
          auVar204._28_2_ = auVar204._0_2_;
          auVar204._30_2_ = auVar204._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar204,0x40);
          auVar205._0_2_ = (undefined2)(uVar15 + 0xf);
          auVar205._2_2_ = auVar205._0_2_;
          auVar205._4_2_ = auVar205._0_2_;
          auVar205._6_2_ = auVar205._0_2_;
          auVar205._8_2_ = auVar205._0_2_;
          auVar205._10_2_ = auVar205._0_2_;
          auVar205._12_2_ = auVar205._0_2_;
          auVar205._14_2_ = auVar205._0_2_;
          auVar205._16_2_ = auVar205._0_2_;
          auVar205._18_2_ = auVar205._0_2_;
          auVar205._20_2_ = auVar205._0_2_;
          auVar205._22_2_ = auVar205._0_2_;
          auVar205._24_2_ = auVar205._0_2_;
          auVar205._26_2_ = auVar205._0_2_;
          auVar205._28_2_ = auVar205._0_2_;
          auVar205._30_2_ = auVar205._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar205,0x80);
          auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
          auVar167 = vpcmpgtw_avx2(auVar167,auVar100);
          auVar167 = vpblendvb_avx2(auVar170,auVar45,auVar167);
          *(undefined1 (*) [32])(local_2660 + lVar9) = auVar167;
          uVar14 = uVar14 + dy;
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar11 != 0x10);
      }
      else {
        auVar73._8_4_ = 0x10;
        auVar73._0_8_ = 0x1000000010;
        auVar73._12_4_ = 0x10;
        auVar73._16_4_ = 0x10;
        auVar73._20_4_ = 0x10;
        auVar73._24_4_ = 0x10;
        auVar73._28_4_ = 0x10;
        auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar102._8_2_ = 0x1e;
        auVar102._0_8_ = 0x1e001e001e001e;
        auVar102._10_2_ = 0x1e;
        auVar102._12_2_ = 0x1e;
        auVar102._14_2_ = 0x1e;
        auVar102._16_2_ = 0x1e;
        auVar102._18_2_ = 0x1e;
        auVar102._20_2_ = 0x1e;
        auVar102._22_2_ = 0x1e;
        auVar102._24_2_ = 0x1e;
        auVar102._26_2_ = 0x1e;
        auVar102._28_2_ = 0x1e;
        auVar102._30_2_ = 0x1e;
        uVar11 = 0;
        uVar14 = dy;
        do {
          uVar15 = (int)uVar14 >> 6;
          if (0x1e < (int)uVar15) {
            if (uVar11 < 0x10) {
              do {
                *(undefined1 (*) [32])(local_2660 + lVar9) = auVar45;
                lVar9 = lVar9 + 0x20;
              } while (lVar9 != 0x200);
            }
            break;
          }
          uVar21 = uVar14 >> 1;
          uVar19 = uVar21 & 0x1f;
          auVar122._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f0000001f;
          auVar122._8_4_ = uVar19;
          auVar122._12_4_ = uVar19;
          auVar122._16_4_ = uVar19;
          auVar122._20_4_ = uVar19;
          auVar122._24_4_ = uVar19;
          auVar122._28_4_ = uVar19;
          auVar184 = auVar34;
          if (uVar15 - 0x20 < 0xfffffff7) {
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
            auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
            auVar170 = vpsubd_avx2(auVar170,auVar167);
            auVar167 = vpslld_avx2(auVar167,5);
            auVar170 = vpmulld_avx2(auVar170,auVar122);
            auVar167 = vpaddd_avx2(auVar167,auVar73);
            auVar167 = vpaddd_avx2(auVar170,auVar167);
            auVar167 = vpsrld_avx2(auVar167,5);
            auVar169._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar167._16_16_;
            auVar169._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar34;
            auVar167 = vpackusdw_avx2(auVar167,auVar169);
            auVar184 = auVar167._0_16_;
          }
          auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
          auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
          auVar170 = vpsubd_avx2(auVar170,auVar167);
          auVar167 = vpslld_avx2(auVar167,5);
          auVar170 = vpmulld_avx2(auVar170,auVar122);
          auVar167 = vpaddd_avx2(auVar167,auVar73);
          auVar167 = vpaddd_avx2(auVar170,auVar167);
          auVar167 = vpsrld_avx2(auVar167,5);
          auVar167 = vpackusdw_avx2(auVar167,ZEXT1632(auVar167._16_16_));
          auVar123._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar167._0_16_;
          auVar123._16_16_ = ZEXT116(0) * auVar167._16_16_ + ZEXT116(1) * auVar184;
          auVar141._0_2_ = (undefined2)uVar15;
          auVar141._2_2_ = auVar141._0_2_;
          auVar141._4_2_ = auVar141._0_2_;
          auVar141._6_2_ = auVar141._0_2_;
          auVar141._8_2_ = auVar141._0_2_;
          auVar141._10_2_ = auVar141._0_2_;
          auVar141._12_2_ = auVar141._0_2_;
          auVar141._14_2_ = auVar141._0_2_;
          auVar184 = vpaddw_avx(auVar141,auVar284);
          auVar283 = vpslldq_avx(auVar184,2);
          auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
          auVar184 = vpsrldq_avx(auVar184,0xe);
          auVar151._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar34;
          auVar151._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar184;
          auVar208._0_2_ = (undefined2)(uVar15 + 9);
          auVar208._2_2_ = auVar208._0_2_;
          auVar208._4_2_ = auVar208._0_2_;
          auVar208._6_2_ = auVar208._0_2_;
          auVar208._8_2_ = auVar208._0_2_;
          auVar208._10_2_ = auVar208._0_2_;
          auVar208._12_2_ = auVar208._0_2_;
          auVar208._14_2_ = auVar208._0_2_;
          auVar208._16_2_ = auVar208._0_2_;
          auVar208._18_2_ = auVar208._0_2_;
          auVar208._20_2_ = auVar208._0_2_;
          auVar208._22_2_ = auVar208._0_2_;
          auVar208._24_2_ = auVar208._0_2_;
          auVar208._26_2_ = auVar208._0_2_;
          auVar208._28_2_ = auVar208._0_2_;
          auVar208._30_2_ = auVar208._0_2_;
          auVar167 = vpblendw_avx2(auVar151,auVar208,2);
          auVar209._0_2_ = (undefined2)(uVar15 + 10);
          auVar209._2_2_ = auVar209._0_2_;
          auVar209._4_2_ = auVar209._0_2_;
          auVar209._6_2_ = auVar209._0_2_;
          auVar209._8_2_ = auVar209._0_2_;
          auVar209._10_2_ = auVar209._0_2_;
          auVar209._12_2_ = auVar209._0_2_;
          auVar209._14_2_ = auVar209._0_2_;
          auVar209._16_2_ = auVar209._0_2_;
          auVar209._18_2_ = auVar209._0_2_;
          auVar209._20_2_ = auVar209._0_2_;
          auVar209._22_2_ = auVar209._0_2_;
          auVar209._24_2_ = auVar209._0_2_;
          auVar209._26_2_ = auVar209._0_2_;
          auVar209._28_2_ = auVar209._0_2_;
          auVar209._30_2_ = auVar209._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar209,4);
          auVar210._0_2_ = (undefined2)(uVar15 + 0xb);
          auVar210._2_2_ = auVar210._0_2_;
          auVar210._4_2_ = auVar210._0_2_;
          auVar210._6_2_ = auVar210._0_2_;
          auVar210._8_2_ = auVar210._0_2_;
          auVar210._10_2_ = auVar210._0_2_;
          auVar210._12_2_ = auVar210._0_2_;
          auVar210._14_2_ = auVar210._0_2_;
          auVar210._16_2_ = auVar210._0_2_;
          auVar210._18_2_ = auVar210._0_2_;
          auVar210._20_2_ = auVar210._0_2_;
          auVar210._22_2_ = auVar210._0_2_;
          auVar210._24_2_ = auVar210._0_2_;
          auVar210._26_2_ = auVar210._0_2_;
          auVar210._28_2_ = auVar210._0_2_;
          auVar210._30_2_ = auVar210._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar210,8);
          auVar211._0_2_ = (undefined2)(uVar15 + 0xc);
          auVar211._2_2_ = auVar211._0_2_;
          auVar211._4_2_ = auVar211._0_2_;
          auVar211._6_2_ = auVar211._0_2_;
          auVar211._8_2_ = auVar211._0_2_;
          auVar211._10_2_ = auVar211._0_2_;
          auVar211._12_2_ = auVar211._0_2_;
          auVar211._14_2_ = auVar211._0_2_;
          auVar211._16_2_ = auVar211._0_2_;
          auVar211._18_2_ = auVar211._0_2_;
          auVar211._20_2_ = auVar211._0_2_;
          auVar211._22_2_ = auVar211._0_2_;
          auVar211._24_2_ = auVar211._0_2_;
          auVar211._26_2_ = auVar211._0_2_;
          auVar211._28_2_ = auVar211._0_2_;
          auVar211._30_2_ = auVar211._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar211,0x10);
          auVar212._0_2_ = (undefined2)(uVar15 + 0xd);
          auVar212._2_2_ = auVar212._0_2_;
          auVar212._4_2_ = auVar212._0_2_;
          auVar212._6_2_ = auVar212._0_2_;
          auVar212._8_2_ = auVar212._0_2_;
          auVar212._10_2_ = auVar212._0_2_;
          auVar212._12_2_ = auVar212._0_2_;
          auVar212._14_2_ = auVar212._0_2_;
          auVar212._16_2_ = auVar212._0_2_;
          auVar212._18_2_ = auVar212._0_2_;
          auVar212._20_2_ = auVar212._0_2_;
          auVar212._22_2_ = auVar212._0_2_;
          auVar212._24_2_ = auVar212._0_2_;
          auVar212._26_2_ = auVar212._0_2_;
          auVar212._28_2_ = auVar212._0_2_;
          auVar212._30_2_ = auVar212._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar212,0x20);
          auVar213._0_2_ = (undefined2)(uVar15 + 0xe);
          auVar213._2_2_ = auVar213._0_2_;
          auVar213._4_2_ = auVar213._0_2_;
          auVar213._6_2_ = auVar213._0_2_;
          auVar213._8_2_ = auVar213._0_2_;
          auVar213._10_2_ = auVar213._0_2_;
          auVar213._12_2_ = auVar213._0_2_;
          auVar213._14_2_ = auVar213._0_2_;
          auVar213._16_2_ = auVar213._0_2_;
          auVar213._18_2_ = auVar213._0_2_;
          auVar213._20_2_ = auVar213._0_2_;
          auVar213._22_2_ = auVar213._0_2_;
          auVar213._24_2_ = auVar213._0_2_;
          auVar213._26_2_ = auVar213._0_2_;
          auVar213._28_2_ = auVar213._0_2_;
          auVar213._30_2_ = auVar213._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar213,0x40);
          auVar214._0_2_ = (undefined2)(uVar15 + 0xf);
          auVar214._2_2_ = auVar214._0_2_;
          auVar214._4_2_ = auVar214._0_2_;
          auVar214._6_2_ = auVar214._0_2_;
          auVar214._8_2_ = auVar214._0_2_;
          auVar214._10_2_ = auVar214._0_2_;
          auVar214._12_2_ = auVar214._0_2_;
          auVar214._14_2_ = auVar214._0_2_;
          auVar214._16_2_ = auVar214._0_2_;
          auVar214._18_2_ = auVar214._0_2_;
          auVar214._20_2_ = auVar214._0_2_;
          auVar214._22_2_ = auVar214._0_2_;
          auVar214._24_2_ = auVar214._0_2_;
          auVar214._26_2_ = auVar214._0_2_;
          auVar214._28_2_ = auVar214._0_2_;
          auVar214._30_2_ = auVar214._0_2_;
          auVar167 = vpblendw_avx2(auVar167,auVar214,0x80);
          auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
          auVar167 = vpcmpgtw_avx2(auVar167,auVar102);
          auVar167 = vpblendvb_avx2(auVar123,auVar45,auVar167);
          *(undefined1 (*) [32])(local_2660 + lVar9) = auVar167;
          uVar14 = uVar14 + dy;
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar11 != 0x10);
      }
      auVar167 = vpunpcklwd_avx2(_local_2660,local_2640);
      auVar170 = vpunpcklwd_avx2(local_2620,local_2600);
      auVar168 = vpunpcklwd_avx2(local_25e0,local_25c0);
      auVar130 = vpunpcklwd_avx2(local_25a0,local_2580);
      auVar161 = vpunpckldq_avx2(auVar167,auVar170);
      auVar175 = vpunpckldq_avx2(auVar168,auVar130);
      local_2060 = vpunpcklqdq_avx2(auVar161,auVar175);
      local_2040 = vpunpckhqdq_avx2(auVar161,auVar175);
      auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
      auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
      local_2020 = vpunpcklqdq_avx2(auVar167,auVar170);
      local_2000 = vpunpckhqdq_avx2(auVar167,auVar170);
      auVar167 = vpunpckhwd_avx2(_local_2660,local_2640);
      auVar170 = vpunpckhwd_avx2(local_2620,local_2600);
      auVar168 = vpunpckhwd_avx2(local_25e0,local_25c0);
      auVar130 = vpunpckhwd_avx2(local_25a0,local_2580);
      auVar161 = vpunpckldq_avx2(auVar167,auVar170);
      auVar175 = vpunpckldq_avx2(auVar168,auVar130);
      local_1fe0 = vpunpcklqdq_avx2(auVar161,auVar175);
      local_1fc0 = vpunpckhqdq_avx2(auVar161,auVar175);
      auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
      auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
      local_1fa0 = vpunpcklqdq_avx2(auVar167,auVar170);
      local_1f80 = vpunpckhqdq_avx2(auVar167,auVar170);
      auVar167 = vpunpcklwd_avx2(local_2560,local_2540);
      auVar170 = vpunpcklwd_avx2(local_2520,local_2500);
      auVar168 = vpunpcklwd_avx2(local_24e0,local_24c0);
      auVar130 = vpunpcklwd_avx2(local_24a0,local_2480);
      auVar161 = vpunpckldq_avx2(auVar167,auVar170);
      auVar175 = vpunpckldq_avx2(auVar168,auVar130);
      local_1f60 = vpunpcklqdq_avx2(auVar161,auVar175);
      local_1f40 = vpunpckhqdq_avx2(auVar161,auVar175);
      auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
      auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
      local_1f20 = vpunpcklqdq_avx2(auVar167,auVar170);
      local_1f00 = vpunpckhqdq_avx2(auVar167,auVar170);
      auVar167 = vpunpckhwd_avx2(local_2560,local_2540);
      auVar170 = vpunpckhwd_avx2(local_2520,local_2500);
      auVar168 = vpunpckhwd_avx2(local_24e0,local_24c0);
      auVar130 = vpunpckhwd_avx2(local_24a0,local_2480);
      auVar161 = vpunpckldq_avx2(auVar167,auVar170);
      auVar175 = vpunpckldq_avx2(auVar168,auVar130);
      local_1ee0 = vpunpcklqdq_avx2(auVar161,auVar175);
      local_1ec0 = vpunpckhqdq_avx2(auVar161,auVar175);
      auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
      auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
      local_1ea0 = vpunpcklqdq_avx2(auVar167,auVar170);
      local_1e80 = vpunpckhqdq_avx2(auVar167,auVar170);
      lVar9 = 0x100;
      do {
        auVar167 = *(undefined1 (*) [32])(local_2060 + lVar9);
        auVar170 = vperm2i128_avx2(auVar167,*(undefined1 (*) [32])(auStack_2160 + lVar9),2);
        auVar57._0_16_ =
             ZEXT116(1) * *(undefined1 (*) [16])(auStack_2150 + lVar9) +
             ZEXT116(0) * auVar167._0_16_;
        auVar57._16_16_ =
             ZEXT116(1) * auVar167._16_16_ +
             ZEXT116(0) * *(undefined1 (*) [16])(auStack_2150 + lVar9);
        *(undefined1 (*) [32])(auStack_2360 + lVar9) = auVar170;
        *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar57;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x200);
      lVar9 = 0;
      do {
        uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
        uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
        uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_2260 + lVar9);
        *(undefined8 *)(dst + 4) = uVar5;
        *(undefined8 *)(dst + 8) = uVar7;
        *(undefined8 *)(dst + 0xc) = uVar8;
        lVar9 = lVar9 + 0x20;
        dst = dst + stride;
      } while (lVar9 != 0x200);
      return;
    }
    if (bw == 0x20) {
      uVar4 = left[0x3f];
      auVar35._2_2_ = uVar4;
      auVar35._0_2_ = uVar4;
      auVar35._4_2_ = uVar4;
      auVar35._6_2_ = uVar4;
      auVar35._8_2_ = uVar4;
      auVar35._10_2_ = uVar4;
      auVar35._12_2_ = uVar4;
      auVar35._14_2_ = uVar4;
      auVar46._16_2_ = uVar4;
      auVar46._0_16_ = auVar35;
      auVar46._18_2_ = uVar4;
      auVar46._20_2_ = uVar4;
      auVar46._22_2_ = uVar4;
      auVar46._24_2_ = uVar4;
      auVar46._26_2_ = uVar4;
      auVar46._28_2_ = uVar4;
      auVar46._30_2_ = uVar4;
      lVar9 = -0x400;
      if (bd < 0xc) {
        lVar12 = 0;
        auVar72._8_2_ = 0x10;
        auVar72._0_8_ = 0x10001000100010;
        auVar72._10_2_ = 0x10;
        auVar72._12_2_ = 0x10;
        auVar72._14_2_ = 0x10;
        auVar72._16_2_ = 0x10;
        auVar72._18_2_ = 0x10;
        auVar72._20_2_ = 0x10;
        auVar72._22_2_ = 0x10;
        auVar72._24_2_ = 0x10;
        auVar72._26_2_ = 0x10;
        auVar72._28_2_ = 0x10;
        auVar72._30_2_ = 0x10;
        auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar101._8_2_ = 0x3e;
        auVar101._0_8_ = 0x3e003e003e003e;
        auVar101._10_2_ = 0x3e;
        auVar101._12_2_ = 0x3e;
        auVar101._14_2_ = 0x3e;
        auVar101._16_2_ = 0x3e;
        auVar101._18_2_ = 0x3e;
        auVar101._20_2_ = 0x3e;
        auVar101._22_2_ = 0x3e;
        auVar101._24_2_ = 0x3e;
        auVar101._26_2_ = 0x3e;
        auVar101._28_2_ = 0x3e;
        auVar101._30_2_ = 0x3e;
        uVar14 = dy;
        do {
          iVar18 = (int)uVar14 >> 6;
          lVar22 = lVar9;
          if (iVar18 < 0x3f) {
            uVar6 = (ushort)(uVar14 >> 1);
            uVar118 = uVar6 & 0x1f;
            auVar121._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar121._8_2_ = uVar118;
            auVar121._10_2_ = uVar118;
            auVar121._12_2_ = uVar118;
            auVar121._14_2_ = uVar118;
            auVar121._16_2_ = uVar118;
            auVar121._18_2_ = uVar118;
            auVar121._20_2_ = uVar118;
            auVar121._22_2_ = uVar118;
            auVar121._24_2_ = uVar118;
            auVar121._26_2_ = uVar118;
            auVar121._28_2_ = uVar118;
            auVar121._30_2_ = uVar118;
            lVar22 = (long)iVar18;
            lVar25 = 0;
            bVar28 = true;
            do {
              bVar26 = bVar28;
              auVar170 = in_ZMM6._0_32_;
              lVar3 = lVar25 + lVar22;
              auVar167 = auVar46;
              if (lVar3 < 0x3f) {
                auVar167 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar22 + lVar25 + 1),
                                       *(undefined1 (*) [32])(left + lVar22 + lVar25));
                auVar168 = vpmullw_avx2(auVar167,auVar121);
                auVar167 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar22 + lVar25),5);
                auVar167 = vpaddw_avx2(auVar167,auVar72);
                auVar167 = vpaddw_avx2(auVar168,auVar167);
                auVar168 = vpsrlw_avx2(auVar167,5);
                uVar15 = (uint)lVar3;
                auVar183._0_2_ = (undefined2)lVar3;
                auVar183._2_2_ = auVar183._0_2_;
                auVar183._4_2_ = auVar183._0_2_;
                auVar183._6_2_ = auVar183._0_2_;
                auVar183._8_2_ = auVar183._0_2_;
                auVar183._10_2_ = auVar183._0_2_;
                auVar183._12_2_ = auVar183._0_2_;
                auVar183._14_2_ = auVar183._0_2_;
                auVar184 = vpaddw_avx(auVar183,auVar284);
                auVar283 = vpslldq_avx(auVar184,2);
                auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
                auVar184 = vpsrldq_avx(auVar184,0xe);
                auVar206._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar35;
                auVar206._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar184;
                auVar307._0_2_ = (undefined2)(uVar15 + 9);
                auVar307._2_2_ = auVar307._0_2_;
                auVar307._4_2_ = auVar307._0_2_;
                auVar307._6_2_ = auVar307._0_2_;
                auVar307._8_2_ = auVar307._0_2_;
                auVar307._10_2_ = auVar307._0_2_;
                auVar307._12_2_ = auVar307._0_2_;
                auVar307._14_2_ = auVar307._0_2_;
                auVar307._16_2_ = auVar307._0_2_;
                auVar307._18_2_ = auVar307._0_2_;
                auVar307._20_2_ = auVar307._0_2_;
                auVar307._22_2_ = auVar307._0_2_;
                auVar307._24_2_ = auVar307._0_2_;
                auVar307._26_2_ = auVar307._0_2_;
                auVar307._28_2_ = auVar307._0_2_;
                auVar307._30_2_ = auVar307._0_2_;
                auVar167 = vpblendw_avx2(auVar206,auVar307,2);
                auVar308._0_2_ = (undefined2)(uVar15 + 10);
                auVar308._2_2_ = auVar308._0_2_;
                auVar308._4_2_ = auVar308._0_2_;
                auVar308._6_2_ = auVar308._0_2_;
                auVar308._8_2_ = auVar308._0_2_;
                auVar308._10_2_ = auVar308._0_2_;
                auVar308._12_2_ = auVar308._0_2_;
                auVar308._14_2_ = auVar308._0_2_;
                auVar308._16_2_ = auVar308._0_2_;
                auVar308._18_2_ = auVar308._0_2_;
                auVar308._20_2_ = auVar308._0_2_;
                auVar308._22_2_ = auVar308._0_2_;
                auVar308._24_2_ = auVar308._0_2_;
                auVar308._26_2_ = auVar308._0_2_;
                auVar308._28_2_ = auVar308._0_2_;
                auVar308._30_2_ = auVar308._0_2_;
                auVar167 = vpblendw_avx2(auVar167,auVar308,4);
                auVar309._0_2_ = (undefined2)(uVar15 + 0xb);
                auVar309._2_2_ = auVar309._0_2_;
                auVar309._4_2_ = auVar309._0_2_;
                auVar309._6_2_ = auVar309._0_2_;
                auVar309._8_2_ = auVar309._0_2_;
                auVar309._10_2_ = auVar309._0_2_;
                auVar309._12_2_ = auVar309._0_2_;
                auVar309._14_2_ = auVar309._0_2_;
                auVar309._16_2_ = auVar309._0_2_;
                auVar309._18_2_ = auVar309._0_2_;
                auVar309._20_2_ = auVar309._0_2_;
                auVar309._22_2_ = auVar309._0_2_;
                auVar309._24_2_ = auVar309._0_2_;
                auVar309._26_2_ = auVar309._0_2_;
                auVar309._28_2_ = auVar309._0_2_;
                auVar309._30_2_ = auVar309._0_2_;
                auVar167 = vpblendw_avx2(auVar167,auVar309,8);
                auVar310._0_2_ = (undefined2)(uVar15 + 0xc);
                auVar310._2_2_ = auVar310._0_2_;
                auVar310._4_2_ = auVar310._0_2_;
                auVar310._6_2_ = auVar310._0_2_;
                auVar310._8_2_ = auVar310._0_2_;
                auVar310._10_2_ = auVar310._0_2_;
                auVar310._12_2_ = auVar310._0_2_;
                auVar310._14_2_ = auVar310._0_2_;
                auVar310._16_2_ = auVar310._0_2_;
                auVar310._18_2_ = auVar310._0_2_;
                auVar310._20_2_ = auVar310._0_2_;
                auVar310._22_2_ = auVar310._0_2_;
                auVar310._24_2_ = auVar310._0_2_;
                auVar310._26_2_ = auVar310._0_2_;
                auVar310._28_2_ = auVar310._0_2_;
                auVar310._30_2_ = auVar310._0_2_;
                auVar167 = vpblendw_avx2(auVar167,auVar310,0x10);
                auVar311._0_2_ = (undefined2)(uVar15 + 0xd);
                auVar311._2_2_ = auVar311._0_2_;
                auVar311._4_2_ = auVar311._0_2_;
                auVar311._6_2_ = auVar311._0_2_;
                auVar311._8_2_ = auVar311._0_2_;
                auVar311._10_2_ = auVar311._0_2_;
                auVar311._12_2_ = auVar311._0_2_;
                auVar311._14_2_ = auVar311._0_2_;
                auVar311._16_2_ = auVar311._0_2_;
                auVar311._18_2_ = auVar311._0_2_;
                auVar311._20_2_ = auVar311._0_2_;
                auVar311._22_2_ = auVar311._0_2_;
                auVar311._24_2_ = auVar311._0_2_;
                auVar311._26_2_ = auVar311._0_2_;
                auVar311._28_2_ = auVar311._0_2_;
                auVar311._30_2_ = auVar311._0_2_;
                auVar167 = vpblendw_avx2(auVar167,auVar311,0x20);
                auVar312._0_2_ = (undefined2)(uVar15 + 0xe);
                auVar312._2_2_ = auVar312._0_2_;
                auVar312._4_2_ = auVar312._0_2_;
                auVar312._6_2_ = auVar312._0_2_;
                auVar312._8_2_ = auVar312._0_2_;
                auVar312._10_2_ = auVar312._0_2_;
                auVar312._12_2_ = auVar312._0_2_;
                auVar312._14_2_ = auVar312._0_2_;
                auVar312._16_2_ = auVar312._0_2_;
                auVar312._18_2_ = auVar312._0_2_;
                auVar312._20_2_ = auVar312._0_2_;
                auVar312._22_2_ = auVar312._0_2_;
                auVar312._24_2_ = auVar312._0_2_;
                auVar312._26_2_ = auVar312._0_2_;
                auVar312._28_2_ = auVar312._0_2_;
                auVar312._30_2_ = auVar312._0_2_;
                auVar167 = vpblendw_avx2(auVar167,auVar312,0x40);
                auVar313._0_2_ = (undefined2)(uVar15 + 0xf);
                auVar313._2_2_ = auVar313._0_2_;
                auVar313._4_2_ = auVar313._0_2_;
                auVar313._6_2_ = auVar313._0_2_;
                auVar313._8_2_ = auVar313._0_2_;
                auVar313._10_2_ = auVar313._0_2_;
                auVar313._12_2_ = auVar313._0_2_;
                auVar313._14_2_ = auVar313._0_2_;
                auVar313._16_2_ = auVar313._0_2_;
                auVar313._18_2_ = auVar313._0_2_;
                auVar313._20_2_ = auVar313._0_2_;
                auVar313._22_2_ = auVar313._0_2_;
                auVar313._24_2_ = auVar313._0_2_;
                auVar313._26_2_ = auVar313._0_2_;
                auVar313._28_2_ = auVar313._0_2_;
                auVar313._30_2_ = auVar313._0_2_;
                auVar167 = vpblendw_avx2(auVar167,auVar313,0x80);
                auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
                auVar167 = vpcmpgtw_avx2(auVar167,auVar101);
                auVar167 = vpblendvb_avx2(auVar168,auVar46,auVar167);
              }
              in_ZMM6 = ZEXT3264(auVar167);
              lVar25 = 0x10;
              bVar28 = false;
            } while (bVar26);
            *(undefined1 (*) [32])(local_2060 + lVar12 * 0x20) = auVar170;
            *(undefined1 (*) [32])(local_1c60 + lVar12 * 0x20) = auVar167;
            uVar14 = uVar14 + dy;
          }
          else {
            do {
              *(undefined1 (*) [32])(local_1c60 + lVar22) = auVar46;
              *(undefined1 (*) [32])(auStack_1860 + lVar22) = auVar46;
              lVar22 = lVar22 + 0x20;
            } while (lVar22 != 0);
          }
          if (0x3e < iVar18) break;
          lVar12 = lVar12 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar12 != 0x20);
      }
      else {
        auVar74._8_4_ = 0x10;
        auVar74._0_8_ = 0x1000000010;
        auVar74._12_4_ = 0x10;
        auVar74._16_4_ = 0x10;
        auVar74._20_4_ = 0x10;
        auVar74._24_4_ = 0x10;
        auVar74._28_4_ = 0x10;
        auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar103._8_2_ = 0x3e;
        auVar103._0_8_ = 0x3e003e003e003e;
        auVar103._10_2_ = 0x3e;
        auVar103._12_2_ = 0x3e;
        auVar103._14_2_ = 0x3e;
        auVar103._16_2_ = 0x3e;
        auVar103._18_2_ = 0x3e;
        auVar103._20_2_ = 0x3e;
        auVar103._22_2_ = 0x3e;
        auVar103._24_2_ = 0x3e;
        auVar103._26_2_ = 0x3e;
        auVar103._28_2_ = 0x3e;
        auVar103._30_2_ = 0x3e;
        auVar167 = vpmovsxbw_avx2(_DAT_0051e870);
        uVar14 = dy;
        do {
          uVar15 = (int)uVar14 >> 6;
          if (0x3e < (int)uVar15) goto LAB_00360627;
          uVar21 = uVar14 >> 1;
          uVar19 = uVar21 & 0x1f801f;
          auVar152._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f801f001f801f;
          auVar152._8_4_ = uVar19;
          auVar152._12_4_ = uVar19;
          auVar152._16_4_ = uVar19;
          auVar152._20_4_ = uVar19;
          auVar152._24_4_ = uVar19;
          auVar152._28_4_ = uVar19;
          auVar184 = auVar35;
          if (uVar15 - 0x40 < 0xfffffff7) {
            auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
            auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
            auVar168 = vpsubd_avx2(auVar168,auVar170);
            auVar170 = vpslld_avx2(auVar170,5);
            auVar168 = vpmulld_avx2(auVar168,auVar152);
            auVar170 = vpaddd_avx2(auVar170,auVar74);
            auVar170 = vpaddd_avx2(auVar168,auVar170);
            auVar170 = vpsrld_avx2(auVar170,5);
            auVar215._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar170._16_16_;
            auVar215._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
            auVar170 = vpackusdw_avx2(auVar170,auVar215);
            auVar184 = auVar170._0_16_;
          }
          auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
          auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
          auVar168 = vpsubd_avx2(auVar168,auVar170);
          auVar170 = vpslld_avx2(auVar170,5);
          auVar168 = vpmulld_avx2(auVar168,auVar152);
          auVar170 = vpaddd_avx2(auVar170,auVar74);
          auVar170 = vpaddd_avx2(auVar168,auVar170);
          auVar170 = vpsrld_avx2(auVar170,5);
          auVar170 = vpackusdw_avx2(auVar170,ZEXT1632(auVar170._16_16_));
          auVar285._0_2_ = (undefined2)uVar15;
          auVar285._2_2_ = auVar285._0_2_;
          auVar285._4_2_ = auVar285._0_2_;
          auVar285._6_2_ = auVar285._0_2_;
          auVar285._8_2_ = auVar285._0_2_;
          auVar285._10_2_ = auVar285._0_2_;
          auVar285._12_2_ = auVar285._0_2_;
          auVar285._14_2_ = auVar285._0_2_;
          auVar283 = vpaddw_avx(auVar285,auVar284);
          auVar299 = vpslldq_avx(auVar283,2);
          auVar299 = vpblendw_avx(auVar299,ZEXT416(uVar15),1);
          auVar283 = vpsrldq_avx(auVar283,0xe);
          auVar291._0_16_ = ZEXT116(0) * auVar283 + ZEXT116(1) * auVar35;
          auVar291._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar283;
          auVar348._0_2_ = (undefined2)(uVar15 + 9);
          auVar348._2_2_ = auVar348._0_2_;
          auVar348._4_2_ = auVar348._0_2_;
          auVar348._6_2_ = auVar348._0_2_;
          auVar348._8_2_ = auVar348._0_2_;
          auVar348._10_2_ = auVar348._0_2_;
          auVar348._12_2_ = auVar348._0_2_;
          auVar348._14_2_ = auVar348._0_2_;
          auVar348._16_2_ = auVar348._0_2_;
          auVar348._18_2_ = auVar348._0_2_;
          auVar348._20_2_ = auVar348._0_2_;
          auVar348._22_2_ = auVar348._0_2_;
          auVar348._24_2_ = auVar348._0_2_;
          auVar348._26_2_ = auVar348._0_2_;
          auVar348._28_2_ = auVar348._0_2_;
          auVar348._30_2_ = auVar348._0_2_;
          auVar168 = vpblendw_avx2(auVar291,auVar348,2);
          auVar349._0_2_ = (undefined2)(uVar15 + 10);
          auVar349._2_2_ = auVar349._0_2_;
          auVar349._4_2_ = auVar349._0_2_;
          auVar349._6_2_ = auVar349._0_2_;
          auVar349._8_2_ = auVar349._0_2_;
          auVar349._10_2_ = auVar349._0_2_;
          auVar349._12_2_ = auVar349._0_2_;
          auVar349._14_2_ = auVar349._0_2_;
          auVar349._16_2_ = auVar349._0_2_;
          auVar349._18_2_ = auVar349._0_2_;
          auVar349._20_2_ = auVar349._0_2_;
          auVar349._22_2_ = auVar349._0_2_;
          auVar349._24_2_ = auVar349._0_2_;
          auVar349._26_2_ = auVar349._0_2_;
          auVar349._28_2_ = auVar349._0_2_;
          auVar349._30_2_ = auVar349._0_2_;
          auVar168 = vpblendw_avx2(auVar168,auVar349,4);
          auVar350._0_2_ = (undefined2)(uVar15 + 0xb);
          auVar350._2_2_ = auVar350._0_2_;
          auVar350._4_2_ = auVar350._0_2_;
          auVar350._6_2_ = auVar350._0_2_;
          auVar350._8_2_ = auVar350._0_2_;
          auVar350._10_2_ = auVar350._0_2_;
          auVar350._12_2_ = auVar350._0_2_;
          auVar350._14_2_ = auVar350._0_2_;
          auVar350._16_2_ = auVar350._0_2_;
          auVar350._18_2_ = auVar350._0_2_;
          auVar350._20_2_ = auVar350._0_2_;
          auVar350._22_2_ = auVar350._0_2_;
          auVar350._24_2_ = auVar350._0_2_;
          auVar350._26_2_ = auVar350._0_2_;
          auVar350._28_2_ = auVar350._0_2_;
          auVar350._30_2_ = auVar350._0_2_;
          auVar168 = vpblendw_avx2(auVar168,auVar350,8);
          auVar351._0_2_ = (undefined2)(uVar15 + 0xc);
          auVar351._2_2_ = auVar351._0_2_;
          auVar351._4_2_ = auVar351._0_2_;
          auVar351._6_2_ = auVar351._0_2_;
          auVar351._8_2_ = auVar351._0_2_;
          auVar351._10_2_ = auVar351._0_2_;
          auVar351._12_2_ = auVar351._0_2_;
          auVar351._14_2_ = auVar351._0_2_;
          auVar351._16_2_ = auVar351._0_2_;
          auVar351._18_2_ = auVar351._0_2_;
          auVar351._20_2_ = auVar351._0_2_;
          auVar351._22_2_ = auVar351._0_2_;
          auVar351._24_2_ = auVar351._0_2_;
          auVar351._26_2_ = auVar351._0_2_;
          auVar351._28_2_ = auVar351._0_2_;
          auVar351._30_2_ = auVar351._0_2_;
          auVar168 = vpblendw_avx2(auVar168,auVar351,0x10);
          auVar352._0_2_ = (undefined2)(uVar15 + 0xd);
          auVar352._2_2_ = auVar352._0_2_;
          auVar352._4_2_ = auVar352._0_2_;
          auVar352._6_2_ = auVar352._0_2_;
          auVar352._8_2_ = auVar352._0_2_;
          auVar352._10_2_ = auVar352._0_2_;
          auVar352._12_2_ = auVar352._0_2_;
          auVar352._14_2_ = auVar352._0_2_;
          auVar352._16_2_ = auVar352._0_2_;
          auVar352._18_2_ = auVar352._0_2_;
          auVar352._20_2_ = auVar352._0_2_;
          auVar352._22_2_ = auVar352._0_2_;
          auVar352._24_2_ = auVar352._0_2_;
          auVar352._26_2_ = auVar352._0_2_;
          auVar352._28_2_ = auVar352._0_2_;
          auVar352._30_2_ = auVar352._0_2_;
          auVar168 = vpblendw_avx2(auVar168,auVar352,0x20);
          auVar353._0_2_ = (undefined2)(uVar15 + 0xe);
          auVar353._2_2_ = auVar353._0_2_;
          auVar353._4_2_ = auVar353._0_2_;
          auVar353._6_2_ = auVar353._0_2_;
          auVar353._8_2_ = auVar353._0_2_;
          auVar353._10_2_ = auVar353._0_2_;
          auVar353._12_2_ = auVar353._0_2_;
          auVar353._14_2_ = auVar353._0_2_;
          auVar353._16_2_ = auVar353._0_2_;
          auVar353._18_2_ = auVar353._0_2_;
          auVar353._20_2_ = auVar353._0_2_;
          auVar353._22_2_ = auVar353._0_2_;
          auVar353._24_2_ = auVar353._0_2_;
          auVar353._26_2_ = auVar353._0_2_;
          auVar353._28_2_ = auVar353._0_2_;
          auVar353._30_2_ = auVar353._0_2_;
          auVar168 = vpblendw_avx2(auVar168,auVar353,0x40);
          auVar354._0_2_ = (undefined2)(uVar15 + 0xf);
          auVar354._2_2_ = auVar354._0_2_;
          auVar354._4_2_ = auVar354._0_2_;
          auVar354._6_2_ = auVar354._0_2_;
          auVar354._8_2_ = auVar354._0_2_;
          auVar354._10_2_ = auVar354._0_2_;
          auVar354._12_2_ = auVar354._0_2_;
          auVar354._14_2_ = auVar354._0_2_;
          auVar354._16_2_ = auVar354._0_2_;
          auVar354._18_2_ = auVar354._0_2_;
          auVar354._20_2_ = auVar354._0_2_;
          auVar354._22_2_ = auVar354._0_2_;
          auVar354._24_2_ = auVar354._0_2_;
          auVar354._26_2_ = auVar354._0_2_;
          auVar354._28_2_ = auVar354._0_2_;
          auVar354._30_2_ = auVar354._0_2_;
          auVar168 = vpblendw_avx2(auVar168,auVar354,0x80);
          auVar168 = vpblendd_avx2(ZEXT1632(auVar299),auVar168,0xf0);
          auVar168 = vpcmpgtw_avx2(auVar168,auVar103);
          auVar171._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar170._0_16_;
          auVar171._16_16_ = ZEXT116(0) * auVar170._16_16_ + ZEXT116(1) * auVar184;
          auVar170 = vpblendvb_avx2(auVar171,auVar46,auVar168);
          *(undefined1 (*) [32])(local_1c60 + lVar9) = auVar170;
          auVar170 = auVar46;
          if ((int)uVar15 < 0x2f) {
            auVar184 = auVar35;
            if (uVar15 - 0x30 < 0xfffffff7) {
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x18));
              auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x19));
              auVar168 = vpsubd_avx2(auVar168,auVar170);
              auVar170 = vpslld_avx2(auVar170,5);
              auVar168 = vpmulld_avx2(auVar168,auVar152);
              auVar170 = vpaddd_avx2(auVar170,auVar74);
              auVar170 = vpaddd_avx2(auVar168,auVar170);
              auVar170 = vpsrld_avx2(auVar170,5);
              auVar216._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar170._16_16_;
              auVar216._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
              auVar170 = vpackusdw_avx2(auVar170,auVar216);
              auVar184 = auVar170._0_16_;
            }
            auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x10));
            auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x11));
            auVar168 = vpsubd_avx2(auVar168,auVar170);
            auVar170 = vpslld_avx2(auVar170,5);
            auVar168 = vpmulld_avx2(auVar168,auVar152);
            auVar170 = vpaddd_avx2(auVar170,auVar74);
            auVar170 = vpaddd_avx2(auVar168,auVar170);
            auVar170 = vpsrld_avx2(auVar170,5);
            auVar170 = vpackusdw_avx2(auVar170,ZEXT1632(auVar170._16_16_));
            auVar217._2_2_ = auVar285._0_2_;
            auVar217._0_2_ = auVar285._0_2_;
            auVar217._4_2_ = auVar285._0_2_;
            auVar217._6_2_ = auVar285._0_2_;
            auVar217._8_2_ = auVar285._0_2_;
            auVar217._10_2_ = auVar285._0_2_;
            auVar217._12_2_ = auVar285._0_2_;
            auVar217._14_2_ = auVar285._0_2_;
            auVar217._16_2_ = auVar285._0_2_;
            auVar217._18_2_ = auVar285._0_2_;
            auVar217._20_2_ = auVar285._0_2_;
            auVar217._22_2_ = auVar285._0_2_;
            auVar217._24_2_ = auVar285._0_2_;
            auVar217._26_2_ = auVar285._0_2_;
            auVar217._28_2_ = auVar285._0_2_;
            auVar217._30_2_ = auVar285._0_2_;
            auVar168 = vpaddw_avx2(auVar217,auVar167);
            auVar168 = vpcmpgtw_avx2(auVar168,auVar103);
            auVar153._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar170._0_16_;
            auVar153._16_16_ = ZEXT116(0) * auVar170._16_16_ + ZEXT116(1) * auVar184;
            auVar170 = vpblendvb_avx2(auVar153,auVar46,auVar168);
          }
          *(undefined1 (*) [32])(auStack_1860 + lVar9) = auVar170;
          uVar14 = uVar14 + dy;
          lVar9 = lVar9 + 0x20;
        } while (lVar9 != 0);
      }
      goto LAB_0036063f;
    }
    if (bw != 0x40) {
      return;
    }
    if (bd < 0xc) {
      uStackY_26a8 = 0x35f443;
      highbd_dr_prediction_z1_64xN_avx2(0x40,(uint16_t *)local_2060,0x40,left,dy,iVar18);
    }
    else {
      uStackY_26a8 = 0x3610ac;
      highbd_dr_prediction_32bit_z1_64xN_avx2(0x40,(uint16_t *)local_2060,0x40,left,dy,iVar18);
    }
    iVar18 = 0x40;
    pitchDst = local_2690;
    puVar13 = local_2688;
  }
  else {
    if (bh <= bw) {
      if (bh * 2 != bw) {
        if (bh == 0x10) {
          uVar4 = left[0x4f];
          auVar284._2_2_ = uVar4;
          auVar284._0_2_ = uVar4;
          auVar284._4_2_ = uVar4;
          auVar284._6_2_ = uVar4;
          auVar284._8_2_ = uVar4;
          auVar284._10_2_ = uVar4;
          auVar284._12_2_ = uVar4;
          auVar284._14_2_ = uVar4;
          auVar167._16_2_ = uVar4;
          auVar167._0_16_ = auVar284;
          auVar167._18_2_ = uVar4;
          auVar167._20_2_ = uVar4;
          auVar167._22_2_ = uVar4;
          auVar167._24_2_ = uVar4;
          auVar167._26_2_ = uVar4;
          auVar167._28_2_ = uVar4;
          auVar167._30_2_ = uVar4;
          if (bd < 0xc) {
            lVar9 = 0;
            auVar77._8_2_ = 0x10;
            auVar77._0_8_ = 0x10001000100010;
            auVar77._10_2_ = 0x10;
            auVar77._12_2_ = 0x10;
            auVar77._14_2_ = 0x10;
            auVar77._16_2_ = 0x10;
            auVar77._18_2_ = 0x10;
            auVar77._20_2_ = 0x10;
            auVar77._22_2_ = 0x10;
            auVar77._24_2_ = 0x10;
            auVar77._26_2_ = 0x10;
            auVar77._28_2_ = 0x10;
            auVar77._30_2_ = 0x10;
            auVar184 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar106._8_2_ = 0x4e;
            auVar106._0_8_ = 0x4e004e004e004e;
            auVar106._10_2_ = 0x4e;
            auVar106._12_2_ = 0x4e;
            auVar106._14_2_ = 0x4e;
            auVar106._16_2_ = 0x4e;
            auVar106._18_2_ = 0x4e;
            auVar106._20_2_ = 0x4e;
            auVar106._22_2_ = 0x4e;
            auVar106._24_2_ = 0x4e;
            auVar106._26_2_ = 0x4e;
            auVar106._28_2_ = 0x4e;
            auVar106._30_2_ = 0x4e;
            uVar11 = 0;
            uVar14 = dy;
            do {
              uVar15 = (int)uVar14 >> 6;
              if (0x4e < (int)uVar15) {
                if (uVar11 < 0x40) {
                  do {
                    *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
                    lVar9 = lVar9 + 0x20;
                  } while (lVar9 != 0x800);
                }
                break;
              }
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar126._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar126._8_2_ = uVar118;
              auVar126._10_2_ = uVar118;
              auVar126._12_2_ = uVar118;
              auVar126._14_2_ = uVar118;
              auVar126._16_2_ = uVar118;
              auVar126._18_2_ = uVar118;
              auVar126._20_2_ = uVar118;
              auVar126._22_2_ = uVar118;
              auVar126._24_2_ = uVar118;
              auVar126._26_2_ = uVar118;
              auVar126._28_2_ = uVar118;
              auVar126._30_2_ = uVar118;
              auVar170 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar15 + 1),
                                     *(undefined1 (*) [32])(left + (int)uVar15));
              auVar168 = vpmullw_avx2(auVar170,auVar126);
              auVar170 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar15),5);
              auVar170 = vpaddw_avx2(auVar170,auVar77);
              auVar170 = vpaddw_avx2(auVar168,auVar170);
              auVar168 = vpsrlw_avx2(auVar170,5);
              auVar299._0_2_ = (undefined2)uVar15;
              auVar299._2_2_ = auVar299._0_2_;
              auVar299._4_2_ = auVar299._0_2_;
              auVar299._6_2_ = auVar299._0_2_;
              auVar299._8_2_ = auVar299._0_2_;
              auVar299._10_2_ = auVar299._0_2_;
              auVar299._12_2_ = auVar299._0_2_;
              auVar299._14_2_ = auVar299._0_2_;
              auVar283 = vpaddw_avx(auVar299,auVar184);
              auVar299 = vpslldq_avx(auVar283,2);
              auVar299 = vpblendw_avx(auVar299,ZEXT416(uVar15),1);
              auVar283 = vpsrldq_avx(auVar283,0xe);
              auVar155._0_16_ = ZEXT116(0) * auVar283 + ZEXT116(1) * auVar284;
              auVar155._16_16_ = ZEXT116(0) * auVar167._16_16_ + ZEXT116(1) * auVar283;
              auVar221._0_2_ = (undefined2)(uVar15 + 9);
              auVar221._2_2_ = auVar221._0_2_;
              auVar221._4_2_ = auVar221._0_2_;
              auVar221._6_2_ = auVar221._0_2_;
              auVar221._8_2_ = auVar221._0_2_;
              auVar221._10_2_ = auVar221._0_2_;
              auVar221._12_2_ = auVar221._0_2_;
              auVar221._14_2_ = auVar221._0_2_;
              auVar221._16_2_ = auVar221._0_2_;
              auVar221._18_2_ = auVar221._0_2_;
              auVar221._20_2_ = auVar221._0_2_;
              auVar221._22_2_ = auVar221._0_2_;
              auVar221._24_2_ = auVar221._0_2_;
              auVar221._26_2_ = auVar221._0_2_;
              auVar221._28_2_ = auVar221._0_2_;
              auVar221._30_2_ = auVar221._0_2_;
              auVar170 = vpblendw_avx2(auVar155,auVar221,2);
              auVar222._0_2_ = (undefined2)(uVar15 + 10);
              auVar222._2_2_ = auVar222._0_2_;
              auVar222._4_2_ = auVar222._0_2_;
              auVar222._6_2_ = auVar222._0_2_;
              auVar222._8_2_ = auVar222._0_2_;
              auVar222._10_2_ = auVar222._0_2_;
              auVar222._12_2_ = auVar222._0_2_;
              auVar222._14_2_ = auVar222._0_2_;
              auVar222._16_2_ = auVar222._0_2_;
              auVar222._18_2_ = auVar222._0_2_;
              auVar222._20_2_ = auVar222._0_2_;
              auVar222._22_2_ = auVar222._0_2_;
              auVar222._24_2_ = auVar222._0_2_;
              auVar222._26_2_ = auVar222._0_2_;
              auVar222._28_2_ = auVar222._0_2_;
              auVar222._30_2_ = auVar222._0_2_;
              auVar170 = vpblendw_avx2(auVar170,auVar222,4);
              auVar223._0_2_ = (undefined2)(uVar15 + 0xb);
              auVar223._2_2_ = auVar223._0_2_;
              auVar223._4_2_ = auVar223._0_2_;
              auVar223._6_2_ = auVar223._0_2_;
              auVar223._8_2_ = auVar223._0_2_;
              auVar223._10_2_ = auVar223._0_2_;
              auVar223._12_2_ = auVar223._0_2_;
              auVar223._14_2_ = auVar223._0_2_;
              auVar223._16_2_ = auVar223._0_2_;
              auVar223._18_2_ = auVar223._0_2_;
              auVar223._20_2_ = auVar223._0_2_;
              auVar223._22_2_ = auVar223._0_2_;
              auVar223._24_2_ = auVar223._0_2_;
              auVar223._26_2_ = auVar223._0_2_;
              auVar223._28_2_ = auVar223._0_2_;
              auVar223._30_2_ = auVar223._0_2_;
              auVar170 = vpblendw_avx2(auVar170,auVar223,8);
              auVar224._0_2_ = (undefined2)(uVar15 + 0xc);
              auVar224._2_2_ = auVar224._0_2_;
              auVar224._4_2_ = auVar224._0_2_;
              auVar224._6_2_ = auVar224._0_2_;
              auVar224._8_2_ = auVar224._0_2_;
              auVar224._10_2_ = auVar224._0_2_;
              auVar224._12_2_ = auVar224._0_2_;
              auVar224._14_2_ = auVar224._0_2_;
              auVar224._16_2_ = auVar224._0_2_;
              auVar224._18_2_ = auVar224._0_2_;
              auVar224._20_2_ = auVar224._0_2_;
              auVar224._22_2_ = auVar224._0_2_;
              auVar224._24_2_ = auVar224._0_2_;
              auVar224._26_2_ = auVar224._0_2_;
              auVar224._28_2_ = auVar224._0_2_;
              auVar224._30_2_ = auVar224._0_2_;
              auVar170 = vpblendw_avx2(auVar170,auVar224,0x10);
              auVar225._0_2_ = (undefined2)(uVar15 + 0xd);
              auVar225._2_2_ = auVar225._0_2_;
              auVar225._4_2_ = auVar225._0_2_;
              auVar225._6_2_ = auVar225._0_2_;
              auVar225._8_2_ = auVar225._0_2_;
              auVar225._10_2_ = auVar225._0_2_;
              auVar225._12_2_ = auVar225._0_2_;
              auVar225._14_2_ = auVar225._0_2_;
              auVar225._16_2_ = auVar225._0_2_;
              auVar225._18_2_ = auVar225._0_2_;
              auVar225._20_2_ = auVar225._0_2_;
              auVar225._22_2_ = auVar225._0_2_;
              auVar225._24_2_ = auVar225._0_2_;
              auVar225._26_2_ = auVar225._0_2_;
              auVar225._28_2_ = auVar225._0_2_;
              auVar225._30_2_ = auVar225._0_2_;
              auVar170 = vpblendw_avx2(auVar170,auVar225,0x20);
              auVar226._0_2_ = (undefined2)(uVar15 + 0xe);
              auVar226._2_2_ = auVar226._0_2_;
              auVar226._4_2_ = auVar226._0_2_;
              auVar226._6_2_ = auVar226._0_2_;
              auVar226._8_2_ = auVar226._0_2_;
              auVar226._10_2_ = auVar226._0_2_;
              auVar226._12_2_ = auVar226._0_2_;
              auVar226._14_2_ = auVar226._0_2_;
              auVar226._16_2_ = auVar226._0_2_;
              auVar226._18_2_ = auVar226._0_2_;
              auVar226._20_2_ = auVar226._0_2_;
              auVar226._22_2_ = auVar226._0_2_;
              auVar226._24_2_ = auVar226._0_2_;
              auVar226._26_2_ = auVar226._0_2_;
              auVar226._28_2_ = auVar226._0_2_;
              auVar226._30_2_ = auVar226._0_2_;
              auVar170 = vpblendw_avx2(auVar170,auVar226,0x40);
              auVar227._0_2_ = (undefined2)(uVar15 + 0xf);
              auVar227._2_2_ = auVar227._0_2_;
              auVar227._4_2_ = auVar227._0_2_;
              auVar227._6_2_ = auVar227._0_2_;
              auVar227._8_2_ = auVar227._0_2_;
              auVar227._10_2_ = auVar227._0_2_;
              auVar227._12_2_ = auVar227._0_2_;
              auVar227._14_2_ = auVar227._0_2_;
              auVar227._16_2_ = auVar227._0_2_;
              auVar227._18_2_ = auVar227._0_2_;
              auVar227._20_2_ = auVar227._0_2_;
              auVar227._22_2_ = auVar227._0_2_;
              auVar227._24_2_ = auVar227._0_2_;
              auVar227._26_2_ = auVar227._0_2_;
              auVar227._28_2_ = auVar227._0_2_;
              auVar227._30_2_ = auVar227._0_2_;
              auVar170 = vpblendw_avx2(auVar170,auVar227,0x80);
              auVar170 = vpblendd_avx2(ZEXT1632(auVar299),auVar170,0xf0);
              auVar170 = vpcmpgtw_avx2(auVar170,auVar106);
              auVar170 = vpblendvb_avx2(auVar168,auVar167,auVar170);
              *(undefined1 (*) [32])(local_2060 + lVar9) = auVar170;
              uVar14 = uVar14 + dy;
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x20;
            } while (uVar11 != 0x40);
          }
          else {
            lVar9 = 0;
            auVar170._8_4_ = 0x10;
            auVar170._0_8_ = 0x1000000010;
            auVar170._12_4_ = 0x10;
            auVar170._16_4_ = 0x10;
            auVar170._20_4_ = 0x10;
            auVar170._24_4_ = 0x10;
            auVar170._28_4_ = 0x10;
            auVar184 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar168._8_2_ = 0x4e;
            auVar168._0_8_ = 0x4e004e004e004e;
            auVar168._10_2_ = 0x4e;
            auVar168._12_2_ = 0x4e;
            auVar168._14_2_ = 0x4e;
            auVar168._16_2_ = 0x4e;
            auVar168._18_2_ = 0x4e;
            auVar168._20_2_ = 0x4e;
            auVar168._22_2_ = 0x4e;
            auVar168._24_2_ = 0x4e;
            auVar168._26_2_ = 0x4e;
            auVar168._28_2_ = 0x4e;
            auVar168._30_2_ = 0x4e;
            uVar11 = 0;
            uVar14 = dy;
            do {
              uVar15 = (int)uVar14 >> 6;
              if (0x4e < (int)uVar15) {
                if (uVar11 < 0x40) {
                  do {
                    *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
                    lVar9 = lVar9 + 0x20;
                  } while (lVar9 != 0x800);
                }
                break;
              }
              uVar21 = uVar14 >> 1;
              uVar19 = uVar21 & 0x1f;
              auVar130._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f0000001f;
              auVar130._8_4_ = uVar19;
              auVar130._12_4_ = uVar19;
              auVar130._16_4_ = uVar19;
              auVar130._20_4_ = uVar19;
              auVar130._24_4_ = uVar19;
              auVar130._28_4_ = uVar19;
              auVar283 = auVar284;
              if (uVar15 - 0x50 < 0xfffffff7) {
                auVar161 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
                auVar175 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
                auVar175 = vpsubd_avx2(auVar175,auVar161);
                auVar161 = vpslld_avx2(auVar161,5);
                auVar175 = vpmulld_avx2(auVar175,auVar130);
                auVar161 = vpaddd_avx2(auVar161,auVar170);
                auVar161 = vpaddd_avx2(auVar175,auVar161);
                auVar161 = vpsrld_avx2(auVar161,5);
                auVar175._0_16_ = ZEXT116(0) * auVar284 + ZEXT116(1) * auVar161._16_16_;
                auVar175._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar284;
                auVar161 = vpackusdw_avx2(auVar161,auVar175);
                auVar283 = auVar161._0_16_;
              }
              auVar161 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
              auVar175 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
              auVar175 = vpsubd_avx2(auVar175,auVar161);
              auVar176 = vpslld_avx2(auVar161,5);
              auVar161 = vpmulld_avx2(auVar175,auVar130);
              auVar130 = vpaddd_avx2(auVar176,auVar170);
              auVar130 = vpaddd_avx2(auVar161,auVar130);
              auVar130 = vpsrld_avx2(auVar130,5);
              auVar130 = vpackusdw_avx2(auVar130,ZEXT1632(auVar130._16_16_));
              auVar161._0_16_ = ZEXT116(0) * auVar283 + ZEXT116(1) * auVar130._0_16_;
              auVar161._16_16_ = ZEXT116(0) * auVar130._16_16_ + ZEXT116(1) * auVar283;
              auVar283._0_2_ = (undefined2)uVar15;
              auVar283._2_2_ = auVar283._0_2_;
              auVar283._4_2_ = auVar283._0_2_;
              auVar283._6_2_ = auVar283._0_2_;
              auVar283._8_2_ = auVar283._0_2_;
              auVar283._10_2_ = auVar283._0_2_;
              auVar283._12_2_ = auVar283._0_2_;
              auVar283._14_2_ = auVar283._0_2_;
              auVar283 = vpaddw_avx(auVar283,auVar184);
              auVar299 = vpslldq_avx(auVar283,2);
              auVar299 = vpblendw_avx(auVar299,ZEXT416(uVar15),1);
              auVar283 = vpsrldq_avx(auVar283,0xe);
              auVar176._0_16_ = ZEXT116(0) * auVar283 + ZEXT116(1) * auVar284;
              auVar176._16_16_ = ZEXT116(0) * auVar167._16_16_ + ZEXT116(1) * auVar283;
              auVar248._0_2_ = (undefined2)(uVar15 + 9);
              auVar248._2_2_ = auVar248._0_2_;
              auVar248._4_2_ = auVar248._0_2_;
              auVar248._6_2_ = auVar248._0_2_;
              auVar248._8_2_ = auVar248._0_2_;
              auVar248._10_2_ = auVar248._0_2_;
              auVar248._12_2_ = auVar248._0_2_;
              auVar248._14_2_ = auVar248._0_2_;
              auVar248._16_2_ = auVar248._0_2_;
              auVar248._18_2_ = auVar248._0_2_;
              auVar248._20_2_ = auVar248._0_2_;
              auVar248._22_2_ = auVar248._0_2_;
              auVar248._24_2_ = auVar248._0_2_;
              auVar248._26_2_ = auVar248._0_2_;
              auVar248._28_2_ = auVar248._0_2_;
              auVar248._30_2_ = auVar248._0_2_;
              auVar130 = vpblendw_avx2(auVar176,auVar248,2);
              auVar249._0_2_ = (undefined2)(uVar15 + 10);
              auVar249._2_2_ = auVar249._0_2_;
              auVar249._4_2_ = auVar249._0_2_;
              auVar249._6_2_ = auVar249._0_2_;
              auVar249._8_2_ = auVar249._0_2_;
              auVar249._10_2_ = auVar249._0_2_;
              auVar249._12_2_ = auVar249._0_2_;
              auVar249._14_2_ = auVar249._0_2_;
              auVar249._16_2_ = auVar249._0_2_;
              auVar249._18_2_ = auVar249._0_2_;
              auVar249._20_2_ = auVar249._0_2_;
              auVar249._22_2_ = auVar249._0_2_;
              auVar249._24_2_ = auVar249._0_2_;
              auVar249._26_2_ = auVar249._0_2_;
              auVar249._28_2_ = auVar249._0_2_;
              auVar249._30_2_ = auVar249._0_2_;
              auVar130 = vpblendw_avx2(auVar130,auVar249,4);
              auVar250._0_2_ = (undefined2)(uVar15 + 0xb);
              auVar250._2_2_ = auVar250._0_2_;
              auVar250._4_2_ = auVar250._0_2_;
              auVar250._6_2_ = auVar250._0_2_;
              auVar250._8_2_ = auVar250._0_2_;
              auVar250._10_2_ = auVar250._0_2_;
              auVar250._12_2_ = auVar250._0_2_;
              auVar250._14_2_ = auVar250._0_2_;
              auVar250._16_2_ = auVar250._0_2_;
              auVar250._18_2_ = auVar250._0_2_;
              auVar250._20_2_ = auVar250._0_2_;
              auVar250._22_2_ = auVar250._0_2_;
              auVar250._24_2_ = auVar250._0_2_;
              auVar250._26_2_ = auVar250._0_2_;
              auVar250._28_2_ = auVar250._0_2_;
              auVar250._30_2_ = auVar250._0_2_;
              auVar130 = vpblendw_avx2(auVar130,auVar250,8);
              auVar251._0_2_ = (undefined2)(uVar15 + 0xc);
              auVar251._2_2_ = auVar251._0_2_;
              auVar251._4_2_ = auVar251._0_2_;
              auVar251._6_2_ = auVar251._0_2_;
              auVar251._8_2_ = auVar251._0_2_;
              auVar251._10_2_ = auVar251._0_2_;
              auVar251._12_2_ = auVar251._0_2_;
              auVar251._14_2_ = auVar251._0_2_;
              auVar251._16_2_ = auVar251._0_2_;
              auVar251._18_2_ = auVar251._0_2_;
              auVar251._20_2_ = auVar251._0_2_;
              auVar251._22_2_ = auVar251._0_2_;
              auVar251._24_2_ = auVar251._0_2_;
              auVar251._26_2_ = auVar251._0_2_;
              auVar251._28_2_ = auVar251._0_2_;
              auVar251._30_2_ = auVar251._0_2_;
              auVar130 = vpblendw_avx2(auVar130,auVar251,0x10);
              auVar252._0_2_ = (undefined2)(uVar15 + 0xd);
              auVar252._2_2_ = auVar252._0_2_;
              auVar252._4_2_ = auVar252._0_2_;
              auVar252._6_2_ = auVar252._0_2_;
              auVar252._8_2_ = auVar252._0_2_;
              auVar252._10_2_ = auVar252._0_2_;
              auVar252._12_2_ = auVar252._0_2_;
              auVar252._14_2_ = auVar252._0_2_;
              auVar252._16_2_ = auVar252._0_2_;
              auVar252._18_2_ = auVar252._0_2_;
              auVar252._20_2_ = auVar252._0_2_;
              auVar252._22_2_ = auVar252._0_2_;
              auVar252._24_2_ = auVar252._0_2_;
              auVar252._26_2_ = auVar252._0_2_;
              auVar252._28_2_ = auVar252._0_2_;
              auVar252._30_2_ = auVar252._0_2_;
              auVar130 = vpblendw_avx2(auVar130,auVar252,0x20);
              auVar253._0_2_ = (undefined2)(uVar15 + 0xe);
              auVar253._2_2_ = auVar253._0_2_;
              auVar253._4_2_ = auVar253._0_2_;
              auVar253._6_2_ = auVar253._0_2_;
              auVar253._8_2_ = auVar253._0_2_;
              auVar253._10_2_ = auVar253._0_2_;
              auVar253._12_2_ = auVar253._0_2_;
              auVar253._14_2_ = auVar253._0_2_;
              auVar253._16_2_ = auVar253._0_2_;
              auVar253._18_2_ = auVar253._0_2_;
              auVar253._20_2_ = auVar253._0_2_;
              auVar253._22_2_ = auVar253._0_2_;
              auVar253._24_2_ = auVar253._0_2_;
              auVar253._26_2_ = auVar253._0_2_;
              auVar253._28_2_ = auVar253._0_2_;
              auVar253._30_2_ = auVar253._0_2_;
              auVar130 = vpblendw_avx2(auVar130,auVar253,0x40);
              auVar254._0_2_ = (undefined2)(uVar15 + 0xf);
              auVar254._2_2_ = auVar254._0_2_;
              auVar254._4_2_ = auVar254._0_2_;
              auVar254._6_2_ = auVar254._0_2_;
              auVar254._8_2_ = auVar254._0_2_;
              auVar254._10_2_ = auVar254._0_2_;
              auVar254._12_2_ = auVar254._0_2_;
              auVar254._14_2_ = auVar254._0_2_;
              auVar254._16_2_ = auVar254._0_2_;
              auVar254._18_2_ = auVar254._0_2_;
              auVar254._20_2_ = auVar254._0_2_;
              auVar254._22_2_ = auVar254._0_2_;
              auVar254._24_2_ = auVar254._0_2_;
              auVar254._26_2_ = auVar254._0_2_;
              auVar254._28_2_ = auVar254._0_2_;
              auVar254._30_2_ = auVar254._0_2_;
              auVar130 = vpblendw_avx2(auVar130,auVar254,0x80);
              auVar130 = vpblendd_avx2(ZEXT1632(auVar299),auVar130,0xf0);
              auVar130 = vpcmpgtw_avx2(auVar130,auVar168);
              auVar130 = vpblendvb_avx2(auVar161,auVar167,auVar130);
              *(undefined1 (*) [32])(local_2060 + lVar9) = auVar130;
              uVar14 = uVar14 + dy;
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x20;
            } while (uVar11 != 0x40);
          }
          uVar11 = 0;
          do {
            lVar9 = uVar11 * 0x20;
            auVar167 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_2060 + lVar9),
                                       *(undefined1 (*) [32])(local_2040 + lVar9));
            auVar170 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_2020 + lVar9),
                                       *(undefined1 (*) [32])(local_2000 + lVar9));
            auVar168 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1fe0 + lVar9),
                                       *(undefined1 (*) [32])(local_1fc0 + lVar9));
            auVar130 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1fa0 + lVar9),
                                       *(undefined1 (*) [32])(local_1f80 + lVar9));
            auVar161 = vpunpckldq_avx2(auVar167,auVar170);
            auVar175 = vpunpckldq_avx2(auVar168,auVar130);
            _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
            local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
            auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
            auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
            local_2620 = vpunpcklqdq_avx2(auVar167,auVar170);
            local_2600 = vpunpckhqdq_avx2(auVar167,auVar170);
            auVar167 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_2060 + lVar9),
                                       *(undefined1 (*) [32])(local_2040 + lVar9));
            auVar170 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_2020 + lVar9),
                                       *(undefined1 (*) [32])(local_2000 + lVar9));
            auVar168 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1fe0 + lVar9),
                                       *(undefined1 (*) [32])(local_1fc0 + lVar9));
            auVar130 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1fa0 + lVar9),
                                       *(undefined1 (*) [32])(local_1f80 + lVar9));
            auVar161 = vpunpckldq_avx2(auVar167,auVar170);
            auVar175 = vpunpckldq_avx2(auVar168,auVar130);
            local_25e0 = vpunpcklqdq_avx2(auVar161,auVar175);
            local_25c0 = vpunpckhqdq_avx2(auVar161,auVar175);
            auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
            auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
            local_25a0 = vpunpcklqdq_avx2(auVar167,auVar170);
            local_2580 = vpunpckhqdq_avx2(auVar167,auVar170);
            auVar167 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1f60 + lVar9),
                                       *(undefined1 (*) [32])(local_1f40 + lVar9));
            auVar170 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1f20 + lVar9),
                                       *(undefined1 (*) [32])(local_1f00 + lVar9));
            auVar168 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1ee0 + lVar9),
                                       *(undefined1 (*) [32])(local_1ec0 + lVar9));
            auVar130 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1ea0 + lVar9),
                                       *(undefined1 (*) [32])(local_1e80 + lVar9));
            auVar161 = vpunpckldq_avx2(auVar167,auVar170);
            auVar175 = vpunpckldq_avx2(auVar168,auVar130);
            local_2560 = vpunpcklqdq_avx2(auVar161,auVar175);
            local_2540 = vpunpckhqdq_avx2(auVar161,auVar175);
            auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
            auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
            local_2520 = vpunpcklqdq_avx2(auVar167,auVar170);
            local_2500 = vpunpckhqdq_avx2(auVar167,auVar170);
            auVar167 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1f60 + lVar9),
                                       *(undefined1 (*) [32])(local_1f40 + lVar9));
            auVar170 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1f20 + lVar9),
                                       *(undefined1 (*) [32])(local_1f00 + lVar9));
            auVar168 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1ee0 + lVar9),
                                       *(undefined1 (*) [32])(local_1ec0 + lVar9));
            auVar130 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1ea0 + lVar9),
                                       *(undefined1 (*) [32])(local_1e80 + lVar9));
            auVar161 = vpunpckldq_avx2(auVar167,auVar170);
            auVar175 = vpunpckldq_avx2(auVar168,auVar130);
            local_24e0 = vpunpcklqdq_avx2(auVar161,auVar175);
            local_24c0 = vpunpckhqdq_avx2(auVar161,auVar175);
            auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
            auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
            local_24a0 = vpunpcklqdq_avx2(auVar167,auVar170);
            local_2480 = vpunpckhqdq_avx2(auVar167,auVar170);
            lVar9 = 0x100;
            do {
              auVar167 = *(undefined1 (*) [32])(local_2660 + lVar9);
              auVar170 = vperm2i128_avx2(auVar167,*(undefined1 (*) [32])
                                                   ((long)auStackY_2760 + lVar9),2);
              auVar58._0_16_ =
                   ZEXT116(1) * *(undefined1 (*) [16])(auStackY_2750 + lVar9) +
                   ZEXT116(0) * auVar167._0_16_;
              auVar58._16_16_ =
                   ZEXT116(1) * auVar167._16_16_ +
                   ZEXT116(0) * *(undefined1 (*) [16])(auStackY_2750 + lVar9);
              *(undefined1 (*) [32])(auStack_2360 + lVar9) = auVar170;
              *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar58;
              lVar9 = lVar9 + 0x20;
            } while (lVar9 != 0x200);
            lVar9 = 0;
            puVar13 = dst;
            do {
              uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
              uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
              uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
              *(undefined8 *)puVar13 = *(undefined8 *)((long)auStack_2260 + lVar9);
              *(undefined8 *)(puVar13 + 4) = uVar5;
              *(undefined8 *)(puVar13 + 8) = uVar7;
              *(undefined8 *)(puVar13 + 0xc) = uVar8;
              lVar9 = lVar9 + 0x20;
              puVar13 = puVar13 + stride;
            } while (lVar9 != 0x200);
            dst = dst + 0x10;
            bVar28 = uVar11 < 0x30;
            uVar11 = uVar11 + 0x10;
          } while (bVar28);
          return;
        }
        if (bh == 8) {
          iVar18 = 0x27 << (bVar10 & 0x1f);
          uVar4 = left[iVar18];
          auVar184._2_2_ = uVar4;
          auVar184._0_2_ = uVar4;
          auVar184._4_2_ = uVar4;
          auVar184._6_2_ = uVar4;
          auVar184._8_2_ = uVar4;
          auVar184._10_2_ = uVar4;
          auVar184._12_2_ = uVar4;
          auVar184._14_2_ = uVar4;
          auVar52._16_2_ = uVar4;
          auVar52._0_16_ = auVar184;
          auVar52._18_2_ = uVar4;
          auVar52._20_2_ = uVar4;
          auVar52._22_2_ = uVar4;
          auVar52._24_2_ = uVar4;
          auVar52._26_2_ = uVar4;
          auVar52._28_2_ = uVar4;
          auVar52._30_2_ = uVar4;
          if (bd < 0xc) {
            auVar66._0_2_ = (undefined2)iVar18;
            auVar66._2_2_ = auVar66._0_2_;
            auVar66._4_2_ = auVar66._0_2_;
            auVar66._6_2_ = auVar66._0_2_;
            auVar66._8_2_ = auVar66._0_2_;
            auVar66._10_2_ = auVar66._0_2_;
            auVar66._12_2_ = auVar66._0_2_;
            auVar66._14_2_ = auVar66._0_2_;
            lVar9 = 0;
            auVar95._8_2_ = 0x10;
            auVar95._0_8_ = 0x10001000100010;
            auVar95._10_2_ = 0x10;
            auVar95._12_2_ = 0x10;
            auVar95._14_2_ = 0x10;
            auVar154._8_2_ = 0x1f;
            auVar154._0_8_ = 0x1f001f001f001f;
            auVar154._10_2_ = 0x1f;
            auVar154._12_2_ = 0x1f;
            auVar154._14_2_ = 0x1f;
            auVar154._16_2_ = 0x1f;
            auVar154._18_2_ = 0x1f;
            auVar154._20_2_ = 0x1f;
            auVar154._22_2_ = 0x1f;
            auVar154._24_2_ = 0x1f;
            auVar154._26_2_ = 0x1f;
            auVar154._28_2_ = 0x1f;
            auVar154._30_2_ = 0x1f;
            uVar11 = 0;
            uVar14 = dy;
            do {
              uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
              if (iVar18 <= (int)uVar15) {
                if (uVar11 < 0x20) {
                  do {
                    *(undefined1 (*) [16])(local_2060 + lVar9) = auVar184;
                    lVar9 = lVar9 + 0x10;
                  } while (lVar9 != 0x200);
                }
                break;
              }
              auVar284 = *(undefined1 (*) [16])(left + (int)uVar15);
              if (upsample_left == 0) {
                auVar283 = *(undefined1 (*) [16])(left + (long)(int)uVar15 + 1);
                auVar299 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 1,1);
                auVar299 = vpinsrw_avx(auVar299,uVar15 + 2,2);
                auVar299 = vpinsrw_avx(auVar299,uVar15 + 3,3);
                auVar299 = vpinsrw_avx(auVar299,uVar15 + 4,4);
                auVar299 = vpinsrw_avx(auVar299,uVar15 + 5,5);
                auVar299 = vpinsrw_avx(auVar299,uVar15 + 6,6);
                auVar299 = vpinsrw_avx(auVar299,uVar15 + 7,7);
                uVar6 = (ushort)(uVar14 >> 1);
                uVar118 = uVar6 & 0x1f;
                auVar301._0_8_ =
                     CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                auVar301._8_2_ = uVar118;
                auVar301._10_2_ = uVar118;
                auVar301._12_2_ = uVar118;
                auVar301._14_2_ = uVar118;
              }
              else {
                auVar283 = vpblendw_avx(auVar284,(undefined1  [16])0x0,0xaa);
                auVar299 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),
                                        (undefined1  [16])0x0,0xaa);
                auVar347 = vpsrld_avx(auVar284,0x10);
                auVar284 = vpackusdw_avx(auVar283,auVar299);
                auVar342 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),0x10);
                auVar283 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 2,1);
                auVar283 = vpinsrw_avx(auVar283,uVar15 + 4,2);
                auVar283 = vpinsrw_avx(auVar283,uVar15 + 6,3);
                auVar283 = vpinsrw_avx(auVar283,uVar15 + 8,4);
                auVar283 = vpinsrw_avx(auVar283,uVar15 + 10,5);
                auVar283 = vpinsrw_avx(auVar283,uVar15 + 0xc,6);
                auVar299 = vpinsrw_avx(auVar283,uVar15 + 0xe,7);
                auVar324._0_2_ = (undefined2)uVar14;
                auVar324._2_2_ = auVar324._0_2_;
                auVar324._4_2_ = auVar324._0_2_;
                auVar324._6_2_ = auVar324._0_2_;
                auVar324._8_2_ = auVar324._0_2_;
                auVar324._10_2_ = auVar324._0_2_;
                auVar324._12_2_ = auVar324._0_2_;
                auVar324._14_2_ = auVar324._0_2_;
                auVar324._16_2_ = auVar324._0_2_;
                auVar324._18_2_ = auVar324._0_2_;
                auVar324._20_2_ = auVar324._0_2_;
                auVar324._22_2_ = auVar324._0_2_;
                auVar324._24_2_ = auVar324._0_2_;
                auVar324._26_2_ = auVar324._0_2_;
                auVar324._28_2_ = auVar324._0_2_;
                auVar324._30_2_ = auVar324._0_2_;
                auVar167 = vpsllw_avx2(auVar324,ZEXT416((uint)upsample_left));
                auVar283 = vpackusdw_avx(auVar347,auVar342);
                auVar167 = vpsrlw_avx2(auVar167,1);
                auVar167 = vpand_avx2(auVar167,auVar154);
                auVar301 = auVar167._0_16_;
              }
              auVar342 = vpsllw_avx(auVar284,5);
              auVar342 = vpaddw_avx(auVar342,auVar95);
              auVar284 = vpsubw_avx(auVar283,auVar284);
              auVar284 = vpmullw_avx(auVar301,auVar284);
              auVar284 = vpaddw_avx(auVar342,auVar284);
              auVar283 = vpsrlw_avx(auVar284,5);
              auVar284 = vpcmpgtw_avx(auVar66,auVar299);
              auVar284 = vpblendvb_avx(auVar184,auVar283,auVar284);
              *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
              uVar14 = uVar14 + dy;
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar11 != 0x20);
          }
          else {
            auVar82._4_4_ = iVar18;
            auVar82._0_4_ = iVar18;
            auVar82._8_4_ = iVar18;
            auVar82._12_4_ = iVar18;
            auVar82._16_4_ = iVar18;
            auVar82._20_4_ = iVar18;
            auVar82._24_4_ = iVar18;
            auVar82._28_4_ = iVar18;
            lVar9 = 0;
            auVar284 = vpmovsxbd_avx(ZEXT416(0x3020104));
            auVar111._8_4_ = 0x10;
            auVar111._0_8_ = 0x1000000010;
            auVar111._12_4_ = 0x10;
            auVar111._16_4_ = 0x10;
            auVar111._20_4_ = 0x10;
            auVar111._24_4_ = 0x10;
            auVar111._28_4_ = 0x10;
            auVar283 = vpmovsxbd_avx(ZEXT416(0x6040208));
            auVar174._8_4_ = 0x1f;
            auVar174._0_8_ = 0x1f0000001f;
            auVar174._12_4_ = 0x1f;
            auVar174._16_4_ = 0x1f;
            auVar174._20_4_ = 0x1f;
            auVar174._24_4_ = 0x1f;
            auVar174._28_4_ = 0x1f;
            uVar11 = 0;
            uVar14 = dy;
            do {
              iVar23 = (int)uVar14 >> (6 - bVar10 & 0x1f);
              if (iVar18 <= iVar23) {
                if (uVar11 < 0x20) {
                  do {
                    *(undefined1 (*) [16])(local_2060 + lVar9) = auVar184;
                    lVar9 = lVar9 + 0x10;
                  } while (lVar9 != 0x200);
                }
                break;
              }
              auVar247 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
              if (upsample_left == 0) {
                auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
                auVar342._4_4_ = iVar23;
                auVar342._0_4_ = iVar23;
                auVar342._8_4_ = iVar23;
                auVar342._12_4_ = iVar23;
                iVar1 = iVar23 + 5;
                iVar2 = iVar23 + 6;
                iVar23 = iVar23 + 7;
                auVar299 = vpaddd_avx(auVar342,auVar284);
                auVar170 = vpermq_avx2(ZEXT1632(auVar299),0xc4);
                auVar170 = vpblendd_avx2(auVar170,ZEXT1632(auVar342),1);
                auVar366._4_4_ = iVar1;
                auVar366._0_4_ = iVar1;
                auVar366._8_4_ = iVar1;
                auVar366._12_4_ = iVar1;
                auVar366._16_4_ = iVar1;
                auVar366._20_4_ = iVar1;
                auVar366._24_4_ = iVar1;
                auVar366._28_4_ = iVar1;
                auVar170 = vpblendd_avx2(auVar170,auVar366,0x20);
                auVar367._4_4_ = iVar2;
                auVar367._0_4_ = iVar2;
                auVar367._8_4_ = iVar2;
                auVar367._12_4_ = iVar2;
                auVar367._16_4_ = iVar2;
                auVar367._20_4_ = iVar2;
                auVar367._24_4_ = iVar2;
                auVar367._28_4_ = iVar2;
                auVar170 = vpblendd_avx2(auVar170,auVar367,0x40);
                auVar368._4_4_ = iVar23;
                auVar368._0_4_ = iVar23;
                auVar368._8_4_ = iVar23;
                auVar368._12_4_ = iVar23;
                auVar368._16_4_ = iVar23;
                auVar368._20_4_ = iVar23;
                auVar368._24_4_ = iVar23;
                auVar368._28_4_ = iVar23;
                auVar170 = vpblendd_avx2(auVar170,auVar368,0x80);
                uVar15 = uVar14 >> 1;
                uVar21 = uVar15 & 0x1f;
                auVar369._0_8_ = CONCAT44(uVar15,uVar15) & 0x1f0000001f;
                auVar369._8_4_ = uVar21;
                auVar369._12_4_ = uVar21;
                auVar369._16_4_ = uVar21;
                auVar369._20_4_ = uVar21;
                auVar369._24_4_ = uVar21;
                auVar369._28_4_ = uVar21;
              }
              else {
                auVar170 = vpshufd_avx2(auVar247,0xd8);
                auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
                auVar168 = vpermq_avx2(auVar170,0xd8);
                auVar167 = vpshufd_avx2(auVar167,0xd8);
                auVar130 = vpermq_avx2(auVar167,0xd8);
                auVar347._4_4_ = iVar23;
                auVar347._0_4_ = iVar23;
                auVar347._8_4_ = iVar23;
                auVar347._12_4_ = iVar23;
                iVar1 = iVar23 + 10;
                iVar2 = iVar23 + 0xc;
                iVar23 = iVar23 + 0xe;
                auVar299 = vpaddd_avx(auVar347,auVar283);
                auVar167 = vpermq_avx2(ZEXT1632(auVar299),0xc4);
                auVar167 = vpblendd_avx2(auVar167,ZEXT1632(auVar347),1);
                auVar333._4_4_ = iVar1;
                auVar333._0_4_ = iVar1;
                auVar333._8_4_ = iVar1;
                auVar333._12_4_ = iVar1;
                auVar333._16_4_ = iVar1;
                auVar333._20_4_ = iVar1;
                auVar333._24_4_ = iVar1;
                auVar333._28_4_ = iVar1;
                auVar167 = vpblendd_avx2(auVar167,auVar333,0x20);
                auVar334._4_4_ = iVar2;
                auVar334._0_4_ = iVar2;
                auVar334._8_4_ = iVar2;
                auVar334._12_4_ = iVar2;
                auVar334._16_4_ = iVar2;
                auVar334._20_4_ = iVar2;
                auVar334._24_4_ = iVar2;
                auVar334._28_4_ = iVar2;
                auVar167 = vpblendd_avx2(auVar167,auVar334,0x40);
                auVar335._4_4_ = iVar23;
                auVar335._0_4_ = iVar23;
                auVar335._8_4_ = iVar23;
                auVar335._12_4_ = iVar23;
                auVar335._16_4_ = iVar23;
                auVar335._20_4_ = iVar23;
                auVar335._24_4_ = iVar23;
                auVar335._28_4_ = iVar23;
                auVar170 = vpblendd_avx2(auVar167,auVar335,0x80);
                auVar246._4_4_ = uVar14;
                auVar246._0_4_ = uVar14;
                auVar246._8_4_ = uVar14;
                auVar246._12_4_ = uVar14;
                auVar246._16_4_ = uVar14;
                auVar246._20_4_ = uVar14;
                auVar246._24_4_ = uVar14;
                auVar246._28_4_ = uVar14;
                auVar167 = vpslld_avx2(auVar246,ZEXT416((uint)upsample_left));
                auVar247._0_16_ = ZEXT116(0) * auVar130._0_16_ + ZEXT116(1) * auVar168._0_16_;
                auVar247._16_16_ = ZEXT116(0) * auVar168._16_16_ + ZEXT116(1) * auVar130._0_16_;
                auVar167 = vpsrld_avx2(auVar167,1);
                auVar369 = vpand_avx2(auVar167,auVar174);
                auVar167 = vperm2i128_avx2(auVar168,auVar130,0x31);
              }
              auVar170 = vpcmpgtd_avx2(auVar82,auVar170);
              auVar167 = vpsubd_avx2(auVar167,auVar247);
              auVar168 = vpmulld_avx2(auVar167,auVar369);
              auVar167 = vpslld_avx2(auVar247,5);
              auVar167 = vpaddd_avx2(auVar167,auVar111);
              auVar167 = vpaddd_avx2(auVar168,auVar167);
              auVar167 = vpsrld_avx2(auVar167,5);
              auVar342 = vpackusdw_avx(auVar167._0_16_,auVar167._16_16_);
              auVar299 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
              auVar167 = vpblendvb_avx2(auVar52,ZEXT1632(auVar342),ZEXT1632(auVar299));
              *(undefined1 (*) [16])(local_2060 + lVar9) = auVar167._0_16_;
              uVar14 = uVar14 + dy;
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar11 != 0x20);
          }
          uVar11 = 0xfffffffffffffff8;
          lVar9 = 0x70;
          do {
            auVar284 = *(undefined1 (*) [16])(auStack_20d0 + lVar9);
            auVar184 = *(undefined1 (*) [16])(auStack_20c0 + lVar9);
            auVar283 = *(undefined1 (*) [16])(auStack_20b0 + lVar9);
            auVar299 = *(undefined1 (*) [16])(auStack_20a0 + lVar9);
            auVar342 = *(undefined1 (*) [16])(auStack_2090 + lVar9);
            auVar347 = *(undefined1 (*) [16])(auStack_2080 + lVar9);
            auVar66 = *(undefined1 (*) [16])(auStack_2070 + lVar9);
            auVar95 = *(undefined1 (*) [16])(local_2060 + lVar9);
            auVar33 = vpunpcklwd_avx(auVar284,auVar184);
            auVar68 = vpunpcklwd_avx(auVar283,auVar299);
            auVar97 = vpunpcklwd_avx(auVar342,auVar347);
            auVar288 = vpunpcklwd_avx(auVar66,auVar95);
            auVar301 = vpunpckldq_avx(auVar33,auVar68);
            auVar63 = vpunpckldq_avx(auVar97,auVar288);
            auVar92 = vpunpcklqdq_avx(auVar301,auVar63);
            *(undefined1 (*) [16])(auStackY_26d0 + lVar9) = auVar92;
            auVar301 = vpunpckhqdq_avx(auVar301,auVar63);
            *(undefined1 (*) [16])(auStackY_26c0 + lVar9) = auVar301;
            auVar301 = vpunpckhdq_avx(auVar33,auVar68);
            auVar33 = vpunpckhdq_avx(auVar97,auVar288);
            auVar68 = vpunpcklqdq_avx(auVar301,auVar33);
            *(undefined1 (*) [16])(auStackY_26b0 + lVar9) = auVar68;
            auVar301 = vpunpckhqdq_avx(auVar301,auVar33);
            *(undefined1 (*) [16])(local_2680 + lVar9 + -0x20) = auVar301;
            auVar284 = vpunpckhwd_avx(auVar284,auVar184);
            auVar184 = vpunpckhwd_avx(auVar283,auVar299);
            auVar283 = vpunpckhwd_avx(auVar342,auVar347);
            auVar299 = vpunpckhwd_avx(auVar66,auVar95);
            auVar342 = vpunpckldq_avx(auVar284,auVar184);
            auVar347 = vpunpckldq_avx(auVar283,auVar299);
            auVar66 = vpunpcklqdq_avx(auVar342,auVar347);
            *(undefined1 (*) [16])((long)&local_2690 + lVar9) = auVar66;
            auVar342 = vpunpckhqdq_avx(auVar342,auVar347);
            *(undefined1 (*) [16])(local_2680 + lVar9) = auVar342;
            auVar284 = vpunpckhdq_avx(auVar284,auVar184);
            auVar184 = vpunpckhdq_avx(auVar283,auVar299);
            auVar283 = vpunpcklqdq_avx(auVar284,auVar184);
            *(undefined1 (*) [16])(local_2670 + lVar9) = auVar283;
            auVar284 = vpunpckhqdq_avx(auVar284,auVar184);
            *(undefined1 (*) [16])(local_2660 + lVar9) = auVar284;
            uVar11 = uVar11 + 8;
            lVar9 = lVar9 + 0x80;
          } while (uVar11 < 0x18);
          puVar13 = dst + 0x18;
          lVar9 = 0x180;
          do {
            uVar5 = *(undefined8 *)((long)auStackY_27e0 + lVar9 + 8);
            *(undefined8 *)(puVar13 + -0x18) = *(undefined8 *)((long)auStackY_27e0 + lVar9);
            *(undefined8 *)(puVar13 + -0x14) = uVar5;
            uVar5 = *(undefined8 *)((long)auStackY_2760 + lVar9 + 8);
            *(undefined8 *)(puVar13 + -0x10) = *(undefined8 *)((long)auStackY_2760 + lVar9);
            *(undefined8 *)(puVar13 + -0xc) = uVar5;
            uVar5 = *(undefined8 *)((long)auStackY_26e0 + lVar9 + 8);
            *(undefined8 *)(puVar13 + -8) = *(undefined8 *)((long)auStackY_26e0 + lVar9);
            *(undefined8 *)(puVar13 + -4) = uVar5;
            uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
            *(undefined8 *)puVar13 = *(undefined8 *)(local_2660 + lVar9);
            *(undefined8 *)(puVar13 + 4) = uVar5;
            lVar9 = lVar9 + 0x10;
            puVar13 = puVar13 + stride;
          } while (lVar9 != 0x200);
          return;
        }
        if (bh != 4) {
          return;
        }
        iVar18 = 0x13 << (bVar10 & 0x1f);
        uVar4 = left[iVar18];
        auVar33._2_2_ = uVar4;
        auVar33._0_2_ = uVar4;
        auVar33._4_2_ = uVar4;
        auVar33._6_2_ = uVar4;
        auVar33._8_2_ = uVar4;
        auVar33._10_2_ = uVar4;
        auVar33._12_2_ = uVar4;
        auVar33._14_2_ = uVar4;
        if (bd < 0xc) {
          auVar63._0_2_ = (undefined2)iVar18;
          auVar63._2_2_ = auVar63._0_2_;
          auVar63._4_2_ = auVar63._0_2_;
          auVar63._6_2_ = auVar63._0_2_;
          auVar63._8_2_ = auVar63._0_2_;
          auVar63._10_2_ = auVar63._0_2_;
          auVar63._12_2_ = auVar63._0_2_;
          auVar63._14_2_ = auVar63._0_2_;
          lVar9 = 0;
          auVar92._8_2_ = 0x10;
          auVar92._0_8_ = 0x10001000100010;
          auVar92._10_2_ = 0x10;
          auVar92._12_2_ = 0x10;
          auVar92._14_2_ = 0x10;
          auVar198._8_2_ = 0x1f;
          auVar198._0_8_ = 0x1f001f001f001f;
          auVar198._10_2_ = 0x1f;
          auVar198._12_2_ = 0x1f;
          auVar198._14_2_ = 0x1f;
          auVar198._16_2_ = 0x1f;
          auVar198._18_2_ = 0x1f;
          auVar198._20_2_ = 0x1f;
          auVar198._22_2_ = 0x1f;
          auVar198._24_2_ = 0x1f;
          auVar198._26_2_ = 0x1f;
          auVar198._28_2_ = 0x1f;
          auVar198._30_2_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 0x10) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar33;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x100);
              }
              break;
            }
            auVar284 = *(undefined1 (*) [16])(left + (int)uVar15);
            auVar343._0_2_ = (undefined2)uVar15;
            if (upsample_left == 0) {
              auVar184 = *(undefined1 (*) [16])(left + (long)(int)uVar15 + 1);
              auVar344._2_2_ = auVar343._0_2_;
              auVar344._0_2_ = auVar343._0_2_;
              auVar344._4_2_ = auVar343._0_2_;
              auVar344._6_2_ = auVar343._0_2_;
              auVar344._8_2_ = auVar343._0_2_;
              auVar344._10_2_ = auVar343._0_2_;
              auVar344._12_2_ = auVar343._0_2_;
              auVar344._14_2_ = auVar343._0_2_;
              auVar283 = vpaddw_avx(auVar344,ZEXT816(0x7000600050004));
              auVar299 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar299 = vpinsrw_avx(auVar299,uVar15 + 2,2);
              auVar299 = vpinsrw_avx(auVar299,uVar15 + 3,3);
              auVar283 = vpunpcklqdq_avx(auVar299,auVar283);
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar388._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar388._8_2_ = uVar118;
              auVar388._10_2_ = uVar118;
              auVar388._12_2_ = uVar118;
              auVar388._14_2_ = uVar118;
            }
            else {
              auVar284 = vpshufb_avx(auVar284,_DAT_0051e800);
              auVar184 = vpsrldq_avx(auVar284,8);
              auVar343._2_2_ = auVar343._0_2_;
              auVar343._4_2_ = auVar343._0_2_;
              auVar343._6_2_ = auVar343._0_2_;
              auVar343._8_2_ = auVar343._0_2_;
              auVar343._10_2_ = auVar343._0_2_;
              auVar343._12_2_ = auVar343._0_2_;
              auVar343._14_2_ = auVar343._0_2_;
              auVar283 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 4,2);
              auVar299 = vpinsrw_avx(auVar283,uVar15 + 6,3);
              auVar283 = vpaddw_avx(auVar343,ZEXT816(0xe000c000a0008));
              auVar283 = vpunpcklqdq_avx(auVar299,auVar283);
              auVar391._0_2_ = (undefined2)uVar14;
              auVar391._2_2_ = auVar391._0_2_;
              auVar391._4_2_ = auVar391._0_2_;
              auVar391._6_2_ = auVar391._0_2_;
              auVar391._8_2_ = auVar391._0_2_;
              auVar391._10_2_ = auVar391._0_2_;
              auVar391._12_2_ = auVar391._0_2_;
              auVar391._14_2_ = auVar391._0_2_;
              auVar391._16_2_ = auVar391._0_2_;
              auVar391._18_2_ = auVar391._0_2_;
              auVar391._20_2_ = auVar391._0_2_;
              auVar391._22_2_ = auVar391._0_2_;
              auVar391._24_2_ = auVar391._0_2_;
              auVar391._26_2_ = auVar391._0_2_;
              auVar391._28_2_ = auVar391._0_2_;
              auVar391._30_2_ = auVar391._0_2_;
              auVar167 = vpsllw_avx2(auVar391,ZEXT416((uint)upsample_left));
              auVar167 = vpsrlw_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar198);
              auVar388 = auVar167._0_16_;
            }
            auVar283 = vpcmpgtw_avx(auVar63,auVar283);
            auVar184 = vpsubw_avx(auVar184,auVar284);
            auVar184 = vpmullw_avx(auVar184,auVar388);
            auVar284 = vpsllw_avx(auVar284,5);
            auVar284 = vpaddw_avx(auVar284,auVar92);
            auVar284 = vpaddw_avx(auVar184,auVar284);
            auVar284 = vpsrlw_avx(auVar284,5);
            auVar284 = vpblendvb_avx(auVar33,auVar284,auVar283);
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 0x10);
        }
        else {
          auVar68._4_4_ = iVar18;
          auVar68._0_4_ = iVar18;
          auVar68._8_4_ = iVar18;
          auVar68._12_4_ = iVar18;
          lVar9 = 0;
          auVar97._8_4_ = 0x10;
          auVar97._0_8_ = 0x1000000010;
          auVar97._12_4_ = 0x10;
          auVar133._8_4_ = 0x1f;
          auVar133._0_8_ = 0x1f0000001f;
          auVar133._12_4_ = 0x1f;
          auVar133._16_4_ = 0x1f;
          auVar133._20_4_ = 0x1f;
          auVar133._24_4_ = 0x1f;
          auVar133._28_4_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 0x10) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar33;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x100);
              }
              break;
            }
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
            auVar284 = auVar167._0_16_;
            if (upsample_left == 0) {
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
              auVar283 = auVar167._0_16_;
              auVar184 = vpinsrd_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 2,2);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 3,3);
              uVar15 = uVar14 >> 1;
              auVar288._0_8_ = CONCAT44(uVar15,uVar15) & 0x1f0000001f;
              auVar288._8_4_ = uVar15 & 0x1f;
              auVar288._12_4_ = uVar15 & 0x1f;
            }
            else {
              auVar167 = vpshufd_avx2(auVar167,0xd8);
              auVar167 = vpermq_avx2(auVar167,0xd8);
              auVar284 = auVar167._0_16_;
              auVar283 = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar167._16_16_;
              auVar184 = vpinsrd_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 4,2);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 6,3);
              auVar294._4_4_ = uVar14;
              auVar294._0_4_ = uVar14;
              auVar294._8_4_ = uVar14;
              auVar294._12_4_ = uVar14;
              auVar294._16_4_ = uVar14;
              auVar294._20_4_ = uVar14;
              auVar294._24_4_ = uVar14;
              auVar294._28_4_ = uVar14;
              auVar167 = vpslld_avx2(auVar294,ZEXT416((uint)upsample_left));
              auVar167 = vpsrld_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar133);
              auVar288 = auVar167._0_16_;
            }
            auVar299 = vpcmpgtd_avx(auVar68,auVar184);
            auVar184 = vpsubd_avx(auVar283,auVar284);
            auVar184 = vpmulld_avx(auVar184,auVar288);
            auVar284 = vpslld_avx(auVar284,5);
            auVar284 = vpaddd_avx(auVar284,auVar97);
            auVar284 = vpaddd_avx(auVar184,auVar284);
            auVar284 = vpsrld_avx(auVar284,5);
            auVar184 = vpackusdw_avx(auVar284,auVar284);
            auVar284 = vpackssdw_avx(auVar299,auVar299);
            auVar284 = vpblendvb_avx(auVar33,auVar184,auVar284);
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 0x10);
        }
        auVar284 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
        auVar184 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
        auVar283 = vpunpcklwd_avx(local_2020._0_16_,local_2020._16_16_);
        auVar299 = vpunpcklwd_avx(local_2000._0_16_,local_2000._16_16_);
        auVar342 = vpunpcklwd_avx(local_1fe0._0_16_,local_1fe0._16_16_);
        auVar347 = vpunpcklwd_avx(local_1fc0._0_16_,local_1fc0._16_16_);
        auVar66 = vpunpcklwd_avx(local_1fa0._0_16_,local_1fa0._16_16_);
        auVar95 = vpunpcklwd_avx(local_1f80._0_16_,local_1f80._16_16_);
        auVar301 = vpunpckldq_avx(auVar284,auVar184);
        auVar284 = vpunpckhdq_avx(auVar284,auVar184);
        auVar33 = vpunpckldq_avx(auVar283,auVar299);
        auVar184 = vpunpckhdq_avx(auVar283,auVar299);
        auVar68 = vpunpckldq_avx(auVar342,auVar347);
        auVar283 = vpunpckhdq_avx(auVar342,auVar347);
        auVar347 = vpunpckldq_avx(auVar66,auVar95);
        auVar299 = vpunpckhdq_avx(auVar66,auVar95);
        auVar66 = vpunpcklqdq_avx(auVar301,auVar33);
        auVar95 = vpunpcklqdq_avx(auVar68,auVar347);
        auVar342 = vpunpckhqdq_avx(auVar301,auVar33);
        auVar347 = vpunpckhqdq_avx(auVar68,auVar347);
        auVar301 = vpunpcklqdq_avx(auVar284,auVar184);
        auVar33 = vpunpcklqdq_avx(auVar283,auVar299);
        auVar284 = vpunpckhqdq_avx(auVar284,auVar184);
        auVar184 = vpunpckhqdq_avx(auVar283,auVar299);
        *(undefined1 (*) [16])dst = auVar66;
        *(undefined1 (*) [16])(dst + 8) = auVar95;
        *(undefined1 (*) [16])(dst + stride) = auVar342;
        *(undefined1 (*) [16])(dst + stride + 8) = auVar347;
        *(undefined1 (*) [16])(dst + stride * 2) = auVar301;
        *(undefined1 (*) [16])(dst + stride * 2 + 8) = auVar33;
        *(undefined1 (*) [16])(dst + stride * 3) = auVar284;
        *(undefined1 (*) [16])(dst + stride * 3 + 8) = auVar184;
        return;
      }
      switch(bh << 0x1e | bh - 4U >> 2) {
      case 0:
        iVar18 = 0xb << (bVar10 & 0x1f);
        uVar4 = left[iVar18];
        auVar30._2_2_ = uVar4;
        auVar30._0_2_ = uVar4;
        auVar30._4_2_ = uVar4;
        auVar30._6_2_ = uVar4;
        auVar30._8_2_ = uVar4;
        auVar30._10_2_ = uVar4;
        auVar30._12_2_ = uVar4;
        auVar30._14_2_ = uVar4;
        if (bd < 0xc) {
          auVar61._0_2_ = (undefined2)iVar18;
          auVar61._2_2_ = auVar61._0_2_;
          auVar61._4_2_ = auVar61._0_2_;
          auVar61._6_2_ = auVar61._0_2_;
          auVar61._8_2_ = auVar61._0_2_;
          auVar61._10_2_ = auVar61._0_2_;
          auVar61._12_2_ = auVar61._0_2_;
          auVar61._14_2_ = auVar61._0_2_;
          lVar9 = 0;
          auVar90._8_2_ = 0x10;
          auVar90._0_8_ = 0x10001000100010;
          auVar90._10_2_ = 0x10;
          auVar90._12_2_ = 0x10;
          auVar90._14_2_ = 0x10;
          auVar190._8_2_ = 0x1f;
          auVar190._0_8_ = 0x1f001f001f001f;
          auVar190._10_2_ = 0x1f;
          auVar190._12_2_ = 0x1f;
          auVar190._14_2_ = 0x1f;
          auVar190._16_2_ = 0x1f;
          auVar190._18_2_ = 0x1f;
          auVar190._20_2_ = 0x1f;
          auVar190._22_2_ = 0x1f;
          auVar190._24_2_ = 0x1f;
          auVar190._26_2_ = 0x1f;
          auVar190._28_2_ = 0x1f;
          auVar190._30_2_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 8) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar30;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x80);
              }
              break;
            }
            auVar284 = *(undefined1 (*) [16])(left + (int)uVar15);
            auVar385._0_2_ = (undefined2)uVar15;
            if (upsample_left == 0) {
              auVar184 = *(undefined1 (*) [16])(left + (long)(int)uVar15 + 1);
              auVar386._2_2_ = auVar385._0_2_;
              auVar386._0_2_ = auVar385._0_2_;
              auVar386._4_2_ = auVar385._0_2_;
              auVar386._6_2_ = auVar385._0_2_;
              auVar386._8_2_ = auVar385._0_2_;
              auVar386._10_2_ = auVar385._0_2_;
              auVar386._12_2_ = auVar385._0_2_;
              auVar386._14_2_ = auVar385._0_2_;
              auVar283 = vpaddw_avx(auVar386,ZEXT816(0x7000600050004));
              auVar299 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar299 = vpinsrw_avx(auVar299,uVar15 + 2,2);
              auVar299 = vpinsrw_avx(auVar299,uVar15 + 3,3);
              auVar283 = vpunpcklqdq_avx(auVar299,auVar283);
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar387._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar387._8_2_ = uVar118;
              auVar387._10_2_ = uVar118;
              auVar387._12_2_ = uVar118;
              auVar387._14_2_ = uVar118;
            }
            else {
              auVar284 = vpshufb_avx(auVar284,_DAT_0051e800);
              auVar184 = vpsrldq_avx(auVar284,8);
              auVar385._2_2_ = auVar385._0_2_;
              auVar385._4_2_ = auVar385._0_2_;
              auVar385._6_2_ = auVar385._0_2_;
              auVar385._8_2_ = auVar385._0_2_;
              auVar385._10_2_ = auVar385._0_2_;
              auVar385._12_2_ = auVar385._0_2_;
              auVar385._14_2_ = auVar385._0_2_;
              auVar283 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 4,2);
              auVar299 = vpinsrw_avx(auVar283,uVar15 + 6,3);
              auVar283 = vpaddw_avx(auVar385,ZEXT816(0xe000c000a0008));
              auVar283 = vpunpcklqdq_avx(auVar299,auVar283);
              auVar390._0_2_ = (undefined2)uVar14;
              auVar390._2_2_ = auVar390._0_2_;
              auVar390._4_2_ = auVar390._0_2_;
              auVar390._6_2_ = auVar390._0_2_;
              auVar390._8_2_ = auVar390._0_2_;
              auVar390._10_2_ = auVar390._0_2_;
              auVar390._12_2_ = auVar390._0_2_;
              auVar390._14_2_ = auVar390._0_2_;
              auVar390._16_2_ = auVar390._0_2_;
              auVar390._18_2_ = auVar390._0_2_;
              auVar390._20_2_ = auVar390._0_2_;
              auVar390._22_2_ = auVar390._0_2_;
              auVar390._24_2_ = auVar390._0_2_;
              auVar390._26_2_ = auVar390._0_2_;
              auVar390._28_2_ = auVar390._0_2_;
              auVar390._30_2_ = auVar390._0_2_;
              auVar167 = vpsllw_avx2(auVar390,ZEXT416((uint)upsample_left));
              auVar167 = vpsrlw_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar190);
              auVar387 = auVar167._0_16_;
            }
            auVar283 = vpcmpgtw_avx(auVar61,auVar283);
            auVar184 = vpsubw_avx(auVar184,auVar284);
            auVar184 = vpmullw_avx(auVar184,auVar387);
            auVar284 = vpsllw_avx(auVar284,5);
            auVar284 = vpaddw_avx(auVar284,auVar90);
            auVar284 = vpaddw_avx(auVar184,auVar284);
            auVar284 = vpsrlw_avx(auVar284,5);
            auVar284 = vpblendvb_avx(auVar30,auVar284,auVar283);
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 8);
        }
        else {
          auVar69._4_4_ = iVar18;
          auVar69._0_4_ = iVar18;
          auVar69._8_4_ = iVar18;
          auVar69._12_4_ = iVar18;
          lVar9 = 0;
          auVar98._8_4_ = 0x10;
          auVar98._0_8_ = 0x1000000010;
          auVar98._12_4_ = 0x10;
          auVar136._8_4_ = 0x1f;
          auVar136._0_8_ = 0x1f0000001f;
          auVar136._12_4_ = 0x1f;
          auVar136._16_4_ = 0x1f;
          auVar136._20_4_ = 0x1f;
          auVar136._24_4_ = 0x1f;
          auVar136._28_4_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 8) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar30;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x80);
              }
              break;
            }
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
            auVar284 = auVar167._0_16_;
            if (upsample_left == 0) {
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
              auVar283 = auVar167._0_16_;
              auVar184 = vpinsrd_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 2,2);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 3,3);
              uVar15 = uVar14 >> 1;
              auVar290._0_8_ = CONCAT44(uVar15,uVar15) & 0x1f0000001f;
              auVar290._8_4_ = uVar15 & 0x1f;
              auVar290._12_4_ = uVar15 & 0x1f;
            }
            else {
              auVar167 = vpshufd_avx2(auVar167,0xd8);
              auVar167 = vpermq_avx2(auVar167,0xd8);
              auVar284 = auVar167._0_16_;
              auVar283 = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar167._16_16_;
              auVar184 = vpinsrd_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 4,2);
              auVar184 = vpinsrd_avx(auVar184,uVar15 + 6,3);
              auVar296._4_4_ = uVar14;
              auVar296._0_4_ = uVar14;
              auVar296._8_4_ = uVar14;
              auVar296._12_4_ = uVar14;
              auVar296._16_4_ = uVar14;
              auVar296._20_4_ = uVar14;
              auVar296._24_4_ = uVar14;
              auVar296._28_4_ = uVar14;
              auVar167 = vpslld_avx2(auVar296,ZEXT416((uint)upsample_left));
              auVar167 = vpsrld_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar136);
              auVar290 = auVar167._0_16_;
            }
            auVar299 = vpcmpgtd_avx(auVar69,auVar184);
            auVar184 = vpsubd_avx(auVar283,auVar284);
            auVar184 = vpmulld_avx(auVar184,auVar290);
            auVar284 = vpslld_avx(auVar284,5);
            auVar284 = vpaddd_avx(auVar284,auVar98);
            auVar284 = vpaddd_avx(auVar184,auVar284);
            auVar284 = vpsrld_avx(auVar284,5);
            auVar184 = vpackusdw_avx(auVar284,auVar284);
            auVar284 = vpackssdw_avx(auVar299,auVar299);
            auVar284 = vpblendvb_avx(auVar30,auVar184,auVar284);
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 8);
        }
        auVar284 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
        auVar184 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
        auVar299 = vpunpcklwd_avx(local_2020._0_16_,local_2020._16_16_);
        auVar342 = vpunpcklwd_avx(local_2000._0_16_,local_2000._16_16_);
        auVar283 = vpunpckldq_avx(auVar284,auVar184);
        auVar347 = vpunpckldq_avx(auVar299,auVar342);
        auVar66 = vpunpcklqdq_avx(auVar283,auVar347);
        auVar283 = vpunpckhqdq_avx(auVar283,auVar347);
        auVar284 = vpunpckhdq_avx(auVar284,auVar184);
        auVar184 = vpunpckhdq_avx(auVar299,auVar342);
        auVar299 = vpunpcklqdq_avx(auVar284,auVar184);
        auVar284 = vpunpckhqdq_avx(auVar284,auVar184);
        *(undefined1 (*) [16])dst = auVar66;
        *(undefined1 (*) [16])(dst + stride) = auVar283;
        *(undefined1 (*) [16])(dst + stride * 2) = auVar299;
        *(undefined1 (*) [16])(dst + stride * 3) = auVar284;
        return;
      case 1:
        iVar18 = 0x17 << (bVar10 & 0x1f);
        uVar4 = left[iVar18];
        auVar41._2_2_ = uVar4;
        auVar41._0_2_ = uVar4;
        auVar41._4_2_ = uVar4;
        auVar41._6_2_ = uVar4;
        auVar41._8_2_ = uVar4;
        auVar41._10_2_ = uVar4;
        auVar41._12_2_ = uVar4;
        auVar41._14_2_ = uVar4;
        auVar56._16_2_ = uVar4;
        auVar56._0_16_ = auVar41;
        auVar56._18_2_ = uVar4;
        auVar56._20_2_ = uVar4;
        auVar56._22_2_ = uVar4;
        auVar56._24_2_ = uVar4;
        auVar56._26_2_ = uVar4;
        auVar56._28_2_ = uVar4;
        auVar56._30_2_ = uVar4;
        if (bd < 0xc) {
          auVar67._0_2_ = (undefined2)iVar18;
          auVar67._2_2_ = auVar67._0_2_;
          auVar67._4_2_ = auVar67._0_2_;
          auVar67._6_2_ = auVar67._0_2_;
          auVar67._8_2_ = auVar67._0_2_;
          auVar67._10_2_ = auVar67._0_2_;
          auVar67._12_2_ = auVar67._0_2_;
          auVar67._14_2_ = auVar67._0_2_;
          lVar9 = 0;
          auVar96._8_2_ = 0x10;
          auVar96._0_8_ = 0x10001000100010;
          auVar96._10_2_ = 0x10;
          auVar96._12_2_ = 0x10;
          auVar96._14_2_ = 0x10;
          auVar158._8_2_ = 0x1f;
          auVar158._0_8_ = 0x1f001f001f001f;
          auVar158._10_2_ = 0x1f;
          auVar158._12_2_ = 0x1f;
          auVar158._14_2_ = 0x1f;
          auVar158._16_2_ = 0x1f;
          auVar158._18_2_ = 0x1f;
          auVar158._20_2_ = 0x1f;
          auVar158._22_2_ = 0x1f;
          auVar158._24_2_ = 0x1f;
          auVar158._26_2_ = 0x1f;
          auVar158._28_2_ = 0x1f;
          auVar158._30_2_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 0x10) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar41;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x100);
              }
              break;
            }
            auVar284 = *(undefined1 (*) [16])(left + (int)uVar15);
            if (upsample_left == 0) {
              auVar184 = *(undefined1 (*) [16])(left + (long)(int)uVar15 + 1);
              auVar283 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 2,2);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 3,3);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 4,4);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 5,5);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 6,6);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 7,7);
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar302._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar302._8_2_ = uVar118;
              auVar302._10_2_ = uVar118;
              auVar302._12_2_ = uVar118;
              auVar302._14_2_ = uVar118;
            }
            else {
              auVar184 = vpblendw_avx(auVar284,(undefined1  [16])0x0,0xaa);
              auVar283 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),
                                      (undefined1  [16])0x0,0xaa);
              auVar342 = vpsrld_avx(auVar284,0x10);
              auVar284 = vpackusdw_avx(auVar184,auVar283);
              auVar299 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),0x10);
              auVar184 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 4,2);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 6,3);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 8,4);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 10,5);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 0xc,6);
              auVar283 = vpinsrw_avx(auVar184,uVar15 + 0xe,7);
              auVar332._0_2_ = (undefined2)uVar14;
              auVar332._2_2_ = auVar332._0_2_;
              auVar332._4_2_ = auVar332._0_2_;
              auVar332._6_2_ = auVar332._0_2_;
              auVar332._8_2_ = auVar332._0_2_;
              auVar332._10_2_ = auVar332._0_2_;
              auVar332._12_2_ = auVar332._0_2_;
              auVar332._14_2_ = auVar332._0_2_;
              auVar332._16_2_ = auVar332._0_2_;
              auVar332._18_2_ = auVar332._0_2_;
              auVar332._20_2_ = auVar332._0_2_;
              auVar332._22_2_ = auVar332._0_2_;
              auVar332._24_2_ = auVar332._0_2_;
              auVar332._26_2_ = auVar332._0_2_;
              auVar332._28_2_ = auVar332._0_2_;
              auVar332._30_2_ = auVar332._0_2_;
              auVar167 = vpsllw_avx2(auVar332,ZEXT416((uint)upsample_left));
              auVar184 = vpackusdw_avx(auVar342,auVar299);
              auVar167 = vpsrlw_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar158);
              auVar302 = auVar167._0_16_;
            }
            auVar299 = vpsllw_avx(auVar284,5);
            auVar299 = vpaddw_avx(auVar299,auVar96);
            auVar284 = vpsubw_avx(auVar184,auVar284);
            auVar284 = vpmullw_avx(auVar302,auVar284);
            auVar284 = vpaddw_avx(auVar299,auVar284);
            auVar184 = vpsrlw_avx(auVar284,5);
            auVar284 = vpcmpgtw_avx(auVar67,auVar283);
            auVar284 = vpblendvb_avx(auVar41,auVar184,auVar284);
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 0x10);
        }
        else {
          auVar88._4_4_ = iVar18;
          auVar88._0_4_ = iVar18;
          auVar88._8_4_ = iVar18;
          auVar88._12_4_ = iVar18;
          auVar88._16_4_ = iVar18;
          auVar88._20_4_ = iVar18;
          auVar88._24_4_ = iVar18;
          auVar88._28_4_ = iVar18;
          lVar9 = 0;
          auVar284 = vpmovsxbd_avx(ZEXT416(0x3020104));
          auVar117._8_4_ = 0x10;
          auVar117._0_8_ = 0x1000000010;
          auVar117._12_4_ = 0x10;
          auVar117._16_4_ = 0x10;
          auVar117._20_4_ = 0x10;
          auVar117._24_4_ = 0x10;
          auVar117._28_4_ = 0x10;
          auVar184 = vpmovsxbd_avx(ZEXT416(0x6040208));
          auVar182._8_4_ = 0x1f;
          auVar182._0_8_ = 0x1f0000001f;
          auVar182._12_4_ = 0x1f;
          auVar182._16_4_ = 0x1f;
          auVar182._20_4_ = 0x1f;
          auVar182._24_4_ = 0x1f;
          auVar182._28_4_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            iVar23 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= iVar23) {
              if (uVar11 < 0x10) {
                do {
                  *(undefined1 (*) [16])(local_2060 + lVar9) = auVar41;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x100);
              }
              break;
            }
            auVar282 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
            if (upsample_left == 0) {
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
              auVar304._4_4_ = iVar23;
              auVar304._0_4_ = iVar23;
              auVar304._8_4_ = iVar23;
              auVar304._12_4_ = iVar23;
              iVar1 = iVar23 + 5;
              iVar2 = iVar23 + 6;
              iVar23 = iVar23 + 7;
              auVar283 = vpaddd_avx(auVar304,auVar284);
              auVar170 = vpermq_avx2(ZEXT1632(auVar283),0xc4);
              auVar170 = vpblendd_avx2(auVar170,ZEXT1632(auVar304),1);
              auVar381._4_4_ = iVar1;
              auVar381._0_4_ = iVar1;
              auVar381._8_4_ = iVar1;
              auVar381._12_4_ = iVar1;
              auVar381._16_4_ = iVar1;
              auVar381._20_4_ = iVar1;
              auVar381._24_4_ = iVar1;
              auVar381._28_4_ = iVar1;
              auVar170 = vpblendd_avx2(auVar170,auVar381,0x20);
              auVar382._4_4_ = iVar2;
              auVar382._0_4_ = iVar2;
              auVar382._8_4_ = iVar2;
              auVar382._12_4_ = iVar2;
              auVar382._16_4_ = iVar2;
              auVar382._20_4_ = iVar2;
              auVar382._24_4_ = iVar2;
              auVar382._28_4_ = iVar2;
              auVar170 = vpblendd_avx2(auVar170,auVar382,0x40);
              auVar383._4_4_ = iVar23;
              auVar383._0_4_ = iVar23;
              auVar383._8_4_ = iVar23;
              auVar383._12_4_ = iVar23;
              auVar383._16_4_ = iVar23;
              auVar383._20_4_ = iVar23;
              auVar383._24_4_ = iVar23;
              auVar383._28_4_ = iVar23;
              auVar170 = vpblendd_avx2(auVar170,auVar383,0x80);
              uVar15 = uVar14 >> 1;
              uVar21 = uVar15 & 0x1f;
              auVar384._0_8_ = CONCAT44(uVar15,uVar15) & 0x1f0000001f;
              auVar384._8_4_ = uVar21;
              auVar384._12_4_ = uVar21;
              auVar384._16_4_ = uVar21;
              auVar384._20_4_ = uVar21;
              auVar384._24_4_ = uVar21;
              auVar384._28_4_ = uVar21;
            }
            else {
              auVar170 = vpshufd_avx2(auVar282,0xd8);
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
              auVar168 = vpermq_avx2(auVar170,0xd8);
              auVar167 = vpshufd_avx2(auVar167,0xd8);
              auVar130 = vpermq_avx2(auVar167,0xd8);
              auVar189._4_4_ = iVar23;
              auVar189._0_4_ = iVar23;
              auVar189._8_4_ = iVar23;
              auVar189._12_4_ = iVar23;
              iVar1 = iVar23 + 10;
              iVar2 = iVar23 + 0xc;
              iVar23 = iVar23 + 0xe;
              auVar283 = vpaddd_avx(auVar189,auVar184);
              auVar167 = vpermq_avx2(ZEXT1632(auVar283),0xc4);
              auVar167 = vpblendd_avx2(auVar167,ZEXT1632(auVar189),1);
              auVar339._4_4_ = iVar1;
              auVar339._0_4_ = iVar1;
              auVar339._8_4_ = iVar1;
              auVar339._12_4_ = iVar1;
              auVar339._16_4_ = iVar1;
              auVar339._20_4_ = iVar1;
              auVar339._24_4_ = iVar1;
              auVar339._28_4_ = iVar1;
              auVar167 = vpblendd_avx2(auVar167,auVar339,0x20);
              auVar340._4_4_ = iVar2;
              auVar340._0_4_ = iVar2;
              auVar340._8_4_ = iVar2;
              auVar340._12_4_ = iVar2;
              auVar340._16_4_ = iVar2;
              auVar340._20_4_ = iVar2;
              auVar340._24_4_ = iVar2;
              auVar340._28_4_ = iVar2;
              auVar167 = vpblendd_avx2(auVar167,auVar340,0x40);
              auVar341._4_4_ = iVar23;
              auVar341._0_4_ = iVar23;
              auVar341._8_4_ = iVar23;
              auVar341._12_4_ = iVar23;
              auVar341._16_4_ = iVar23;
              auVar341._20_4_ = iVar23;
              auVar341._24_4_ = iVar23;
              auVar341._28_4_ = iVar23;
              auVar170 = vpblendd_avx2(auVar167,auVar341,0x80);
              auVar281._4_4_ = uVar14;
              auVar281._0_4_ = uVar14;
              auVar281._8_4_ = uVar14;
              auVar281._12_4_ = uVar14;
              auVar281._16_4_ = uVar14;
              auVar281._20_4_ = uVar14;
              auVar281._24_4_ = uVar14;
              auVar281._28_4_ = uVar14;
              auVar167 = vpslld_avx2(auVar281,ZEXT416((uint)upsample_left));
              auVar282._0_16_ = ZEXT116(0) * auVar130._0_16_ + ZEXT116(1) * auVar168._0_16_;
              auVar282._16_16_ = ZEXT116(0) * auVar168._16_16_ + ZEXT116(1) * auVar130._0_16_;
              auVar167 = vpsrld_avx2(auVar167,1);
              auVar384 = vpand_avx2(auVar167,auVar182);
              auVar167 = vperm2i128_avx2(auVar168,auVar130,0x31);
            }
            auVar170 = vpcmpgtd_avx2(auVar88,auVar170);
            auVar167 = vpsubd_avx2(auVar167,auVar282);
            auVar168 = vpmulld_avx2(auVar167,auVar384);
            auVar167 = vpslld_avx2(auVar282,5);
            auVar167 = vpaddd_avx2(auVar167,auVar117);
            auVar167 = vpaddd_avx2(auVar168,auVar167);
            auVar167 = vpsrld_avx2(auVar167,5);
            auVar299 = vpackusdw_avx(auVar167._0_16_,auVar167._16_16_);
            auVar283 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
            auVar167 = vpblendvb_avx2(auVar56,ZEXT1632(auVar299),ZEXT1632(auVar283));
            *(undefined1 (*) [16])(local_2060 + lVar9) = auVar167._0_16_;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 0x10);
        }
        lVar9 = 0;
        pauVar17 = (undefined1 (*) [16])local_2060;
        pauVar27 = (undefined1 (*) [16])local_2660;
        bVar28 = true;
        do {
          bVar26 = bVar28;
          lVar9 = lVar9 * 0x10;
          auVar284 = *pauVar17;
          auVar184 = *(undefined1 (*) [16])(local_2060 + lVar9 + 0x10);
          auVar283 = *(undefined1 (*) [16])(local_2040 + lVar9);
          auVar299 = *(undefined1 (*) [16])(local_2040 + lVar9 + 0x10);
          auVar342 = *(undefined1 (*) [16])(local_2020 + lVar9);
          auVar347 = *(undefined1 (*) [16])(local_2020 + lVar9 + 0x10);
          auVar66 = *(undefined1 (*) [16])(local_2000 + lVar9);
          auVar95 = *(undefined1 (*) [16])(local_2000 + lVar9 + 0x10);
          auVar33 = vpunpcklwd_avx(auVar284,auVar184);
          auVar68 = vpunpcklwd_avx(auVar283,auVar299);
          auVar97 = vpunpcklwd_avx(auVar342,auVar347);
          auVar288 = vpunpcklwd_avx(auVar66,auVar95);
          auVar301 = vpunpckldq_avx(auVar33,auVar68);
          auVar63 = vpunpckldq_avx(auVar97,auVar288);
          auVar92 = vpunpcklqdq_avx(auVar301,auVar63);
          *pauVar27 = auVar92;
          auVar301 = vpunpckhqdq_avx(auVar301,auVar63);
          *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10) = auVar301;
          auVar301 = vpunpckhdq_avx(auVar33,auVar68);
          auVar33 = vpunpckhdq_avx(auVar97,auVar288);
          auVar68 = vpunpcklqdq_avx(auVar301,auVar33);
          *(undefined1 (*) [16])(local_2640 + lVar9) = auVar68;
          auVar301 = vpunpckhqdq_avx(auVar301,auVar33);
          *(undefined1 (*) [16])(local_2640 + lVar9 + 0x10) = auVar301;
          auVar284 = vpunpckhwd_avx(auVar284,auVar184);
          auVar184 = vpunpckhwd_avx(auVar283,auVar299);
          auVar283 = vpunpckhwd_avx(auVar342,auVar347);
          auVar299 = vpunpckhwd_avx(auVar66,auVar95);
          auVar342 = vpunpckldq_avx(auVar284,auVar184);
          auVar347 = vpunpckldq_avx(auVar283,auVar299);
          auVar66 = vpunpcklqdq_avx(auVar342,auVar347);
          *(undefined1 (*) [16])(local_2620 + lVar9) = auVar66;
          auVar342 = vpunpckhqdq_avx(auVar342,auVar347);
          *(undefined1 (*) [16])(local_2620 + lVar9 + 0x10) = auVar342;
          auVar284 = vpunpckhdq_avx(auVar284,auVar184);
          auVar184 = vpunpckhdq_avx(auVar283,auVar299);
          auVar283 = vpunpcklqdq_avx(auVar284,auVar184);
          *(undefined1 (*) [16])(local_2600 + lVar9) = auVar283;
          auVar284 = vpunpckhqdq_avx(auVar284,auVar184);
          *(undefined1 (*) [16])(local_2600 + lVar9 + 0x10) = auVar284;
          lVar9 = 8;
          pauVar17 = (undefined1 (*) [16])local_1fe0;
          pauVar27 = (undefined1 (*) [16])local_25e0;
          bVar28 = false;
        } while (bVar26);
        puVar13 = dst + 8;
        lVar9 = 0x80;
        do {
          uVar5 = *(undefined8 *)((long)auStackY_26e0 + lVar9 + 8);
          *(undefined8 *)(puVar13 + -8) = *(undefined8 *)((long)auStackY_26e0 + lVar9);
          *(undefined8 *)(puVar13 + -4) = uVar5;
          uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
          *(undefined8 *)puVar13 = *(undefined8 *)(local_2660 + lVar9);
          *(undefined8 *)(puVar13 + 4) = uVar5;
          lVar9 = lVar9 + 0x10;
          puVar13 = puVar13 + stride;
        } while (lVar9 != 0x100);
        return;
      default:
        return;
      case 3:
        uVar4 = left[0x2f];
        auVar39._2_2_ = uVar4;
        auVar39._0_2_ = uVar4;
        auVar39._4_2_ = uVar4;
        auVar39._6_2_ = uVar4;
        auVar39._8_2_ = uVar4;
        auVar39._10_2_ = uVar4;
        auVar39._12_2_ = uVar4;
        auVar39._14_2_ = uVar4;
        auVar54._16_2_ = uVar4;
        auVar54._0_16_ = auVar39;
        auVar54._18_2_ = uVar4;
        auVar54._20_2_ = uVar4;
        auVar54._22_2_ = uVar4;
        auVar54._24_2_ = uVar4;
        auVar54._26_2_ = uVar4;
        auVar54._28_2_ = uVar4;
        auVar54._30_2_ = uVar4;
        lVar9 = 0;
        if (bd < 0xc) {
          auVar79._8_2_ = 0x10;
          auVar79._0_8_ = 0x10001000100010;
          auVar79._10_2_ = 0x10;
          auVar79._12_2_ = 0x10;
          auVar79._14_2_ = 0x10;
          auVar79._16_2_ = 0x10;
          auVar79._18_2_ = 0x10;
          auVar79._20_2_ = 0x10;
          auVar79._22_2_ = 0x10;
          auVar79._24_2_ = 0x10;
          auVar79._26_2_ = 0x10;
          auVar79._28_2_ = 0x10;
          auVar79._30_2_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar108._8_2_ = 0x2e;
          auVar108._0_8_ = 0x2e002e002e002e;
          auVar108._10_2_ = 0x2e;
          auVar108._12_2_ = 0x2e;
          auVar108._14_2_ = 0x2e;
          auVar108._16_2_ = 0x2e;
          auVar108._18_2_ = 0x2e;
          auVar108._20_2_ = 0x2e;
          auVar108._22_2_ = 0x2e;
          auVar108._24_2_ = 0x2e;
          auVar108._26_2_ = 0x2e;
          auVar108._28_2_ = 0x2e;
          auVar108._30_2_ = 0x2e;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> 6;
            if (0x2e < (int)uVar15) {
              if (uVar11 < 0x20) {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar9) = auVar54;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x400);
              }
              break;
            }
            uVar6 = (ushort)(uVar14 >> 1);
            uVar118 = uVar6 & 0x1f;
            auVar128._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar128._8_2_ = uVar118;
            auVar128._10_2_ = uVar118;
            auVar128._12_2_ = uVar118;
            auVar128._14_2_ = uVar118;
            auVar128._16_2_ = uVar118;
            auVar128._18_2_ = uVar118;
            auVar128._20_2_ = uVar118;
            auVar128._22_2_ = uVar118;
            auVar128._24_2_ = uVar118;
            auVar128._26_2_ = uVar118;
            auVar128._28_2_ = uVar118;
            auVar128._30_2_ = uVar118;
            auVar167 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar15 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar15));
            auVar170 = vpmullw_avx2(auVar167,auVar128);
            auVar167 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar15),5);
            auVar167 = vpaddw_avx2(auVar167,auVar79);
            auVar167 = vpaddw_avx2(auVar170,auVar167);
            auVar170 = vpsrlw_avx2(auVar167,5);
            auVar142._0_2_ = (undefined2)uVar15;
            auVar142._2_2_ = auVar142._0_2_;
            auVar142._4_2_ = auVar142._0_2_;
            auVar142._6_2_ = auVar142._0_2_;
            auVar142._8_2_ = auVar142._0_2_;
            auVar142._10_2_ = auVar142._0_2_;
            auVar142._12_2_ = auVar142._0_2_;
            auVar142._14_2_ = auVar142._0_2_;
            auVar184 = vpaddw_avx(auVar142,auVar284);
            auVar283 = vpslldq_avx(auVar184,2);
            auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
            auVar184 = vpsrldq_avx(auVar184,0xe);
            auVar156._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar39;
            auVar156._16_16_ = ZEXT116(0) * auVar54._16_16_ + ZEXT116(1) * auVar184;
            auVar229._0_2_ = (undefined2)(uVar15 + 9);
            auVar229._2_2_ = auVar229._0_2_;
            auVar229._4_2_ = auVar229._0_2_;
            auVar229._6_2_ = auVar229._0_2_;
            auVar229._8_2_ = auVar229._0_2_;
            auVar229._10_2_ = auVar229._0_2_;
            auVar229._12_2_ = auVar229._0_2_;
            auVar229._14_2_ = auVar229._0_2_;
            auVar229._16_2_ = auVar229._0_2_;
            auVar229._18_2_ = auVar229._0_2_;
            auVar229._20_2_ = auVar229._0_2_;
            auVar229._22_2_ = auVar229._0_2_;
            auVar229._24_2_ = auVar229._0_2_;
            auVar229._26_2_ = auVar229._0_2_;
            auVar229._28_2_ = auVar229._0_2_;
            auVar229._30_2_ = auVar229._0_2_;
            auVar167 = vpblendw_avx2(auVar156,auVar229,2);
            auVar230._0_2_ = (undefined2)(uVar15 + 10);
            auVar230._2_2_ = auVar230._0_2_;
            auVar230._4_2_ = auVar230._0_2_;
            auVar230._6_2_ = auVar230._0_2_;
            auVar230._8_2_ = auVar230._0_2_;
            auVar230._10_2_ = auVar230._0_2_;
            auVar230._12_2_ = auVar230._0_2_;
            auVar230._14_2_ = auVar230._0_2_;
            auVar230._16_2_ = auVar230._0_2_;
            auVar230._18_2_ = auVar230._0_2_;
            auVar230._20_2_ = auVar230._0_2_;
            auVar230._22_2_ = auVar230._0_2_;
            auVar230._24_2_ = auVar230._0_2_;
            auVar230._26_2_ = auVar230._0_2_;
            auVar230._28_2_ = auVar230._0_2_;
            auVar230._30_2_ = auVar230._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar230,4);
            auVar231._0_2_ = (undefined2)(uVar15 + 0xb);
            auVar231._2_2_ = auVar231._0_2_;
            auVar231._4_2_ = auVar231._0_2_;
            auVar231._6_2_ = auVar231._0_2_;
            auVar231._8_2_ = auVar231._0_2_;
            auVar231._10_2_ = auVar231._0_2_;
            auVar231._12_2_ = auVar231._0_2_;
            auVar231._14_2_ = auVar231._0_2_;
            auVar231._16_2_ = auVar231._0_2_;
            auVar231._18_2_ = auVar231._0_2_;
            auVar231._20_2_ = auVar231._0_2_;
            auVar231._22_2_ = auVar231._0_2_;
            auVar231._24_2_ = auVar231._0_2_;
            auVar231._26_2_ = auVar231._0_2_;
            auVar231._28_2_ = auVar231._0_2_;
            auVar231._30_2_ = auVar231._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar231,8);
            auVar232._0_2_ = (undefined2)(uVar15 + 0xc);
            auVar232._2_2_ = auVar232._0_2_;
            auVar232._4_2_ = auVar232._0_2_;
            auVar232._6_2_ = auVar232._0_2_;
            auVar232._8_2_ = auVar232._0_2_;
            auVar232._10_2_ = auVar232._0_2_;
            auVar232._12_2_ = auVar232._0_2_;
            auVar232._14_2_ = auVar232._0_2_;
            auVar232._16_2_ = auVar232._0_2_;
            auVar232._18_2_ = auVar232._0_2_;
            auVar232._20_2_ = auVar232._0_2_;
            auVar232._22_2_ = auVar232._0_2_;
            auVar232._24_2_ = auVar232._0_2_;
            auVar232._26_2_ = auVar232._0_2_;
            auVar232._28_2_ = auVar232._0_2_;
            auVar232._30_2_ = auVar232._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar232,0x10);
            auVar233._0_2_ = (undefined2)(uVar15 + 0xd);
            auVar233._2_2_ = auVar233._0_2_;
            auVar233._4_2_ = auVar233._0_2_;
            auVar233._6_2_ = auVar233._0_2_;
            auVar233._8_2_ = auVar233._0_2_;
            auVar233._10_2_ = auVar233._0_2_;
            auVar233._12_2_ = auVar233._0_2_;
            auVar233._14_2_ = auVar233._0_2_;
            auVar233._16_2_ = auVar233._0_2_;
            auVar233._18_2_ = auVar233._0_2_;
            auVar233._20_2_ = auVar233._0_2_;
            auVar233._22_2_ = auVar233._0_2_;
            auVar233._24_2_ = auVar233._0_2_;
            auVar233._26_2_ = auVar233._0_2_;
            auVar233._28_2_ = auVar233._0_2_;
            auVar233._30_2_ = auVar233._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar233,0x20);
            auVar234._0_2_ = (undefined2)(uVar15 + 0xe);
            auVar234._2_2_ = auVar234._0_2_;
            auVar234._4_2_ = auVar234._0_2_;
            auVar234._6_2_ = auVar234._0_2_;
            auVar234._8_2_ = auVar234._0_2_;
            auVar234._10_2_ = auVar234._0_2_;
            auVar234._12_2_ = auVar234._0_2_;
            auVar234._14_2_ = auVar234._0_2_;
            auVar234._16_2_ = auVar234._0_2_;
            auVar234._18_2_ = auVar234._0_2_;
            auVar234._20_2_ = auVar234._0_2_;
            auVar234._22_2_ = auVar234._0_2_;
            auVar234._24_2_ = auVar234._0_2_;
            auVar234._26_2_ = auVar234._0_2_;
            auVar234._28_2_ = auVar234._0_2_;
            auVar234._30_2_ = auVar234._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar234,0x40);
            auVar235._0_2_ = (undefined2)(uVar15 + 0xf);
            auVar235._2_2_ = auVar235._0_2_;
            auVar235._4_2_ = auVar235._0_2_;
            auVar235._6_2_ = auVar235._0_2_;
            auVar235._8_2_ = auVar235._0_2_;
            auVar235._10_2_ = auVar235._0_2_;
            auVar235._12_2_ = auVar235._0_2_;
            auVar235._14_2_ = auVar235._0_2_;
            auVar235._16_2_ = auVar235._0_2_;
            auVar235._18_2_ = auVar235._0_2_;
            auVar235._20_2_ = auVar235._0_2_;
            auVar235._22_2_ = auVar235._0_2_;
            auVar235._24_2_ = auVar235._0_2_;
            auVar235._26_2_ = auVar235._0_2_;
            auVar235._28_2_ = auVar235._0_2_;
            auVar235._30_2_ = auVar235._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar235,0x80);
            auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
            auVar167 = vpcmpgtw_avx2(auVar167,auVar108);
            auVar167 = vpblendvb_avx2(auVar170,auVar54,auVar167);
            *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x20;
          } while (uVar11 != 0x20);
        }
        else {
          auVar85._8_4_ = 0x10;
          auVar85._0_8_ = 0x1000000010;
          auVar85._12_4_ = 0x10;
          auVar85._16_4_ = 0x10;
          auVar85._20_4_ = 0x10;
          auVar85._24_4_ = 0x10;
          auVar85._28_4_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar114._8_2_ = 0x2e;
          auVar114._0_8_ = 0x2e002e002e002e;
          auVar114._10_2_ = 0x2e;
          auVar114._12_2_ = 0x2e;
          auVar114._14_2_ = 0x2e;
          auVar114._16_2_ = 0x2e;
          auVar114._18_2_ = 0x2e;
          auVar114._20_2_ = 0x2e;
          auVar114._22_2_ = 0x2e;
          auVar114._24_2_ = 0x2e;
          auVar114._26_2_ = 0x2e;
          auVar114._28_2_ = 0x2e;
          auVar114._30_2_ = 0x2e;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> 6;
            if (0x2e < (int)uVar15) {
              if (uVar11 < 0x20) {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar9) = auVar54;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x400);
              }
              break;
            }
            uVar21 = uVar14 >> 1;
            uVar19 = uVar21 & 0x1f;
            auVar134._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f0000001f;
            auVar134._8_4_ = uVar19;
            auVar134._12_4_ = uVar19;
            auVar134._16_4_ = uVar19;
            auVar134._20_4_ = uVar19;
            auVar134._24_4_ = uVar19;
            auVar134._28_4_ = uVar19;
            auVar184 = auVar39;
            if (uVar15 - 0x30 < 0xfffffff7) {
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
              auVar170 = vpsubd_avx2(auVar170,auVar167);
              auVar167 = vpslld_avx2(auVar167,5);
              auVar170 = vpmulld_avx2(auVar170,auVar134);
              auVar167 = vpaddd_avx2(auVar167,auVar85);
              auVar167 = vpaddd_avx2(auVar170,auVar167);
              auVar167 = vpsrld_avx2(auVar167,5);
              auVar179._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar167._16_16_;
              auVar179._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
              auVar167 = vpackusdw_avx2(auVar167,auVar179);
              auVar184 = auVar167._0_16_;
            }
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
            auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
            auVar170 = vpsubd_avx2(auVar170,auVar167);
            auVar167 = vpslld_avx2(auVar167,5);
            auVar170 = vpmulld_avx2(auVar170,auVar134);
            auVar167 = vpaddd_avx2(auVar167,auVar85);
            auVar167 = vpaddd_avx2(auVar170,auVar167);
            auVar167 = vpsrld_avx2(auVar167,5);
            auVar167 = vpackusdw_avx2(auVar167,ZEXT1632(auVar167._16_16_));
            auVar135._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar167._0_16_;
            auVar135._16_16_ = ZEXT116(0) * auVar167._16_16_ + ZEXT116(1) * auVar184;
            auVar145._0_2_ = (undefined2)uVar15;
            auVar145._2_2_ = auVar145._0_2_;
            auVar145._4_2_ = auVar145._0_2_;
            auVar145._6_2_ = auVar145._0_2_;
            auVar145._8_2_ = auVar145._0_2_;
            auVar145._10_2_ = auVar145._0_2_;
            auVar145._12_2_ = auVar145._0_2_;
            auVar145._14_2_ = auVar145._0_2_;
            auVar184 = vpaddw_avx(auVar145,auVar284);
            auVar283 = vpslldq_avx(auVar184,2);
            auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
            auVar184 = vpsrldq_avx(auVar184,0xe);
            auVar165._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar39;
            auVar165._16_16_ = ZEXT116(0) * auVar54._16_16_ + ZEXT116(1) * auVar184;
            auVar265._0_2_ = (undefined2)(uVar15 + 9);
            auVar265._2_2_ = auVar265._0_2_;
            auVar265._4_2_ = auVar265._0_2_;
            auVar265._6_2_ = auVar265._0_2_;
            auVar265._8_2_ = auVar265._0_2_;
            auVar265._10_2_ = auVar265._0_2_;
            auVar265._12_2_ = auVar265._0_2_;
            auVar265._14_2_ = auVar265._0_2_;
            auVar265._16_2_ = auVar265._0_2_;
            auVar265._18_2_ = auVar265._0_2_;
            auVar265._20_2_ = auVar265._0_2_;
            auVar265._22_2_ = auVar265._0_2_;
            auVar265._24_2_ = auVar265._0_2_;
            auVar265._26_2_ = auVar265._0_2_;
            auVar265._28_2_ = auVar265._0_2_;
            auVar265._30_2_ = auVar265._0_2_;
            auVar167 = vpblendw_avx2(auVar165,auVar265,2);
            auVar266._0_2_ = (undefined2)(uVar15 + 10);
            auVar266._2_2_ = auVar266._0_2_;
            auVar266._4_2_ = auVar266._0_2_;
            auVar266._6_2_ = auVar266._0_2_;
            auVar266._8_2_ = auVar266._0_2_;
            auVar266._10_2_ = auVar266._0_2_;
            auVar266._12_2_ = auVar266._0_2_;
            auVar266._14_2_ = auVar266._0_2_;
            auVar266._16_2_ = auVar266._0_2_;
            auVar266._18_2_ = auVar266._0_2_;
            auVar266._20_2_ = auVar266._0_2_;
            auVar266._22_2_ = auVar266._0_2_;
            auVar266._24_2_ = auVar266._0_2_;
            auVar266._26_2_ = auVar266._0_2_;
            auVar266._28_2_ = auVar266._0_2_;
            auVar266._30_2_ = auVar266._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar266,4);
            auVar267._0_2_ = (undefined2)(uVar15 + 0xb);
            auVar267._2_2_ = auVar267._0_2_;
            auVar267._4_2_ = auVar267._0_2_;
            auVar267._6_2_ = auVar267._0_2_;
            auVar267._8_2_ = auVar267._0_2_;
            auVar267._10_2_ = auVar267._0_2_;
            auVar267._12_2_ = auVar267._0_2_;
            auVar267._14_2_ = auVar267._0_2_;
            auVar267._16_2_ = auVar267._0_2_;
            auVar267._18_2_ = auVar267._0_2_;
            auVar267._20_2_ = auVar267._0_2_;
            auVar267._22_2_ = auVar267._0_2_;
            auVar267._24_2_ = auVar267._0_2_;
            auVar267._26_2_ = auVar267._0_2_;
            auVar267._28_2_ = auVar267._0_2_;
            auVar267._30_2_ = auVar267._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar267,8);
            auVar268._0_2_ = (undefined2)(uVar15 + 0xc);
            auVar268._2_2_ = auVar268._0_2_;
            auVar268._4_2_ = auVar268._0_2_;
            auVar268._6_2_ = auVar268._0_2_;
            auVar268._8_2_ = auVar268._0_2_;
            auVar268._10_2_ = auVar268._0_2_;
            auVar268._12_2_ = auVar268._0_2_;
            auVar268._14_2_ = auVar268._0_2_;
            auVar268._16_2_ = auVar268._0_2_;
            auVar268._18_2_ = auVar268._0_2_;
            auVar268._20_2_ = auVar268._0_2_;
            auVar268._22_2_ = auVar268._0_2_;
            auVar268._24_2_ = auVar268._0_2_;
            auVar268._26_2_ = auVar268._0_2_;
            auVar268._28_2_ = auVar268._0_2_;
            auVar268._30_2_ = auVar268._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar268,0x10);
            auVar269._0_2_ = (undefined2)(uVar15 + 0xd);
            auVar269._2_2_ = auVar269._0_2_;
            auVar269._4_2_ = auVar269._0_2_;
            auVar269._6_2_ = auVar269._0_2_;
            auVar269._8_2_ = auVar269._0_2_;
            auVar269._10_2_ = auVar269._0_2_;
            auVar269._12_2_ = auVar269._0_2_;
            auVar269._14_2_ = auVar269._0_2_;
            auVar269._16_2_ = auVar269._0_2_;
            auVar269._18_2_ = auVar269._0_2_;
            auVar269._20_2_ = auVar269._0_2_;
            auVar269._22_2_ = auVar269._0_2_;
            auVar269._24_2_ = auVar269._0_2_;
            auVar269._26_2_ = auVar269._0_2_;
            auVar269._28_2_ = auVar269._0_2_;
            auVar269._30_2_ = auVar269._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar269,0x20);
            auVar270._0_2_ = (undefined2)(uVar15 + 0xe);
            auVar270._2_2_ = auVar270._0_2_;
            auVar270._4_2_ = auVar270._0_2_;
            auVar270._6_2_ = auVar270._0_2_;
            auVar270._8_2_ = auVar270._0_2_;
            auVar270._10_2_ = auVar270._0_2_;
            auVar270._12_2_ = auVar270._0_2_;
            auVar270._14_2_ = auVar270._0_2_;
            auVar270._16_2_ = auVar270._0_2_;
            auVar270._18_2_ = auVar270._0_2_;
            auVar270._20_2_ = auVar270._0_2_;
            auVar270._22_2_ = auVar270._0_2_;
            auVar270._24_2_ = auVar270._0_2_;
            auVar270._26_2_ = auVar270._0_2_;
            auVar270._28_2_ = auVar270._0_2_;
            auVar270._30_2_ = auVar270._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar270,0x40);
            auVar271._0_2_ = (undefined2)(uVar15 + 0xf);
            auVar271._2_2_ = auVar271._0_2_;
            auVar271._4_2_ = auVar271._0_2_;
            auVar271._6_2_ = auVar271._0_2_;
            auVar271._8_2_ = auVar271._0_2_;
            auVar271._10_2_ = auVar271._0_2_;
            auVar271._12_2_ = auVar271._0_2_;
            auVar271._14_2_ = auVar271._0_2_;
            auVar271._16_2_ = auVar271._0_2_;
            auVar271._18_2_ = auVar271._0_2_;
            auVar271._20_2_ = auVar271._0_2_;
            auVar271._22_2_ = auVar271._0_2_;
            auVar271._24_2_ = auVar271._0_2_;
            auVar271._26_2_ = auVar271._0_2_;
            auVar271._28_2_ = auVar271._0_2_;
            auVar271._30_2_ = auVar271._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar271,0x80);
            auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
            auVar167 = vpcmpgtw_avx2(auVar167,auVar114);
            auVar167 = vpblendvb_avx2(auVar135,auVar54,auVar167);
            *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x20;
          } while (uVar11 != 0x20);
        }
        lVar9 = 0;
        pauVar20 = &local_2060;
        bVar28 = true;
        do {
          bVar26 = bVar28;
          auVar167 = vpunpcklwd_avx2(*pauVar20,pauVar20[1]);
          auVar170 = vpunpcklwd_avx2(pauVar20[2],pauVar20[3]);
          auVar168 = vpunpcklwd_avx2(pauVar20[4],pauVar20[5]);
          auVar130 = vpunpcklwd_avx2(pauVar20[6],pauVar20[7]);
          auVar161 = vpunpckldq_avx2(auVar167,auVar170);
          auVar175 = vpunpckldq_avx2(auVar168,auVar130);
          _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
          local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
          auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
          auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
          local_2620 = vpunpcklqdq_avx2(auVar167,auVar170);
          local_2600 = vpunpckhqdq_avx2(auVar167,auVar170);
          auVar167 = vpunpckhwd_avx2(*pauVar20,pauVar20[1]);
          auVar170 = vpunpckhwd_avx2(pauVar20[2],pauVar20[3]);
          auVar168 = vpunpckhwd_avx2(pauVar20[4],pauVar20[5]);
          auVar130 = vpunpckhwd_avx2(pauVar20[6],pauVar20[7]);
          auVar161 = vpunpckldq_avx2(auVar167,auVar170);
          auVar175 = vpunpckldq_avx2(auVar168,auVar130);
          local_25e0 = vpunpcklqdq_avx2(auVar161,auVar175);
          local_25c0 = vpunpckhqdq_avx2(auVar161,auVar175);
          auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
          auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
          local_25a0 = vpunpcklqdq_avx2(auVar167,auVar170);
          local_2580 = vpunpckhqdq_avx2(auVar167,auVar170);
          auVar167 = vpunpcklwd_avx2(pauVar20[8],pauVar20[9]);
          auVar170 = vpunpcklwd_avx2(pauVar20[10],pauVar20[0xb]);
          auVar168 = vpunpcklwd_avx2(pauVar20[0xc],pauVar20[0xd]);
          auVar130 = vpunpcklwd_avx2(pauVar20[0xe],pauVar20[0xf]);
          auVar161 = vpunpckldq_avx2(auVar167,auVar170);
          auVar175 = vpunpckldq_avx2(auVar168,auVar130);
          local_2560 = vpunpcklqdq_avx2(auVar161,auVar175);
          local_2540 = vpunpckhqdq_avx2(auVar161,auVar175);
          auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
          auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
          local_2520 = vpunpcklqdq_avx2(auVar167,auVar170);
          local_2500 = vpunpckhqdq_avx2(auVar167,auVar170);
          auVar167 = vpunpckhwd_avx2(pauVar20[8],pauVar20[9]);
          auVar170 = vpunpckhwd_avx2(pauVar20[10],pauVar20[0xb]);
          auVar168 = vpunpckhwd_avx2(pauVar20[0xc],pauVar20[0xd]);
          auVar130 = vpunpckhwd_avx2(pauVar20[0xe],pauVar20[0xf]);
          auVar161 = vpunpckldq_avx2(auVar167,auVar170);
          auVar175 = vpunpckldq_avx2(auVar168,auVar130);
          local_24e0 = vpunpcklqdq_avx2(auVar161,auVar175);
          local_24c0 = vpunpckhqdq_avx2(auVar161,auVar175);
          auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
          auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
          local_24a0 = vpunpcklqdq_avx2(auVar167,auVar170);
          local_2480 = vpunpckhqdq_avx2(auVar167,auVar170);
          lVar12 = 0x100;
          do {
            auVar167 = *(undefined1 (*) [32])(local_2660 + lVar12);
            auVar170 = vperm2i128_avx2(auVar167,*(undefined1 (*) [32])((long)auStackY_2760 + lVar12)
                                       ,2);
            auVar59._0_16_ =
                 ZEXT116(1) * *(undefined1 (*) [16])(auStackY_2750 + lVar12) +
                 ZEXT116(0) * auVar167._0_16_;
            auVar59._16_16_ =
                 ZEXT116(1) * auVar167._16_16_ +
                 ZEXT116(0) * *(undefined1 (*) [16])(auStackY_2750 + lVar12);
            *(undefined1 (*) [32])(auStack_2360 + lVar12) = auVar170;
            *(undefined1 (*) [32])((long)auStack_2260 + lVar12) = auVar59;
            lVar12 = lVar12 + 0x20;
          } while (lVar12 != 0x200);
          puVar13 = dst + lVar9;
          lVar9 = 0;
          do {
            uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
            uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
            uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
            *(undefined8 *)puVar13 = *(undefined8 *)((long)auStack_2260 + lVar9);
            *(undefined8 *)(puVar13 + 4) = uVar5;
            *(undefined8 *)(puVar13 + 8) = uVar7;
            *(undefined8 *)(puVar13 + 0xc) = uVar8;
            lVar9 = lVar9 + 0x20;
            puVar13 = puVar13 + stride;
          } while (lVar9 != 0x200);
          lVar9 = 0x10;
          pauVar20 = &local_1e60;
          bVar28 = false;
        } while (bVar26);
        return;
      case 7:
        uStackY_26a8 = 0x361f00;
        highbd_dr_prediction_z1_32xN_avx2
                  (0x40,(uint16_t *)local_2060,0x20,left,dy,bd,in_stack_ffffffffffffd960);
        pitchSrc = 0x20;
        iVar18 = 0x40;
        iVar23 = 0x20;
        pitchDst = local_2690;
        puVar13 = local_2688;
      }
      goto LAB_00363a94;
    }
    if (bw * 2 == bh) {
      switch(bw << 0x1e | bw - 4U >> 2) {
      case 0:
        iVar18 = 0xb << (bVar10 & 0x1f);
        uVar4 = left[iVar18];
        auVar29._2_2_ = uVar4;
        auVar29._0_2_ = uVar4;
        auVar29._4_2_ = uVar4;
        auVar29._6_2_ = uVar4;
        auVar29._8_2_ = uVar4;
        auVar29._10_2_ = uVar4;
        auVar29._12_2_ = uVar4;
        auVar29._14_2_ = uVar4;
        auVar42._16_2_ = uVar4;
        auVar42._0_16_ = auVar29;
        auVar42._18_2_ = uVar4;
        auVar42._20_2_ = uVar4;
        auVar42._22_2_ = uVar4;
        auVar42._24_2_ = uVar4;
        auVar42._26_2_ = uVar4;
        auVar42._28_2_ = uVar4;
        auVar42._30_2_ = uVar4;
        if (bd < 0xc) {
          auVar60._0_2_ = (undefined2)iVar18;
          auVar60._2_2_ = auVar60._0_2_;
          auVar60._4_2_ = auVar60._0_2_;
          auVar60._6_2_ = auVar60._0_2_;
          auVar60._8_2_ = auVar60._0_2_;
          auVar60._10_2_ = auVar60._0_2_;
          auVar60._12_2_ = auVar60._0_2_;
          auVar60._14_2_ = auVar60._0_2_;
          lVar9 = 0;
          auVar89._8_2_ = 0x10;
          auVar89._0_8_ = 0x10001000100010;
          auVar89._10_2_ = 0x10;
          auVar89._12_2_ = 0x10;
          auVar89._14_2_ = 0x10;
          auVar147._8_2_ = 0x1f;
          auVar147._0_8_ = 0x1f001f001f001f;
          auVar147._10_2_ = 0x1f;
          auVar147._12_2_ = 0x1f;
          auVar147._14_2_ = 0x1f;
          auVar147._16_2_ = 0x1f;
          auVar147._18_2_ = 0x1f;
          auVar147._20_2_ = 0x1f;
          auVar147._22_2_ = 0x1f;
          auVar147._24_2_ = 0x1f;
          auVar147._26_2_ = 0x1f;
          auVar147._28_2_ = 0x1f;
          auVar147._30_2_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= (int)uVar15) {
              if (uVar11 < 4) {
                do {
                  *(undefined1 (*) [16])(local_2660 + lVar9) = auVar29;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x40);
              }
              break;
            }
            auVar284 = *(undefined1 (*) [16])(left + (int)uVar15);
            if (upsample_left == 0) {
              auVar184 = *(undefined1 (*) [16])(left + (long)(int)uVar15 + 1);
              auVar283 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 1,1);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 2,2);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 3,3);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 4,4);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 5,5);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 6,6);
              auVar283 = vpinsrw_avx(auVar283,uVar15 + 7,7);
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar297._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar297._8_2_ = uVar118;
              auVar297._10_2_ = uVar118;
              auVar297._12_2_ = uVar118;
              auVar297._14_2_ = uVar118;
            }
            else {
              auVar184 = vpblendw_avx(auVar284,(undefined1  [16])0x0,0xaa);
              auVar283 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),
                                      (undefined1  [16])0x0,0xaa);
              auVar342 = vpsrld_avx(auVar284,0x10);
              auVar284 = vpackusdw_avx(auVar184,auVar283);
              auVar299 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8),0x10);
              auVar184 = vpinsrw_avx(ZEXT416(uVar15),uVar15 + 2,1);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 4,2);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 6,3);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 8,4);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 10,5);
              auVar184 = vpinsrw_avx(auVar184,uVar15 + 0xc,6);
              auVar283 = vpinsrw_avx(auVar184,uVar15 + 0xe,7);
              auVar305._0_2_ = (undefined2)uVar14;
              auVar305._2_2_ = auVar305._0_2_;
              auVar305._4_2_ = auVar305._0_2_;
              auVar305._6_2_ = auVar305._0_2_;
              auVar305._8_2_ = auVar305._0_2_;
              auVar305._10_2_ = auVar305._0_2_;
              auVar305._12_2_ = auVar305._0_2_;
              auVar305._14_2_ = auVar305._0_2_;
              auVar305._16_2_ = auVar305._0_2_;
              auVar305._18_2_ = auVar305._0_2_;
              auVar305._20_2_ = auVar305._0_2_;
              auVar305._22_2_ = auVar305._0_2_;
              auVar305._24_2_ = auVar305._0_2_;
              auVar305._26_2_ = auVar305._0_2_;
              auVar305._28_2_ = auVar305._0_2_;
              auVar305._30_2_ = auVar305._0_2_;
              auVar167 = vpsllw_avx2(auVar305,ZEXT416((uint)upsample_left));
              auVar184 = vpackusdw_avx(auVar342,auVar299);
              auVar167 = vpsrlw_avx2(auVar167,1);
              auVar167 = vpand_avx2(auVar167,auVar147);
              auVar297 = auVar167._0_16_;
            }
            auVar299 = vpsllw_avx(auVar284,5);
            auVar299 = vpaddw_avx(auVar299,auVar89);
            auVar284 = vpsubw_avx(auVar184,auVar284);
            auVar284 = vpmullw_avx(auVar297,auVar284);
            auVar284 = vpaddw_avx(auVar299,auVar284);
            auVar184 = vpsrlw_avx(auVar284,5);
            auVar284 = vpcmpgtw_avx(auVar60,auVar283);
            auVar284 = vpblendvb_avx(auVar29,auVar184,auVar284);
            *(undefined1 (*) [16])(local_2660 + lVar9) = auVar284;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 4);
        }
        else {
          auVar86._4_4_ = iVar18;
          auVar86._0_4_ = iVar18;
          auVar86._8_4_ = iVar18;
          auVar86._12_4_ = iVar18;
          auVar86._16_4_ = iVar18;
          auVar86._20_4_ = iVar18;
          auVar86._24_4_ = iVar18;
          auVar86._28_4_ = iVar18;
          lVar9 = 0;
          auVar284 = vpmovsxbd_avx(ZEXT416(0x3020104));
          auVar115._8_4_ = 0x10;
          auVar115._0_8_ = 0x1000000010;
          auVar115._12_4_ = 0x10;
          auVar115._16_4_ = 0x10;
          auVar115._20_4_ = 0x10;
          auVar115._24_4_ = 0x10;
          auVar115._28_4_ = 0x10;
          auVar184 = vpmovsxbd_avx(ZEXT416(0x6040208));
          auVar180._8_4_ = 0x1f;
          auVar180._0_8_ = 0x1f0000001f;
          auVar180._12_4_ = 0x1f;
          auVar180._16_4_ = 0x1f;
          auVar180._20_4_ = 0x1f;
          auVar180._24_4_ = 0x1f;
          auVar180._28_4_ = 0x1f;
          uVar11 = 0;
          uVar14 = dy;
          do {
            iVar23 = (int)uVar14 >> (6 - bVar10 & 0x1f);
            if (iVar18 <= iVar23) {
              if (uVar11 < 4) {
                do {
                  *(undefined1 (*) [16])(local_2660 + lVar9) = auVar29;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x40);
              }
              break;
            }
            auVar273 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
            if (upsample_left == 0) {
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
              auVar303._4_4_ = iVar23;
              auVar303._0_4_ = iVar23;
              auVar303._8_4_ = iVar23;
              auVar303._12_4_ = iVar23;
              iVar1 = iVar23 + 5;
              iVar2 = iVar23 + 6;
              iVar23 = iVar23 + 7;
              auVar283 = vpaddd_avx(auVar303,auVar284);
              auVar170 = vpermq_avx2(ZEXT1632(auVar283),0xc4);
              auVar170 = vpblendd_avx2(auVar170,ZEXT1632(auVar303),1);
              auVar377._4_4_ = iVar1;
              auVar377._0_4_ = iVar1;
              auVar377._8_4_ = iVar1;
              auVar377._12_4_ = iVar1;
              auVar377._16_4_ = iVar1;
              auVar377._20_4_ = iVar1;
              auVar377._24_4_ = iVar1;
              auVar377._28_4_ = iVar1;
              auVar170 = vpblendd_avx2(auVar170,auVar377,0x20);
              auVar378._4_4_ = iVar2;
              auVar378._0_4_ = iVar2;
              auVar378._8_4_ = iVar2;
              auVar378._12_4_ = iVar2;
              auVar378._16_4_ = iVar2;
              auVar378._20_4_ = iVar2;
              auVar378._24_4_ = iVar2;
              auVar378._28_4_ = iVar2;
              auVar170 = vpblendd_avx2(auVar170,auVar378,0x40);
              auVar379._4_4_ = iVar23;
              auVar379._0_4_ = iVar23;
              auVar379._8_4_ = iVar23;
              auVar379._12_4_ = iVar23;
              auVar379._16_4_ = iVar23;
              auVar379._20_4_ = iVar23;
              auVar379._24_4_ = iVar23;
              auVar379._28_4_ = iVar23;
              auVar170 = vpblendd_avx2(auVar170,auVar379,0x80);
              uVar15 = uVar14 >> 1;
              uVar21 = uVar15 & 0x1f;
              auVar380._0_8_ = CONCAT44(uVar15,uVar15) & 0x1f0000001f;
              auVar380._8_4_ = uVar21;
              auVar380._12_4_ = uVar21;
              auVar380._16_4_ = uVar21;
              auVar380._20_4_ = uVar21;
              auVar380._24_4_ = uVar21;
              auVar380._28_4_ = uVar21;
            }
            else {
              auVar167 = vpshufd_avx2(auVar273,0xd8);
              auVar168 = vpermq_avx2(auVar167,0xd8);
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
              auVar167 = vpshufd_avx2(auVar167,0xd8);
              auVar130 = vpermq_avx2(auVar167,0xd8);
              auVar188._4_4_ = iVar23;
              auVar188._0_4_ = iVar23;
              auVar188._8_4_ = iVar23;
              auVar188._12_4_ = iVar23;
              iVar1 = iVar23 + 10;
              iVar2 = iVar23 + 0xc;
              iVar23 = iVar23 + 0xe;
              auVar283 = vpaddd_avx(auVar188,auVar184);
              auVar167 = vpermq_avx2(ZEXT1632(auVar283),0xc4);
              auVar167 = vpblendd_avx2(auVar167,ZEXT1632(auVar188),1);
              auVar336._4_4_ = iVar1;
              auVar336._0_4_ = iVar1;
              auVar336._8_4_ = iVar1;
              auVar336._12_4_ = iVar1;
              auVar336._16_4_ = iVar1;
              auVar336._20_4_ = iVar1;
              auVar336._24_4_ = iVar1;
              auVar336._28_4_ = iVar1;
              auVar167 = vpblendd_avx2(auVar167,auVar336,0x20);
              auVar337._4_4_ = iVar2;
              auVar337._0_4_ = iVar2;
              auVar337._8_4_ = iVar2;
              auVar337._12_4_ = iVar2;
              auVar337._16_4_ = iVar2;
              auVar337._20_4_ = iVar2;
              auVar337._24_4_ = iVar2;
              auVar337._28_4_ = iVar2;
              auVar167 = vpblendd_avx2(auVar167,auVar337,0x40);
              auVar338._4_4_ = iVar23;
              auVar338._0_4_ = iVar23;
              auVar338._8_4_ = iVar23;
              auVar338._12_4_ = iVar23;
              auVar338._16_4_ = iVar23;
              auVar338._20_4_ = iVar23;
              auVar338._24_4_ = iVar23;
              auVar338._28_4_ = iVar23;
              auVar170 = vpblendd_avx2(auVar167,auVar338,0x80);
              auVar272._4_4_ = uVar14;
              auVar272._0_4_ = uVar14;
              auVar272._8_4_ = uVar14;
              auVar272._12_4_ = uVar14;
              auVar272._16_4_ = uVar14;
              auVar272._20_4_ = uVar14;
              auVar272._24_4_ = uVar14;
              auVar272._28_4_ = uVar14;
              auVar167 = vpslld_avx2(auVar272,ZEXT416((uint)upsample_left));
              auVar273._0_16_ = ZEXT116(0) * auVar130._0_16_ + ZEXT116(1) * auVar168._0_16_;
              auVar273._16_16_ = ZEXT116(0) * auVar168._16_16_ + ZEXT116(1) * auVar130._0_16_;
              auVar167 = vpsrld_avx2(auVar167,1);
              auVar380 = vpand_avx2(auVar167,auVar180);
              auVar167 = vperm2i128_avx2(auVar168,auVar130,0x31);
            }
            auVar170 = vpcmpgtd_avx2(auVar86,auVar170);
            auVar167 = vpsubd_avx2(auVar167,auVar273);
            auVar168 = vpmulld_avx2(auVar167,auVar380);
            auVar167 = vpslld_avx2(auVar273,5);
            auVar167 = vpaddd_avx2(auVar167,auVar115);
            auVar167 = vpaddd_avx2(auVar168,auVar167);
            auVar167 = vpsrld_avx2(auVar167,5);
            auVar299 = vpackusdw_avx(auVar167._0_16_,auVar167._16_16_);
            auVar283 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
            auVar167 = vpblendvb_avx2(auVar42,ZEXT1632(auVar299),ZEXT1632(auVar283));
            *(undefined1 (*) [16])(local_2660 + lVar9) = auVar167._0_16_;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar11 != 4);
        }
        auVar284 = vpunpcklwd_avx(local_2660._0_16_,stack0xffffffffffffd9b0);
        auVar184 = vpunpcklwd_avx(local_2640._0_16_,local_2640._16_16_);
        auVar283 = vpunpckldq_avx(auVar284,auVar184);
        auVar284 = vpunpckhdq_avx(auVar284,auVar184);
        local_2060._8_8_ = 0;
        local_2060._0_8_ = auVar283._0_8_;
        local_2060._16_16_ = vpsrldq_avx(auVar283,8);
        local_2040._8_8_ = 0;
        local_2040._0_8_ = auVar284._0_8_;
        local_2040._16_16_ = vpsrldq_avx(auVar284,8);
        auVar284 = vpunpckhwd_avx(local_2660._0_16_,stack0xffffffffffffd9b0);
        auVar184 = vpunpckhwd_avx(local_2640._0_16_,local_2640._16_16_);
        auVar283 = vpunpckldq_avx(auVar284,auVar184);
        auVar284 = vpunpckhdq_avx(auVar284,auVar184);
        local_2020._8_8_ = 0;
        local_2020._0_8_ = auVar283._0_8_;
        local_2020._16_16_ = vpsrldq_avx(auVar283,8);
        local_2000._8_8_ = 0;
        local_2000._0_8_ = auVar284._0_8_;
        local_2000._16_16_ = vpsrldq_avx(auVar284,8);
        lVar9 = 0;
        do {
          *(undefined8 *)dst = *(undefined8 *)(local_2060 + lVar9);
          lVar9 = lVar9 + 0x10;
          dst = dst + stride;
        } while (lVar9 != 0x80);
        return;
      case 1:
        uVar4 = left[0x17];
        auVar40._2_2_ = uVar4;
        auVar40._0_2_ = uVar4;
        auVar40._4_2_ = uVar4;
        auVar40._6_2_ = uVar4;
        auVar40._8_2_ = uVar4;
        auVar40._10_2_ = uVar4;
        auVar40._12_2_ = uVar4;
        auVar40._14_2_ = uVar4;
        auVar55._16_2_ = uVar4;
        auVar55._0_16_ = auVar40;
        auVar55._18_2_ = uVar4;
        auVar55._20_2_ = uVar4;
        auVar55._22_2_ = uVar4;
        auVar55._24_2_ = uVar4;
        auVar55._26_2_ = uVar4;
        auVar55._28_2_ = uVar4;
        auVar55._30_2_ = uVar4;
        lVar9 = 0;
        if (bd < 0xc) {
          auVar80._8_2_ = 0x10;
          auVar80._0_8_ = 0x10001000100010;
          auVar80._10_2_ = 0x10;
          auVar80._12_2_ = 0x10;
          auVar80._14_2_ = 0x10;
          auVar80._16_2_ = 0x10;
          auVar80._18_2_ = 0x10;
          auVar80._20_2_ = 0x10;
          auVar80._22_2_ = 0x10;
          auVar80._24_2_ = 0x10;
          auVar80._26_2_ = 0x10;
          auVar80._28_2_ = 0x10;
          auVar80._30_2_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar109._8_2_ = 0x16;
          auVar109._0_8_ = 0x16001600160016;
          auVar109._10_2_ = 0x16;
          auVar109._12_2_ = 0x16;
          auVar109._14_2_ = 0x16;
          auVar109._16_2_ = 0x16;
          auVar109._18_2_ = 0x16;
          auVar109._20_2_ = 0x16;
          auVar109._22_2_ = 0x16;
          auVar109._24_2_ = 0x16;
          auVar109._26_2_ = 0x16;
          auVar109._28_2_ = 0x16;
          auVar109._30_2_ = 0x16;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> 6;
            if (0x16 < (int)uVar15) {
              if (uVar11 < 8) {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar9) = auVar55;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x100);
              }
              break;
            }
            uVar6 = (ushort)(uVar14 >> 1);
            uVar118 = uVar6 & 0x1f;
            auVar129._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar129._8_2_ = uVar118;
            auVar129._10_2_ = uVar118;
            auVar129._12_2_ = uVar118;
            auVar129._14_2_ = uVar118;
            auVar129._16_2_ = uVar118;
            auVar129._18_2_ = uVar118;
            auVar129._20_2_ = uVar118;
            auVar129._22_2_ = uVar118;
            auVar129._24_2_ = uVar118;
            auVar129._26_2_ = uVar118;
            auVar129._28_2_ = uVar118;
            auVar129._30_2_ = uVar118;
            auVar167 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar15 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar15));
            auVar170 = vpmullw_avx2(auVar167,auVar129);
            auVar167 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar15),5);
            auVar167 = vpaddw_avx2(auVar167,auVar80);
            auVar167 = vpaddw_avx2(auVar170,auVar167);
            auVar170 = vpsrlw_avx2(auVar167,5);
            auVar143._0_2_ = (undefined2)uVar15;
            auVar143._2_2_ = auVar143._0_2_;
            auVar143._4_2_ = auVar143._0_2_;
            auVar143._6_2_ = auVar143._0_2_;
            auVar143._8_2_ = auVar143._0_2_;
            auVar143._10_2_ = auVar143._0_2_;
            auVar143._12_2_ = auVar143._0_2_;
            auVar143._14_2_ = auVar143._0_2_;
            auVar184 = vpaddw_avx(auVar143,auVar284);
            auVar283 = vpslldq_avx(auVar184,2);
            auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
            auVar184 = vpsrldq_avx(auVar184,0xe);
            auVar157._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar40;
            auVar157._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar184;
            auVar236._0_2_ = (undefined2)(uVar15 + 9);
            auVar236._2_2_ = auVar236._0_2_;
            auVar236._4_2_ = auVar236._0_2_;
            auVar236._6_2_ = auVar236._0_2_;
            auVar236._8_2_ = auVar236._0_2_;
            auVar236._10_2_ = auVar236._0_2_;
            auVar236._12_2_ = auVar236._0_2_;
            auVar236._14_2_ = auVar236._0_2_;
            auVar236._16_2_ = auVar236._0_2_;
            auVar236._18_2_ = auVar236._0_2_;
            auVar236._20_2_ = auVar236._0_2_;
            auVar236._22_2_ = auVar236._0_2_;
            auVar236._24_2_ = auVar236._0_2_;
            auVar236._26_2_ = auVar236._0_2_;
            auVar236._28_2_ = auVar236._0_2_;
            auVar236._30_2_ = auVar236._0_2_;
            auVar167 = vpblendw_avx2(auVar157,auVar236,2);
            auVar237._0_2_ = (undefined2)(uVar15 + 10);
            auVar237._2_2_ = auVar237._0_2_;
            auVar237._4_2_ = auVar237._0_2_;
            auVar237._6_2_ = auVar237._0_2_;
            auVar237._8_2_ = auVar237._0_2_;
            auVar237._10_2_ = auVar237._0_2_;
            auVar237._12_2_ = auVar237._0_2_;
            auVar237._14_2_ = auVar237._0_2_;
            auVar237._16_2_ = auVar237._0_2_;
            auVar237._18_2_ = auVar237._0_2_;
            auVar237._20_2_ = auVar237._0_2_;
            auVar237._22_2_ = auVar237._0_2_;
            auVar237._24_2_ = auVar237._0_2_;
            auVar237._26_2_ = auVar237._0_2_;
            auVar237._28_2_ = auVar237._0_2_;
            auVar237._30_2_ = auVar237._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar237,4);
            auVar238._0_2_ = (undefined2)(uVar15 + 0xb);
            auVar238._2_2_ = auVar238._0_2_;
            auVar238._4_2_ = auVar238._0_2_;
            auVar238._6_2_ = auVar238._0_2_;
            auVar238._8_2_ = auVar238._0_2_;
            auVar238._10_2_ = auVar238._0_2_;
            auVar238._12_2_ = auVar238._0_2_;
            auVar238._14_2_ = auVar238._0_2_;
            auVar238._16_2_ = auVar238._0_2_;
            auVar238._18_2_ = auVar238._0_2_;
            auVar238._20_2_ = auVar238._0_2_;
            auVar238._22_2_ = auVar238._0_2_;
            auVar238._24_2_ = auVar238._0_2_;
            auVar238._26_2_ = auVar238._0_2_;
            auVar238._28_2_ = auVar238._0_2_;
            auVar238._30_2_ = auVar238._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar238,8);
            auVar239._0_2_ = (undefined2)(uVar15 + 0xc);
            auVar239._2_2_ = auVar239._0_2_;
            auVar239._4_2_ = auVar239._0_2_;
            auVar239._6_2_ = auVar239._0_2_;
            auVar239._8_2_ = auVar239._0_2_;
            auVar239._10_2_ = auVar239._0_2_;
            auVar239._12_2_ = auVar239._0_2_;
            auVar239._14_2_ = auVar239._0_2_;
            auVar239._16_2_ = auVar239._0_2_;
            auVar239._18_2_ = auVar239._0_2_;
            auVar239._20_2_ = auVar239._0_2_;
            auVar239._22_2_ = auVar239._0_2_;
            auVar239._24_2_ = auVar239._0_2_;
            auVar239._26_2_ = auVar239._0_2_;
            auVar239._28_2_ = auVar239._0_2_;
            auVar239._30_2_ = auVar239._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar239,0x10);
            auVar240._0_2_ = (undefined2)(uVar15 + 0xd);
            auVar240._2_2_ = auVar240._0_2_;
            auVar240._4_2_ = auVar240._0_2_;
            auVar240._6_2_ = auVar240._0_2_;
            auVar240._8_2_ = auVar240._0_2_;
            auVar240._10_2_ = auVar240._0_2_;
            auVar240._12_2_ = auVar240._0_2_;
            auVar240._14_2_ = auVar240._0_2_;
            auVar240._16_2_ = auVar240._0_2_;
            auVar240._18_2_ = auVar240._0_2_;
            auVar240._20_2_ = auVar240._0_2_;
            auVar240._22_2_ = auVar240._0_2_;
            auVar240._24_2_ = auVar240._0_2_;
            auVar240._26_2_ = auVar240._0_2_;
            auVar240._28_2_ = auVar240._0_2_;
            auVar240._30_2_ = auVar240._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar240,0x20);
            auVar241._0_2_ = (undefined2)(uVar15 + 0xe);
            auVar241._2_2_ = auVar241._0_2_;
            auVar241._4_2_ = auVar241._0_2_;
            auVar241._6_2_ = auVar241._0_2_;
            auVar241._8_2_ = auVar241._0_2_;
            auVar241._10_2_ = auVar241._0_2_;
            auVar241._12_2_ = auVar241._0_2_;
            auVar241._14_2_ = auVar241._0_2_;
            auVar241._16_2_ = auVar241._0_2_;
            auVar241._18_2_ = auVar241._0_2_;
            auVar241._20_2_ = auVar241._0_2_;
            auVar241._22_2_ = auVar241._0_2_;
            auVar241._24_2_ = auVar241._0_2_;
            auVar241._26_2_ = auVar241._0_2_;
            auVar241._28_2_ = auVar241._0_2_;
            auVar241._30_2_ = auVar241._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar241,0x40);
            auVar242._0_2_ = (undefined2)(uVar15 + 0xf);
            auVar242._2_2_ = auVar242._0_2_;
            auVar242._4_2_ = auVar242._0_2_;
            auVar242._6_2_ = auVar242._0_2_;
            auVar242._8_2_ = auVar242._0_2_;
            auVar242._10_2_ = auVar242._0_2_;
            auVar242._12_2_ = auVar242._0_2_;
            auVar242._14_2_ = auVar242._0_2_;
            auVar242._16_2_ = auVar242._0_2_;
            auVar242._18_2_ = auVar242._0_2_;
            auVar242._20_2_ = auVar242._0_2_;
            auVar242._22_2_ = auVar242._0_2_;
            auVar242._24_2_ = auVar242._0_2_;
            auVar242._26_2_ = auVar242._0_2_;
            auVar242._28_2_ = auVar242._0_2_;
            auVar242._30_2_ = auVar242._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar242,0x80);
            auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
            auVar167 = vpcmpgtw_avx2(auVar167,auVar109);
            auVar167 = vpblendvb_avx2(auVar170,auVar55,auVar167);
            *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x20;
          } while (uVar11 != 8);
        }
        else {
          auVar87._8_4_ = 0x10;
          auVar87._0_8_ = 0x1000000010;
          auVar87._12_4_ = 0x10;
          auVar87._16_4_ = 0x10;
          auVar87._20_4_ = 0x10;
          auVar87._24_4_ = 0x10;
          auVar87._28_4_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar116._8_2_ = 0x16;
          auVar116._0_8_ = 0x16001600160016;
          auVar116._10_2_ = 0x16;
          auVar116._12_2_ = 0x16;
          auVar116._14_2_ = 0x16;
          auVar116._16_2_ = 0x16;
          auVar116._18_2_ = 0x16;
          auVar116._20_2_ = 0x16;
          auVar116._22_2_ = 0x16;
          auVar116._24_2_ = 0x16;
          auVar116._26_2_ = 0x16;
          auVar116._28_2_ = 0x16;
          auVar116._30_2_ = 0x16;
          uVar11 = 0;
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> 6;
            if (0x16 < (int)uVar15) {
              if (uVar11 < 8) {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar9) = auVar55;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x100);
              }
              break;
            }
            uVar21 = uVar14 >> 1;
            uVar19 = uVar21 & 0x1f;
            auVar137._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f0000001f;
            auVar137._8_4_ = uVar19;
            auVar137._12_4_ = uVar19;
            auVar137._16_4_ = uVar19;
            auVar137._20_4_ = uVar19;
            auVar137._24_4_ = uVar19;
            auVar137._28_4_ = uVar19;
            auVar184 = auVar40;
            if (uVar15 - 0x18 < 0xfffffff7) {
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
              auVar170 = vpsubd_avx2(auVar170,auVar167);
              auVar167 = vpslld_avx2(auVar167,5);
              auVar170 = vpmulld_avx2(auVar170,auVar137);
              auVar167 = vpaddd_avx2(auVar167,auVar87);
              auVar167 = vpaddd_avx2(auVar170,auVar167);
              auVar167 = vpsrld_avx2(auVar167,5);
              auVar181._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar167._16_16_;
              auVar181._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40;
              auVar167 = vpackusdw_avx2(auVar167,auVar181);
              auVar184 = auVar167._0_16_;
            }
            auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
            auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
            auVar170 = vpsubd_avx2(auVar170,auVar167);
            auVar167 = vpslld_avx2(auVar167,5);
            auVar170 = vpmulld_avx2(auVar170,auVar137);
            auVar167 = vpaddd_avx2(auVar167,auVar87);
            auVar167 = vpaddd_avx2(auVar170,auVar167);
            auVar167 = vpsrld_avx2(auVar167,5);
            auVar167 = vpackusdw_avx2(auVar167,ZEXT1632(auVar167._16_16_));
            auVar138._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar167._0_16_;
            auVar138._16_16_ = ZEXT116(0) * auVar167._16_16_ + ZEXT116(1) * auVar184;
            auVar146._0_2_ = (undefined2)uVar15;
            auVar146._2_2_ = auVar146._0_2_;
            auVar146._4_2_ = auVar146._0_2_;
            auVar146._6_2_ = auVar146._0_2_;
            auVar146._8_2_ = auVar146._0_2_;
            auVar146._10_2_ = auVar146._0_2_;
            auVar146._12_2_ = auVar146._0_2_;
            auVar146._14_2_ = auVar146._0_2_;
            auVar184 = vpaddw_avx(auVar146,auVar284);
            auVar283 = vpslldq_avx(auVar184,2);
            auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
            auVar184 = vpsrldq_avx(auVar184,0xe);
            auVar166._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar40;
            auVar166._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar184;
            auVar274._0_2_ = (undefined2)(uVar15 + 9);
            auVar274._2_2_ = auVar274._0_2_;
            auVar274._4_2_ = auVar274._0_2_;
            auVar274._6_2_ = auVar274._0_2_;
            auVar274._8_2_ = auVar274._0_2_;
            auVar274._10_2_ = auVar274._0_2_;
            auVar274._12_2_ = auVar274._0_2_;
            auVar274._14_2_ = auVar274._0_2_;
            auVar274._16_2_ = auVar274._0_2_;
            auVar274._18_2_ = auVar274._0_2_;
            auVar274._20_2_ = auVar274._0_2_;
            auVar274._22_2_ = auVar274._0_2_;
            auVar274._24_2_ = auVar274._0_2_;
            auVar274._26_2_ = auVar274._0_2_;
            auVar274._28_2_ = auVar274._0_2_;
            auVar274._30_2_ = auVar274._0_2_;
            auVar167 = vpblendw_avx2(auVar166,auVar274,2);
            auVar275._0_2_ = (undefined2)(uVar15 + 10);
            auVar275._2_2_ = auVar275._0_2_;
            auVar275._4_2_ = auVar275._0_2_;
            auVar275._6_2_ = auVar275._0_2_;
            auVar275._8_2_ = auVar275._0_2_;
            auVar275._10_2_ = auVar275._0_2_;
            auVar275._12_2_ = auVar275._0_2_;
            auVar275._14_2_ = auVar275._0_2_;
            auVar275._16_2_ = auVar275._0_2_;
            auVar275._18_2_ = auVar275._0_2_;
            auVar275._20_2_ = auVar275._0_2_;
            auVar275._22_2_ = auVar275._0_2_;
            auVar275._24_2_ = auVar275._0_2_;
            auVar275._26_2_ = auVar275._0_2_;
            auVar275._28_2_ = auVar275._0_2_;
            auVar275._30_2_ = auVar275._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar275,4);
            auVar276._0_2_ = (undefined2)(uVar15 + 0xb);
            auVar276._2_2_ = auVar276._0_2_;
            auVar276._4_2_ = auVar276._0_2_;
            auVar276._6_2_ = auVar276._0_2_;
            auVar276._8_2_ = auVar276._0_2_;
            auVar276._10_2_ = auVar276._0_2_;
            auVar276._12_2_ = auVar276._0_2_;
            auVar276._14_2_ = auVar276._0_2_;
            auVar276._16_2_ = auVar276._0_2_;
            auVar276._18_2_ = auVar276._0_2_;
            auVar276._20_2_ = auVar276._0_2_;
            auVar276._22_2_ = auVar276._0_2_;
            auVar276._24_2_ = auVar276._0_2_;
            auVar276._26_2_ = auVar276._0_2_;
            auVar276._28_2_ = auVar276._0_2_;
            auVar276._30_2_ = auVar276._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar276,8);
            auVar277._0_2_ = (undefined2)(uVar15 + 0xc);
            auVar277._2_2_ = auVar277._0_2_;
            auVar277._4_2_ = auVar277._0_2_;
            auVar277._6_2_ = auVar277._0_2_;
            auVar277._8_2_ = auVar277._0_2_;
            auVar277._10_2_ = auVar277._0_2_;
            auVar277._12_2_ = auVar277._0_2_;
            auVar277._14_2_ = auVar277._0_2_;
            auVar277._16_2_ = auVar277._0_2_;
            auVar277._18_2_ = auVar277._0_2_;
            auVar277._20_2_ = auVar277._0_2_;
            auVar277._22_2_ = auVar277._0_2_;
            auVar277._24_2_ = auVar277._0_2_;
            auVar277._26_2_ = auVar277._0_2_;
            auVar277._28_2_ = auVar277._0_2_;
            auVar277._30_2_ = auVar277._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar277,0x10);
            auVar278._0_2_ = (undefined2)(uVar15 + 0xd);
            auVar278._2_2_ = auVar278._0_2_;
            auVar278._4_2_ = auVar278._0_2_;
            auVar278._6_2_ = auVar278._0_2_;
            auVar278._8_2_ = auVar278._0_2_;
            auVar278._10_2_ = auVar278._0_2_;
            auVar278._12_2_ = auVar278._0_2_;
            auVar278._14_2_ = auVar278._0_2_;
            auVar278._16_2_ = auVar278._0_2_;
            auVar278._18_2_ = auVar278._0_2_;
            auVar278._20_2_ = auVar278._0_2_;
            auVar278._22_2_ = auVar278._0_2_;
            auVar278._24_2_ = auVar278._0_2_;
            auVar278._26_2_ = auVar278._0_2_;
            auVar278._28_2_ = auVar278._0_2_;
            auVar278._30_2_ = auVar278._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar278,0x20);
            auVar279._0_2_ = (undefined2)(uVar15 + 0xe);
            auVar279._2_2_ = auVar279._0_2_;
            auVar279._4_2_ = auVar279._0_2_;
            auVar279._6_2_ = auVar279._0_2_;
            auVar279._8_2_ = auVar279._0_2_;
            auVar279._10_2_ = auVar279._0_2_;
            auVar279._12_2_ = auVar279._0_2_;
            auVar279._14_2_ = auVar279._0_2_;
            auVar279._16_2_ = auVar279._0_2_;
            auVar279._18_2_ = auVar279._0_2_;
            auVar279._20_2_ = auVar279._0_2_;
            auVar279._22_2_ = auVar279._0_2_;
            auVar279._24_2_ = auVar279._0_2_;
            auVar279._26_2_ = auVar279._0_2_;
            auVar279._28_2_ = auVar279._0_2_;
            auVar279._30_2_ = auVar279._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar279,0x40);
            auVar280._0_2_ = (undefined2)(uVar15 + 0xf);
            auVar280._2_2_ = auVar280._0_2_;
            auVar280._4_2_ = auVar280._0_2_;
            auVar280._6_2_ = auVar280._0_2_;
            auVar280._8_2_ = auVar280._0_2_;
            auVar280._10_2_ = auVar280._0_2_;
            auVar280._12_2_ = auVar280._0_2_;
            auVar280._14_2_ = auVar280._0_2_;
            auVar280._16_2_ = auVar280._0_2_;
            auVar280._18_2_ = auVar280._0_2_;
            auVar280._20_2_ = auVar280._0_2_;
            auVar280._22_2_ = auVar280._0_2_;
            auVar280._24_2_ = auVar280._0_2_;
            auVar280._26_2_ = auVar280._0_2_;
            auVar280._28_2_ = auVar280._0_2_;
            auVar280._30_2_ = auVar280._0_2_;
            auVar167 = vpblendw_avx2(auVar167,auVar280,0x80);
            auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
            auVar167 = vpcmpgtw_avx2(auVar167,auVar116);
            auVar167 = vpblendvb_avx2(auVar138,auVar55,auVar167);
            *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
            uVar14 = uVar14 + dy;
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + 0x20;
          } while (uVar11 != 8);
        }
        auVar167 = vpunpcklwd_avx2(local_2060,local_2040);
        auVar170 = vpunpcklwd_avx2(local_2020,local_2000);
        auVar168 = vpunpcklwd_avx2(local_1fe0,local_1fc0);
        auVar130 = vpunpcklwd_avx2(local_1fa0,local_1f80);
        auVar161 = vpunpckldq_avx2(auVar167,auVar170);
        auVar175 = vpunpckldq_avx2(auVar168,auVar130);
        _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
        local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
        auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
        auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
        local_2620 = vpunpcklqdq_avx2(auVar167,auVar170);
        local_2600 = vpunpckhqdq_avx2(auVar167,auVar170);
        auVar167 = vpunpckhwd_avx2(local_2060,local_2040);
        auVar170 = vpunpckhwd_avx2(local_2020,local_2000);
        auVar168 = vpunpckhwd_avx2(local_1fe0,local_1fc0);
        auVar130 = vpunpckhwd_avx2(local_1fa0,local_1f80);
        auVar161 = vpunpckldq_avx2(auVar167,auVar170);
        auVar175 = vpunpckldq_avx2(auVar168,auVar130);
        local_25e0 = vpunpcklqdq_avx2(auVar161,auVar175);
        local_25c0 = vpunpckhqdq_avx2(auVar161,auVar175);
        auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
        auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
        local_25a0 = vpunpcklqdq_avx2(auVar167,auVar170);
        local_2580 = vpunpckhqdq_avx2(auVar167,auVar170);
        lVar9 = 0;
        puVar13 = dst;
        do {
          uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
          *(undefined8 *)puVar13 = *(undefined8 *)(local_2660 + lVar9);
          *(undefined8 *)(puVar13 + 4) = uVar5;
          lVar9 = lVar9 + 0x20;
          puVar13 = puVar13 + stride;
        } while (lVar9 != 0x100);
        puVar13 = dst + stride * 8;
        lVar9 = 0;
        do {
          uVar5 = *(undefined8 *)(local_2640 + lVar9 + -8);
          *(undefined8 *)(puVar13 + 8) = *(undefined8 *)(local_2660 + lVar9 + 0x10);
          *(undefined8 *)(puVar13 + 0xc) = uVar5;
          lVar9 = lVar9 + 0x20;
          puVar13 = puVar13 + stride;
        } while (lVar9 != 0x100);
        return;
      default:
        return;
      case 3:
        uVar4 = left[0x2f];
        auVar38._2_2_ = uVar4;
        auVar38._0_2_ = uVar4;
        auVar38._4_2_ = uVar4;
        auVar38._6_2_ = uVar4;
        auVar38._8_2_ = uVar4;
        auVar38._10_2_ = uVar4;
        auVar38._12_2_ = uVar4;
        auVar38._14_2_ = uVar4;
        auVar53._16_2_ = uVar4;
        auVar53._0_16_ = auVar38;
        auVar53._18_2_ = uVar4;
        auVar53._20_2_ = uVar4;
        auVar53._22_2_ = uVar4;
        auVar53._24_2_ = uVar4;
        auVar53._26_2_ = uVar4;
        auVar53._28_2_ = uVar4;
        auVar53._30_2_ = uVar4;
        lVar9 = -0x200;
        if (bd < 0xc) {
          lVar12 = 0;
          auVar78._8_2_ = 0x10;
          auVar78._0_8_ = 0x10001000100010;
          auVar78._10_2_ = 0x10;
          auVar78._12_2_ = 0x10;
          auVar78._14_2_ = 0x10;
          auVar78._16_2_ = 0x10;
          auVar78._18_2_ = 0x10;
          auVar78._20_2_ = 0x10;
          auVar78._22_2_ = 0x10;
          auVar78._24_2_ = 0x10;
          auVar78._26_2_ = 0x10;
          auVar78._28_2_ = 0x10;
          auVar78._30_2_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar107._8_2_ = 0x2e;
          auVar107._0_8_ = 0x2e002e002e002e;
          auVar107._10_2_ = 0x2e;
          auVar107._12_2_ = 0x2e;
          auVar107._14_2_ = 0x2e;
          auVar107._16_2_ = 0x2e;
          auVar107._18_2_ = 0x2e;
          auVar107._20_2_ = 0x2e;
          auVar107._22_2_ = 0x2e;
          auVar107._24_2_ = 0x2e;
          auVar107._26_2_ = 0x2e;
          auVar107._28_2_ = 0x2e;
          auVar107._30_2_ = 0x2e;
          uVar14 = dy;
          do {
            iVar18 = (int)uVar14 >> 6;
            lVar22 = lVar9;
            if (iVar18 < 0x2f) {
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar127._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar127._8_2_ = uVar118;
              auVar127._10_2_ = uVar118;
              auVar127._12_2_ = uVar118;
              auVar127._14_2_ = uVar118;
              auVar127._16_2_ = uVar118;
              auVar127._18_2_ = uVar118;
              auVar127._20_2_ = uVar118;
              auVar127._22_2_ = uVar118;
              auVar127._24_2_ = uVar118;
              auVar127._26_2_ = uVar118;
              auVar127._28_2_ = uVar118;
              auVar127._30_2_ = uVar118;
              lVar25 = (long)iVar18;
              lVar22 = 0;
              bVar28 = true;
              do {
                bVar26 = bVar28;
                auVar170 = in_ZMM6._0_32_;
                lVar3 = lVar22 + lVar25;
                auVar167 = auVar53;
                if (lVar3 < 0x2f) {
                  auVar167 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar25 + lVar22 + 1),
                                         *(undefined1 (*) [32])(left + lVar25 + lVar22));
                  auVar168 = vpmullw_avx2(auVar167,auVar127);
                  auVar167 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar25 + lVar22),5);
                  auVar167 = vpaddw_avx2(auVar167,auVar78);
                  auVar167 = vpaddw_avx2(auVar168,auVar167);
                  auVar168 = vpsrlw_avx2(auVar167,5);
                  uVar15 = (uint)lVar3;
                  auVar187._0_2_ = (undefined2)lVar3;
                  auVar187._2_2_ = auVar187._0_2_;
                  auVar187._4_2_ = auVar187._0_2_;
                  auVar187._6_2_ = auVar187._0_2_;
                  auVar187._8_2_ = auVar187._0_2_;
                  auVar187._10_2_ = auVar187._0_2_;
                  auVar187._12_2_ = auVar187._0_2_;
                  auVar187._14_2_ = auVar187._0_2_;
                  auVar184 = vpaddw_avx(auVar187,auVar284);
                  auVar283 = vpslldq_avx(auVar184,2);
                  auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
                  auVar184 = vpsrldq_avx(auVar184,0xe);
                  auVar228._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar38;
                  auVar228._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar184;
                  auVar325._0_2_ = (undefined2)(uVar15 + 9);
                  auVar325._2_2_ = auVar325._0_2_;
                  auVar325._4_2_ = auVar325._0_2_;
                  auVar325._6_2_ = auVar325._0_2_;
                  auVar325._8_2_ = auVar325._0_2_;
                  auVar325._10_2_ = auVar325._0_2_;
                  auVar325._12_2_ = auVar325._0_2_;
                  auVar325._14_2_ = auVar325._0_2_;
                  auVar325._16_2_ = auVar325._0_2_;
                  auVar325._18_2_ = auVar325._0_2_;
                  auVar325._20_2_ = auVar325._0_2_;
                  auVar325._22_2_ = auVar325._0_2_;
                  auVar325._24_2_ = auVar325._0_2_;
                  auVar325._26_2_ = auVar325._0_2_;
                  auVar325._28_2_ = auVar325._0_2_;
                  auVar325._30_2_ = auVar325._0_2_;
                  auVar167 = vpblendw_avx2(auVar228,auVar325,2);
                  auVar326._0_2_ = (undefined2)(uVar15 + 10);
                  auVar326._2_2_ = auVar326._0_2_;
                  auVar326._4_2_ = auVar326._0_2_;
                  auVar326._6_2_ = auVar326._0_2_;
                  auVar326._8_2_ = auVar326._0_2_;
                  auVar326._10_2_ = auVar326._0_2_;
                  auVar326._12_2_ = auVar326._0_2_;
                  auVar326._14_2_ = auVar326._0_2_;
                  auVar326._16_2_ = auVar326._0_2_;
                  auVar326._18_2_ = auVar326._0_2_;
                  auVar326._20_2_ = auVar326._0_2_;
                  auVar326._22_2_ = auVar326._0_2_;
                  auVar326._24_2_ = auVar326._0_2_;
                  auVar326._26_2_ = auVar326._0_2_;
                  auVar326._28_2_ = auVar326._0_2_;
                  auVar326._30_2_ = auVar326._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar326,4);
                  auVar327._0_2_ = (undefined2)(uVar15 + 0xb);
                  auVar327._2_2_ = auVar327._0_2_;
                  auVar327._4_2_ = auVar327._0_2_;
                  auVar327._6_2_ = auVar327._0_2_;
                  auVar327._8_2_ = auVar327._0_2_;
                  auVar327._10_2_ = auVar327._0_2_;
                  auVar327._12_2_ = auVar327._0_2_;
                  auVar327._14_2_ = auVar327._0_2_;
                  auVar327._16_2_ = auVar327._0_2_;
                  auVar327._18_2_ = auVar327._0_2_;
                  auVar327._20_2_ = auVar327._0_2_;
                  auVar327._22_2_ = auVar327._0_2_;
                  auVar327._24_2_ = auVar327._0_2_;
                  auVar327._26_2_ = auVar327._0_2_;
                  auVar327._28_2_ = auVar327._0_2_;
                  auVar327._30_2_ = auVar327._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar327,8);
                  auVar328._0_2_ = (undefined2)(uVar15 + 0xc);
                  auVar328._2_2_ = auVar328._0_2_;
                  auVar328._4_2_ = auVar328._0_2_;
                  auVar328._6_2_ = auVar328._0_2_;
                  auVar328._8_2_ = auVar328._0_2_;
                  auVar328._10_2_ = auVar328._0_2_;
                  auVar328._12_2_ = auVar328._0_2_;
                  auVar328._14_2_ = auVar328._0_2_;
                  auVar328._16_2_ = auVar328._0_2_;
                  auVar328._18_2_ = auVar328._0_2_;
                  auVar328._20_2_ = auVar328._0_2_;
                  auVar328._22_2_ = auVar328._0_2_;
                  auVar328._24_2_ = auVar328._0_2_;
                  auVar328._26_2_ = auVar328._0_2_;
                  auVar328._28_2_ = auVar328._0_2_;
                  auVar328._30_2_ = auVar328._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar328,0x10);
                  auVar329._0_2_ = (undefined2)(uVar15 + 0xd);
                  auVar329._2_2_ = auVar329._0_2_;
                  auVar329._4_2_ = auVar329._0_2_;
                  auVar329._6_2_ = auVar329._0_2_;
                  auVar329._8_2_ = auVar329._0_2_;
                  auVar329._10_2_ = auVar329._0_2_;
                  auVar329._12_2_ = auVar329._0_2_;
                  auVar329._14_2_ = auVar329._0_2_;
                  auVar329._16_2_ = auVar329._0_2_;
                  auVar329._18_2_ = auVar329._0_2_;
                  auVar329._20_2_ = auVar329._0_2_;
                  auVar329._22_2_ = auVar329._0_2_;
                  auVar329._24_2_ = auVar329._0_2_;
                  auVar329._26_2_ = auVar329._0_2_;
                  auVar329._28_2_ = auVar329._0_2_;
                  auVar329._30_2_ = auVar329._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar329,0x20);
                  auVar330._0_2_ = (undefined2)(uVar15 + 0xe);
                  auVar330._2_2_ = auVar330._0_2_;
                  auVar330._4_2_ = auVar330._0_2_;
                  auVar330._6_2_ = auVar330._0_2_;
                  auVar330._8_2_ = auVar330._0_2_;
                  auVar330._10_2_ = auVar330._0_2_;
                  auVar330._12_2_ = auVar330._0_2_;
                  auVar330._14_2_ = auVar330._0_2_;
                  auVar330._16_2_ = auVar330._0_2_;
                  auVar330._18_2_ = auVar330._0_2_;
                  auVar330._20_2_ = auVar330._0_2_;
                  auVar330._22_2_ = auVar330._0_2_;
                  auVar330._24_2_ = auVar330._0_2_;
                  auVar330._26_2_ = auVar330._0_2_;
                  auVar330._28_2_ = auVar330._0_2_;
                  auVar330._30_2_ = auVar330._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar330,0x40);
                  auVar331._0_2_ = (undefined2)(uVar15 + 0xf);
                  auVar331._2_2_ = auVar331._0_2_;
                  auVar331._4_2_ = auVar331._0_2_;
                  auVar331._6_2_ = auVar331._0_2_;
                  auVar331._8_2_ = auVar331._0_2_;
                  auVar331._10_2_ = auVar331._0_2_;
                  auVar331._12_2_ = auVar331._0_2_;
                  auVar331._14_2_ = auVar331._0_2_;
                  auVar331._16_2_ = auVar331._0_2_;
                  auVar331._18_2_ = auVar331._0_2_;
                  auVar331._20_2_ = auVar331._0_2_;
                  auVar331._22_2_ = auVar331._0_2_;
                  auVar331._24_2_ = auVar331._0_2_;
                  auVar331._26_2_ = auVar331._0_2_;
                  auVar331._28_2_ = auVar331._0_2_;
                  auVar331._30_2_ = auVar331._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar331,0x80);
                  auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
                  auVar167 = vpcmpgtw_avx2(auVar167,auVar107);
                  auVar167 = vpblendvb_avx2(auVar168,auVar53,auVar167);
                }
                in_ZMM6 = ZEXT3264(auVar167);
                lVar22 = 0x10;
                bVar28 = false;
              } while (bVar26);
              *(undefined1 (*) [32])(local_2060 + lVar12 * 0x20) = auVar170;
              *(undefined1 (*) [32])(local_1e60 + lVar12 * 0x20) = auVar167;
              uVar14 = uVar14 + dy;
            }
            else {
              do {
                *(undefined1 (*) [32])(local_1e60 + lVar22) = auVar53;
                *(undefined1 (*) [32])(local_1c60 + lVar22) = auVar53;
                lVar22 = lVar22 + 0x20;
              } while (lVar22 != 0);
            }
            if (0x2e < iVar18) break;
            lVar12 = lVar12 + 1;
            lVar9 = lVar9 + 0x20;
          } while (lVar12 != 0x10);
        }
        else {
          auVar84._8_4_ = 0x10;
          auVar84._0_8_ = 0x1000000010;
          auVar84._12_4_ = 0x10;
          auVar84._16_4_ = 0x10;
          auVar84._20_4_ = 0x10;
          auVar84._24_4_ = 0x10;
          auVar84._28_4_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar113._8_2_ = 0x2e;
          auVar113._0_8_ = 0x2e002e002e002e;
          auVar113._10_2_ = 0x2e;
          auVar113._12_2_ = 0x2e;
          auVar113._14_2_ = 0x2e;
          auVar113._16_2_ = 0x2e;
          auVar113._18_2_ = 0x2e;
          auVar113._20_2_ = 0x2e;
          auVar113._22_2_ = 0x2e;
          auVar113._24_2_ = 0x2e;
          auVar113._26_2_ = 0x2e;
          auVar113._28_2_ = 0x2e;
          auVar113._30_2_ = 0x2e;
          auVar167 = vpmovsxbw_avx2(_DAT_0051e870);
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> 6;
            if (0x2e < (int)uVar15) goto LAB_00363087;
            uVar21 = uVar14 >> 1;
            uVar19 = uVar21 & 0x1f801f;
            auVar163._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f801f001f801f;
            auVar163._8_4_ = uVar19;
            auVar163._12_4_ = uVar19;
            auVar163._16_4_ = uVar19;
            auVar163._20_4_ = uVar19;
            auVar163._24_4_ = uVar19;
            auVar163._28_4_ = uVar19;
            auVar184 = auVar38;
            if (uVar15 - 0x30 < 0xfffffff7) {
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
              auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
              auVar168 = vpsubd_avx2(auVar168,auVar170);
              auVar170 = vpslld_avx2(auVar170,5);
              auVar168 = vpmulld_avx2(auVar168,auVar163);
              auVar170 = vpaddd_avx2(auVar170,auVar84);
              auVar170 = vpaddd_avx2(auVar168,auVar170);
              auVar170 = vpsrld_avx2(auVar170,5);
              auVar262._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar170._16_16_;
              auVar262._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
              auVar170 = vpackusdw_avx2(auVar170,auVar262);
              auVar184 = auVar170._0_16_;
            }
            auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
            auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
            auVar168 = vpsubd_avx2(auVar168,auVar170);
            auVar170 = vpslld_avx2(auVar170,5);
            auVar168 = vpmulld_avx2(auVar168,auVar163);
            auVar170 = vpaddd_avx2(auVar170,auVar84);
            auVar170 = vpaddd_avx2(auVar168,auVar170);
            auVar170 = vpsrld_avx2(auVar170,5);
            auVar170 = vpackusdw_avx2(auVar170,ZEXT1632(auVar170._16_16_));
            auVar289._0_2_ = (undefined2)uVar15;
            auVar289._2_2_ = auVar289._0_2_;
            auVar289._4_2_ = auVar289._0_2_;
            auVar289._6_2_ = auVar289._0_2_;
            auVar289._8_2_ = auVar289._0_2_;
            auVar289._10_2_ = auVar289._0_2_;
            auVar289._12_2_ = auVar289._0_2_;
            auVar289._14_2_ = auVar289._0_2_;
            auVar283 = vpaddw_avx(auVar289,auVar284);
            auVar299 = vpslldq_avx(auVar283,2);
            auVar299 = vpblendw_avx(auVar299,ZEXT416(uVar15),1);
            auVar283 = vpsrldq_avx(auVar283,0xe);
            auVar295._0_16_ = ZEXT116(0) * auVar283 + ZEXT116(1) * auVar38;
            auVar295._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar283;
            auVar370._0_2_ = (undefined2)(uVar15 + 9);
            auVar370._2_2_ = auVar370._0_2_;
            auVar370._4_2_ = auVar370._0_2_;
            auVar370._6_2_ = auVar370._0_2_;
            auVar370._8_2_ = auVar370._0_2_;
            auVar370._10_2_ = auVar370._0_2_;
            auVar370._12_2_ = auVar370._0_2_;
            auVar370._14_2_ = auVar370._0_2_;
            auVar370._16_2_ = auVar370._0_2_;
            auVar370._18_2_ = auVar370._0_2_;
            auVar370._20_2_ = auVar370._0_2_;
            auVar370._22_2_ = auVar370._0_2_;
            auVar370._24_2_ = auVar370._0_2_;
            auVar370._26_2_ = auVar370._0_2_;
            auVar370._28_2_ = auVar370._0_2_;
            auVar370._30_2_ = auVar370._0_2_;
            auVar168 = vpblendw_avx2(auVar295,auVar370,2);
            auVar371._0_2_ = (undefined2)(uVar15 + 10);
            auVar371._2_2_ = auVar371._0_2_;
            auVar371._4_2_ = auVar371._0_2_;
            auVar371._6_2_ = auVar371._0_2_;
            auVar371._8_2_ = auVar371._0_2_;
            auVar371._10_2_ = auVar371._0_2_;
            auVar371._12_2_ = auVar371._0_2_;
            auVar371._14_2_ = auVar371._0_2_;
            auVar371._16_2_ = auVar371._0_2_;
            auVar371._18_2_ = auVar371._0_2_;
            auVar371._20_2_ = auVar371._0_2_;
            auVar371._22_2_ = auVar371._0_2_;
            auVar371._24_2_ = auVar371._0_2_;
            auVar371._26_2_ = auVar371._0_2_;
            auVar371._28_2_ = auVar371._0_2_;
            auVar371._30_2_ = auVar371._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar371,4);
            auVar372._0_2_ = (undefined2)(uVar15 + 0xb);
            auVar372._2_2_ = auVar372._0_2_;
            auVar372._4_2_ = auVar372._0_2_;
            auVar372._6_2_ = auVar372._0_2_;
            auVar372._8_2_ = auVar372._0_2_;
            auVar372._10_2_ = auVar372._0_2_;
            auVar372._12_2_ = auVar372._0_2_;
            auVar372._14_2_ = auVar372._0_2_;
            auVar372._16_2_ = auVar372._0_2_;
            auVar372._18_2_ = auVar372._0_2_;
            auVar372._20_2_ = auVar372._0_2_;
            auVar372._22_2_ = auVar372._0_2_;
            auVar372._24_2_ = auVar372._0_2_;
            auVar372._26_2_ = auVar372._0_2_;
            auVar372._28_2_ = auVar372._0_2_;
            auVar372._30_2_ = auVar372._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar372,8);
            auVar373._0_2_ = (undefined2)(uVar15 + 0xc);
            auVar373._2_2_ = auVar373._0_2_;
            auVar373._4_2_ = auVar373._0_2_;
            auVar373._6_2_ = auVar373._0_2_;
            auVar373._8_2_ = auVar373._0_2_;
            auVar373._10_2_ = auVar373._0_2_;
            auVar373._12_2_ = auVar373._0_2_;
            auVar373._14_2_ = auVar373._0_2_;
            auVar373._16_2_ = auVar373._0_2_;
            auVar373._18_2_ = auVar373._0_2_;
            auVar373._20_2_ = auVar373._0_2_;
            auVar373._22_2_ = auVar373._0_2_;
            auVar373._24_2_ = auVar373._0_2_;
            auVar373._26_2_ = auVar373._0_2_;
            auVar373._28_2_ = auVar373._0_2_;
            auVar373._30_2_ = auVar373._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar373,0x10);
            auVar374._0_2_ = (undefined2)(uVar15 + 0xd);
            auVar374._2_2_ = auVar374._0_2_;
            auVar374._4_2_ = auVar374._0_2_;
            auVar374._6_2_ = auVar374._0_2_;
            auVar374._8_2_ = auVar374._0_2_;
            auVar374._10_2_ = auVar374._0_2_;
            auVar374._12_2_ = auVar374._0_2_;
            auVar374._14_2_ = auVar374._0_2_;
            auVar374._16_2_ = auVar374._0_2_;
            auVar374._18_2_ = auVar374._0_2_;
            auVar374._20_2_ = auVar374._0_2_;
            auVar374._22_2_ = auVar374._0_2_;
            auVar374._24_2_ = auVar374._0_2_;
            auVar374._26_2_ = auVar374._0_2_;
            auVar374._28_2_ = auVar374._0_2_;
            auVar374._30_2_ = auVar374._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar374,0x20);
            auVar375._0_2_ = (undefined2)(uVar15 + 0xe);
            auVar375._2_2_ = auVar375._0_2_;
            auVar375._4_2_ = auVar375._0_2_;
            auVar375._6_2_ = auVar375._0_2_;
            auVar375._8_2_ = auVar375._0_2_;
            auVar375._10_2_ = auVar375._0_2_;
            auVar375._12_2_ = auVar375._0_2_;
            auVar375._14_2_ = auVar375._0_2_;
            auVar375._16_2_ = auVar375._0_2_;
            auVar375._18_2_ = auVar375._0_2_;
            auVar375._20_2_ = auVar375._0_2_;
            auVar375._22_2_ = auVar375._0_2_;
            auVar375._24_2_ = auVar375._0_2_;
            auVar375._26_2_ = auVar375._0_2_;
            auVar375._28_2_ = auVar375._0_2_;
            auVar375._30_2_ = auVar375._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar375,0x40);
            auVar376._0_2_ = (undefined2)(uVar15 + 0xf);
            auVar376._2_2_ = auVar376._0_2_;
            auVar376._4_2_ = auVar376._0_2_;
            auVar376._6_2_ = auVar376._0_2_;
            auVar376._8_2_ = auVar376._0_2_;
            auVar376._10_2_ = auVar376._0_2_;
            auVar376._12_2_ = auVar376._0_2_;
            auVar376._14_2_ = auVar376._0_2_;
            auVar376._16_2_ = auVar376._0_2_;
            auVar376._18_2_ = auVar376._0_2_;
            auVar376._20_2_ = auVar376._0_2_;
            auVar376._22_2_ = auVar376._0_2_;
            auVar376._24_2_ = auVar376._0_2_;
            auVar376._26_2_ = auVar376._0_2_;
            auVar376._28_2_ = auVar376._0_2_;
            auVar376._30_2_ = auVar376._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar376,0x80);
            auVar168 = vpblendd_avx2(ZEXT1632(auVar299),auVar168,0xf0);
            auVar168 = vpcmpgtw_avx2(auVar168,auVar113);
            auVar178._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar170._0_16_;
            auVar178._16_16_ = ZEXT116(0) * auVar170._16_16_ + ZEXT116(1) * auVar184;
            auVar170 = vpblendvb_avx2(auVar178,auVar53,auVar168);
            *(undefined1 (*) [32])(local_1e60 + lVar9) = auVar170;
            auVar170 = auVar53;
            if ((int)uVar15 < 0x1f) {
              auVar184 = auVar38;
              if (uVar15 - 0x20 < 0xfffffff7) {
                auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x18));
                auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x19));
                auVar168 = vpsubd_avx2(auVar168,auVar170);
                auVar170 = vpslld_avx2(auVar170,5);
                auVar168 = vpmulld_avx2(auVar168,auVar163);
                auVar170 = vpaddd_avx2(auVar170,auVar84);
                auVar170 = vpaddd_avx2(auVar168,auVar170);
                auVar170 = vpsrld_avx2(auVar170,5);
                auVar263._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar170._16_16_;
                auVar263._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
                auVar170 = vpackusdw_avx2(auVar170,auVar263);
                auVar184 = auVar170._0_16_;
              }
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x10));
              auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x11));
              auVar168 = vpsubd_avx2(auVar168,auVar170);
              auVar170 = vpslld_avx2(auVar170,5);
              auVar168 = vpmulld_avx2(auVar168,auVar163);
              auVar170 = vpaddd_avx2(auVar170,auVar84);
              auVar170 = vpaddd_avx2(auVar168,auVar170);
              auVar170 = vpsrld_avx2(auVar170,5);
              auVar170 = vpackusdw_avx2(auVar170,ZEXT1632(auVar170._16_16_));
              auVar264._2_2_ = auVar289._0_2_;
              auVar264._0_2_ = auVar289._0_2_;
              auVar264._4_2_ = auVar289._0_2_;
              auVar264._6_2_ = auVar289._0_2_;
              auVar264._8_2_ = auVar289._0_2_;
              auVar264._10_2_ = auVar289._0_2_;
              auVar264._12_2_ = auVar289._0_2_;
              auVar264._14_2_ = auVar289._0_2_;
              auVar264._16_2_ = auVar289._0_2_;
              auVar264._18_2_ = auVar289._0_2_;
              auVar264._20_2_ = auVar289._0_2_;
              auVar264._22_2_ = auVar289._0_2_;
              auVar264._24_2_ = auVar289._0_2_;
              auVar264._26_2_ = auVar289._0_2_;
              auVar264._28_2_ = auVar289._0_2_;
              auVar264._30_2_ = auVar289._0_2_;
              auVar168 = vpaddw_avx2(auVar264,auVar167);
              auVar168 = vpcmpgtw_avx2(auVar168,auVar113);
              auVar164._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar170._0_16_;
              auVar164._16_16_ = ZEXT116(0) * auVar170._16_16_ + ZEXT116(1) * auVar184;
              auVar170 = vpblendvb_avx2(auVar164,auVar53,auVar168);
            }
            *(undefined1 (*) [32])(local_1c60 + lVar9) = auVar170;
            uVar14 = uVar14 + dy;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0);
        }
        goto LAB_0036309f;
      case 7:
        if (bd < 0xc) {
          uStackY_26a8 = 0x361ed5;
          highbd_dr_prediction_z1_64xN_avx2(0x20,(uint16_t *)local_2060,0x40,left,dy,iVar18);
        }
        else {
          uStackY_26a8 = 0x363a71;
          highbd_dr_prediction_32bit_z1_64xN_avx2(0x20,(uint16_t *)local_2060,0x40,left,dy,iVar18);
        }
        iVar18 = 0x20;
        pitchDst = local_2690;
        puVar13 = local_2688;
      }
    }
    else {
      if (bw != 0x10) {
        if (bw != 8) {
          if (bw != 4) {
            return;
          }
          uVar4 = left[0x13];
          auVar32._2_2_ = uVar4;
          auVar32._0_2_ = uVar4;
          auVar32._4_2_ = uVar4;
          auVar32._6_2_ = uVar4;
          auVar32._8_2_ = uVar4;
          auVar32._10_2_ = uVar4;
          auVar32._12_2_ = uVar4;
          auVar32._14_2_ = uVar4;
          auVar44._16_2_ = uVar4;
          auVar44._0_16_ = auVar32;
          auVar44._18_2_ = uVar4;
          auVar44._20_2_ = uVar4;
          auVar44._22_2_ = uVar4;
          auVar44._24_2_ = uVar4;
          auVar44._26_2_ = uVar4;
          auVar44._28_2_ = uVar4;
          auVar44._30_2_ = uVar4;
          lVar9 = 0;
          if (bd < 0xc) {
            auVar70._8_2_ = 0x10;
            auVar70._0_8_ = 0x10001000100010;
            auVar70._10_2_ = 0x10;
            auVar70._12_2_ = 0x10;
            auVar70._14_2_ = 0x10;
            auVar70._16_2_ = 0x10;
            auVar70._18_2_ = 0x10;
            auVar70._20_2_ = 0x10;
            auVar70._22_2_ = 0x10;
            auVar70._24_2_ = 0x10;
            auVar70._26_2_ = 0x10;
            auVar70._28_2_ = 0x10;
            auVar70._30_2_ = 0x10;
            auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar99._8_2_ = 0x12;
            auVar99._0_8_ = 0x12001200120012;
            auVar99._10_2_ = 0x12;
            auVar99._12_2_ = 0x12;
            auVar99._14_2_ = 0x12;
            auVar99._16_2_ = 0x12;
            auVar99._18_2_ = 0x12;
            auVar99._20_2_ = 0x12;
            auVar99._22_2_ = 0x12;
            auVar99._24_2_ = 0x12;
            auVar99._26_2_ = 0x12;
            auVar99._28_2_ = 0x12;
            auVar99._30_2_ = 0x12;
            uVar11 = 0;
            uVar14 = dy;
            do {
              uVar15 = (int)uVar14 >> 6;
              if (0x12 < (int)uVar15) {
                if (uVar11 < 4) {
                  do {
                    *(undefined1 (*) [32])(local_2060 + lVar9) = auVar44;
                    lVar9 = lVar9 + 0x20;
                  } while (lVar9 != 0x80);
                }
                break;
              }
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar119._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar119._8_2_ = uVar118;
              auVar119._10_2_ = uVar118;
              auVar119._12_2_ = uVar118;
              auVar119._14_2_ = uVar118;
              auVar119._16_2_ = uVar118;
              auVar119._18_2_ = uVar118;
              auVar119._20_2_ = uVar118;
              auVar119._22_2_ = uVar118;
              auVar119._24_2_ = uVar118;
              auVar119._26_2_ = uVar118;
              auVar119._28_2_ = uVar118;
              auVar119._30_2_ = uVar118;
              auVar167 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar15 + 1),
                                     *(undefined1 (*) [32])(left + (int)uVar15));
              auVar170 = vpmullw_avx2(auVar167,auVar119);
              auVar167 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar15),5);
              auVar167 = vpaddw_avx2(auVar167,auVar70);
              auVar167 = vpaddw_avx2(auVar170,auVar167);
              auVar170 = vpsrlw_avx2(auVar167,5);
              auVar139._0_2_ = (undefined2)uVar15;
              auVar139._2_2_ = auVar139._0_2_;
              auVar139._4_2_ = auVar139._0_2_;
              auVar139._6_2_ = auVar139._0_2_;
              auVar139._8_2_ = auVar139._0_2_;
              auVar139._10_2_ = auVar139._0_2_;
              auVar139._12_2_ = auVar139._0_2_;
              auVar139._14_2_ = auVar139._0_2_;
              auVar184 = vpaddw_avx(auVar139,auVar284);
              auVar283 = vpslldq_avx(auVar184,2);
              auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
              auVar184 = vpsrldq_avx(auVar184,0xe);
              auVar149._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar32;
              auVar149._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar184;
              auVar191._0_2_ = (undefined2)(uVar15 + 9);
              auVar191._2_2_ = auVar191._0_2_;
              auVar191._4_2_ = auVar191._0_2_;
              auVar191._6_2_ = auVar191._0_2_;
              auVar191._8_2_ = auVar191._0_2_;
              auVar191._10_2_ = auVar191._0_2_;
              auVar191._12_2_ = auVar191._0_2_;
              auVar191._14_2_ = auVar191._0_2_;
              auVar191._16_2_ = auVar191._0_2_;
              auVar191._18_2_ = auVar191._0_2_;
              auVar191._20_2_ = auVar191._0_2_;
              auVar191._22_2_ = auVar191._0_2_;
              auVar191._24_2_ = auVar191._0_2_;
              auVar191._26_2_ = auVar191._0_2_;
              auVar191._28_2_ = auVar191._0_2_;
              auVar191._30_2_ = auVar191._0_2_;
              auVar167 = vpblendw_avx2(auVar149,auVar191,2);
              auVar192._0_2_ = (undefined2)(uVar15 + 10);
              auVar192._2_2_ = auVar192._0_2_;
              auVar192._4_2_ = auVar192._0_2_;
              auVar192._6_2_ = auVar192._0_2_;
              auVar192._8_2_ = auVar192._0_2_;
              auVar192._10_2_ = auVar192._0_2_;
              auVar192._12_2_ = auVar192._0_2_;
              auVar192._14_2_ = auVar192._0_2_;
              auVar192._16_2_ = auVar192._0_2_;
              auVar192._18_2_ = auVar192._0_2_;
              auVar192._20_2_ = auVar192._0_2_;
              auVar192._22_2_ = auVar192._0_2_;
              auVar192._24_2_ = auVar192._0_2_;
              auVar192._26_2_ = auVar192._0_2_;
              auVar192._28_2_ = auVar192._0_2_;
              auVar192._30_2_ = auVar192._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar192,4);
              auVar193._0_2_ = (undefined2)(uVar15 + 0xb);
              auVar193._2_2_ = auVar193._0_2_;
              auVar193._4_2_ = auVar193._0_2_;
              auVar193._6_2_ = auVar193._0_2_;
              auVar193._8_2_ = auVar193._0_2_;
              auVar193._10_2_ = auVar193._0_2_;
              auVar193._12_2_ = auVar193._0_2_;
              auVar193._14_2_ = auVar193._0_2_;
              auVar193._16_2_ = auVar193._0_2_;
              auVar193._18_2_ = auVar193._0_2_;
              auVar193._20_2_ = auVar193._0_2_;
              auVar193._22_2_ = auVar193._0_2_;
              auVar193._24_2_ = auVar193._0_2_;
              auVar193._26_2_ = auVar193._0_2_;
              auVar193._28_2_ = auVar193._0_2_;
              auVar193._30_2_ = auVar193._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar193,8);
              auVar194._0_2_ = (undefined2)(uVar15 + 0xc);
              auVar194._2_2_ = auVar194._0_2_;
              auVar194._4_2_ = auVar194._0_2_;
              auVar194._6_2_ = auVar194._0_2_;
              auVar194._8_2_ = auVar194._0_2_;
              auVar194._10_2_ = auVar194._0_2_;
              auVar194._12_2_ = auVar194._0_2_;
              auVar194._14_2_ = auVar194._0_2_;
              auVar194._16_2_ = auVar194._0_2_;
              auVar194._18_2_ = auVar194._0_2_;
              auVar194._20_2_ = auVar194._0_2_;
              auVar194._22_2_ = auVar194._0_2_;
              auVar194._24_2_ = auVar194._0_2_;
              auVar194._26_2_ = auVar194._0_2_;
              auVar194._28_2_ = auVar194._0_2_;
              auVar194._30_2_ = auVar194._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar194,0x10);
              auVar195._0_2_ = (undefined2)(uVar15 + 0xd);
              auVar195._2_2_ = auVar195._0_2_;
              auVar195._4_2_ = auVar195._0_2_;
              auVar195._6_2_ = auVar195._0_2_;
              auVar195._8_2_ = auVar195._0_2_;
              auVar195._10_2_ = auVar195._0_2_;
              auVar195._12_2_ = auVar195._0_2_;
              auVar195._14_2_ = auVar195._0_2_;
              auVar195._16_2_ = auVar195._0_2_;
              auVar195._18_2_ = auVar195._0_2_;
              auVar195._20_2_ = auVar195._0_2_;
              auVar195._22_2_ = auVar195._0_2_;
              auVar195._24_2_ = auVar195._0_2_;
              auVar195._26_2_ = auVar195._0_2_;
              auVar195._28_2_ = auVar195._0_2_;
              auVar195._30_2_ = auVar195._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar195,0x20);
              auVar196._0_2_ = (undefined2)(uVar15 + 0xe);
              auVar196._2_2_ = auVar196._0_2_;
              auVar196._4_2_ = auVar196._0_2_;
              auVar196._6_2_ = auVar196._0_2_;
              auVar196._8_2_ = auVar196._0_2_;
              auVar196._10_2_ = auVar196._0_2_;
              auVar196._12_2_ = auVar196._0_2_;
              auVar196._14_2_ = auVar196._0_2_;
              auVar196._16_2_ = auVar196._0_2_;
              auVar196._18_2_ = auVar196._0_2_;
              auVar196._20_2_ = auVar196._0_2_;
              auVar196._22_2_ = auVar196._0_2_;
              auVar196._24_2_ = auVar196._0_2_;
              auVar196._26_2_ = auVar196._0_2_;
              auVar196._28_2_ = auVar196._0_2_;
              auVar196._30_2_ = auVar196._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar196,0x40);
              auVar197._0_2_ = (undefined2)(uVar15 + 0xf);
              auVar197._2_2_ = auVar197._0_2_;
              auVar197._4_2_ = auVar197._0_2_;
              auVar197._6_2_ = auVar197._0_2_;
              auVar197._8_2_ = auVar197._0_2_;
              auVar197._10_2_ = auVar197._0_2_;
              auVar197._12_2_ = auVar197._0_2_;
              auVar197._14_2_ = auVar197._0_2_;
              auVar197._16_2_ = auVar197._0_2_;
              auVar197._18_2_ = auVar197._0_2_;
              auVar197._20_2_ = auVar197._0_2_;
              auVar197._22_2_ = auVar197._0_2_;
              auVar197._24_2_ = auVar197._0_2_;
              auVar197._26_2_ = auVar197._0_2_;
              auVar197._28_2_ = auVar197._0_2_;
              auVar197._30_2_ = auVar197._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar197,0x80);
              auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
              auVar167 = vpcmpgtw_avx2(auVar167,auVar99);
              auVar167 = vpblendvb_avx2(auVar170,auVar44,auVar167);
              *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
              uVar14 = uVar14 + dy;
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x20;
            } while (uVar11 != 4);
          }
          else {
            auVar83._8_4_ = 0x10;
            auVar83._0_8_ = 0x1000000010;
            auVar83._12_4_ = 0x10;
            auVar83._16_4_ = 0x10;
            auVar83._20_4_ = 0x10;
            auVar83._24_4_ = 0x10;
            auVar83._28_4_ = 0x10;
            auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar112._8_2_ = 0x12;
            auVar112._0_8_ = 0x12001200120012;
            auVar112._10_2_ = 0x12;
            auVar112._12_2_ = 0x12;
            auVar112._14_2_ = 0x12;
            auVar112._16_2_ = 0x12;
            auVar112._18_2_ = 0x12;
            auVar112._20_2_ = 0x12;
            auVar112._22_2_ = 0x12;
            auVar112._24_2_ = 0x12;
            auVar112._26_2_ = 0x12;
            auVar112._28_2_ = 0x12;
            auVar112._30_2_ = 0x12;
            uVar11 = 0;
            uVar14 = dy;
            do {
              uVar15 = (int)uVar14 >> 6;
              if (0x12 < (int)uVar15) {
                if (uVar11 < 4) {
                  do {
                    *(undefined1 (*) [32])(local_2060 + lVar9) = auVar44;
                    lVar9 = lVar9 + 0x20;
                  } while (lVar9 != 0x80);
                }
                break;
              }
              uVar21 = uVar14 >> 1;
              uVar19 = uVar21 & 0x1f;
              auVar131._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f0000001f;
              auVar131._8_4_ = uVar19;
              auVar131._12_4_ = uVar19;
              auVar131._16_4_ = uVar19;
              auVar131._20_4_ = uVar19;
              auVar131._24_4_ = uVar19;
              auVar131._28_4_ = uVar19;
              auVar184 = auVar32;
              if (uVar15 - 0x14 < 0xfffffff7) {
                auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
                auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
                auVar170 = vpsubd_avx2(auVar170,auVar167);
                auVar167 = vpslld_avx2(auVar167,5);
                auVar170 = vpmulld_avx2(auVar170,auVar131);
                auVar167 = vpaddd_avx2(auVar167,auVar83);
                auVar167 = vpaddd_avx2(auVar170,auVar167);
                auVar167 = vpsrld_avx2(auVar167,5);
                auVar177._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar167._16_16_;
                auVar177._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
                auVar167 = vpackusdw_avx2(auVar167,auVar177);
                auVar184 = auVar167._0_16_;
              }
              auVar167 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
              auVar170 = vpsubd_avx2(auVar170,auVar167);
              auVar167 = vpslld_avx2(auVar167,5);
              auVar170 = vpmulld_avx2(auVar170,auVar131);
              auVar167 = vpaddd_avx2(auVar167,auVar83);
              auVar167 = vpaddd_avx2(auVar170,auVar167);
              auVar167 = vpsrld_avx2(auVar167,5);
              auVar167 = vpackusdw_avx2(auVar167,ZEXT1632(auVar167._16_16_));
              auVar132._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar167._0_16_;
              auVar132._16_16_ = ZEXT116(0) * auVar167._16_16_ + ZEXT116(1) * auVar184;
              auVar144._0_2_ = (undefined2)uVar15;
              auVar144._2_2_ = auVar144._0_2_;
              auVar144._4_2_ = auVar144._0_2_;
              auVar144._6_2_ = auVar144._0_2_;
              auVar144._8_2_ = auVar144._0_2_;
              auVar144._10_2_ = auVar144._0_2_;
              auVar144._12_2_ = auVar144._0_2_;
              auVar144._14_2_ = auVar144._0_2_;
              auVar184 = vpaddw_avx(auVar144,auVar284);
              auVar283 = vpslldq_avx(auVar184,2);
              auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
              auVar184 = vpsrldq_avx(auVar184,0xe);
              auVar162._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar32;
              auVar162._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar184;
              auVar255._0_2_ = (undefined2)(uVar15 + 9);
              auVar255._2_2_ = auVar255._0_2_;
              auVar255._4_2_ = auVar255._0_2_;
              auVar255._6_2_ = auVar255._0_2_;
              auVar255._8_2_ = auVar255._0_2_;
              auVar255._10_2_ = auVar255._0_2_;
              auVar255._12_2_ = auVar255._0_2_;
              auVar255._14_2_ = auVar255._0_2_;
              auVar255._16_2_ = auVar255._0_2_;
              auVar255._18_2_ = auVar255._0_2_;
              auVar255._20_2_ = auVar255._0_2_;
              auVar255._22_2_ = auVar255._0_2_;
              auVar255._24_2_ = auVar255._0_2_;
              auVar255._26_2_ = auVar255._0_2_;
              auVar255._28_2_ = auVar255._0_2_;
              auVar255._30_2_ = auVar255._0_2_;
              auVar167 = vpblendw_avx2(auVar162,auVar255,2);
              auVar256._0_2_ = (undefined2)(uVar15 + 10);
              auVar256._2_2_ = auVar256._0_2_;
              auVar256._4_2_ = auVar256._0_2_;
              auVar256._6_2_ = auVar256._0_2_;
              auVar256._8_2_ = auVar256._0_2_;
              auVar256._10_2_ = auVar256._0_2_;
              auVar256._12_2_ = auVar256._0_2_;
              auVar256._14_2_ = auVar256._0_2_;
              auVar256._16_2_ = auVar256._0_2_;
              auVar256._18_2_ = auVar256._0_2_;
              auVar256._20_2_ = auVar256._0_2_;
              auVar256._22_2_ = auVar256._0_2_;
              auVar256._24_2_ = auVar256._0_2_;
              auVar256._26_2_ = auVar256._0_2_;
              auVar256._28_2_ = auVar256._0_2_;
              auVar256._30_2_ = auVar256._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar256,4);
              auVar257._0_2_ = (undefined2)(uVar15 + 0xb);
              auVar257._2_2_ = auVar257._0_2_;
              auVar257._4_2_ = auVar257._0_2_;
              auVar257._6_2_ = auVar257._0_2_;
              auVar257._8_2_ = auVar257._0_2_;
              auVar257._10_2_ = auVar257._0_2_;
              auVar257._12_2_ = auVar257._0_2_;
              auVar257._14_2_ = auVar257._0_2_;
              auVar257._16_2_ = auVar257._0_2_;
              auVar257._18_2_ = auVar257._0_2_;
              auVar257._20_2_ = auVar257._0_2_;
              auVar257._22_2_ = auVar257._0_2_;
              auVar257._24_2_ = auVar257._0_2_;
              auVar257._26_2_ = auVar257._0_2_;
              auVar257._28_2_ = auVar257._0_2_;
              auVar257._30_2_ = auVar257._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar257,8);
              auVar258._0_2_ = (undefined2)(uVar15 + 0xc);
              auVar258._2_2_ = auVar258._0_2_;
              auVar258._4_2_ = auVar258._0_2_;
              auVar258._6_2_ = auVar258._0_2_;
              auVar258._8_2_ = auVar258._0_2_;
              auVar258._10_2_ = auVar258._0_2_;
              auVar258._12_2_ = auVar258._0_2_;
              auVar258._14_2_ = auVar258._0_2_;
              auVar258._16_2_ = auVar258._0_2_;
              auVar258._18_2_ = auVar258._0_2_;
              auVar258._20_2_ = auVar258._0_2_;
              auVar258._22_2_ = auVar258._0_2_;
              auVar258._24_2_ = auVar258._0_2_;
              auVar258._26_2_ = auVar258._0_2_;
              auVar258._28_2_ = auVar258._0_2_;
              auVar258._30_2_ = auVar258._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar258,0x10);
              auVar259._0_2_ = (undefined2)(uVar15 + 0xd);
              auVar259._2_2_ = auVar259._0_2_;
              auVar259._4_2_ = auVar259._0_2_;
              auVar259._6_2_ = auVar259._0_2_;
              auVar259._8_2_ = auVar259._0_2_;
              auVar259._10_2_ = auVar259._0_2_;
              auVar259._12_2_ = auVar259._0_2_;
              auVar259._14_2_ = auVar259._0_2_;
              auVar259._16_2_ = auVar259._0_2_;
              auVar259._18_2_ = auVar259._0_2_;
              auVar259._20_2_ = auVar259._0_2_;
              auVar259._22_2_ = auVar259._0_2_;
              auVar259._24_2_ = auVar259._0_2_;
              auVar259._26_2_ = auVar259._0_2_;
              auVar259._28_2_ = auVar259._0_2_;
              auVar259._30_2_ = auVar259._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar259,0x20);
              auVar260._0_2_ = (undefined2)(uVar15 + 0xe);
              auVar260._2_2_ = auVar260._0_2_;
              auVar260._4_2_ = auVar260._0_2_;
              auVar260._6_2_ = auVar260._0_2_;
              auVar260._8_2_ = auVar260._0_2_;
              auVar260._10_2_ = auVar260._0_2_;
              auVar260._12_2_ = auVar260._0_2_;
              auVar260._14_2_ = auVar260._0_2_;
              auVar260._16_2_ = auVar260._0_2_;
              auVar260._18_2_ = auVar260._0_2_;
              auVar260._20_2_ = auVar260._0_2_;
              auVar260._22_2_ = auVar260._0_2_;
              auVar260._24_2_ = auVar260._0_2_;
              auVar260._26_2_ = auVar260._0_2_;
              auVar260._28_2_ = auVar260._0_2_;
              auVar260._30_2_ = auVar260._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar260,0x40);
              auVar261._0_2_ = (undefined2)(uVar15 + 0xf);
              auVar261._2_2_ = auVar261._0_2_;
              auVar261._4_2_ = auVar261._0_2_;
              auVar261._6_2_ = auVar261._0_2_;
              auVar261._8_2_ = auVar261._0_2_;
              auVar261._10_2_ = auVar261._0_2_;
              auVar261._12_2_ = auVar261._0_2_;
              auVar261._14_2_ = auVar261._0_2_;
              auVar261._16_2_ = auVar261._0_2_;
              auVar261._18_2_ = auVar261._0_2_;
              auVar261._20_2_ = auVar261._0_2_;
              auVar261._22_2_ = auVar261._0_2_;
              auVar261._24_2_ = auVar261._0_2_;
              auVar261._26_2_ = auVar261._0_2_;
              auVar261._28_2_ = auVar261._0_2_;
              auVar261._30_2_ = auVar261._0_2_;
              auVar167 = vpblendw_avx2(auVar167,auVar261,0x80);
              auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
              auVar167 = vpcmpgtw_avx2(auVar167,auVar112);
              auVar167 = vpblendvb_avx2(auVar132,auVar44,auVar167);
              *(undefined1 (*) [32])(local_2060 + lVar9) = auVar167;
              uVar14 = uVar14 + dy;
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x20;
            } while (uVar11 != 4);
          }
          auVar168 = vpunpcklwd_avx2(local_2060,local_2040);
          auVar130 = vpunpcklwd_avx2(local_2020,local_2000);
          auVar167 = vpunpckhwd_avx2(local_2060,local_2040);
          auVar170 = vpunpckhwd_avx2(local_2020,local_2000);
          auVar161 = vpunpckldq_avx2(auVar168,auVar130);
          auVar175 = vpunpckldq_avx2(auVar167,auVar170);
          _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
          local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
          auVar168 = vpunpckhdq_avx2(auVar168,auVar130);
          auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
          local_2620 = vpunpcklqdq_avx2(auVar168,auVar167);
          local_2600 = vpunpckhqdq_avx2(auVar168,auVar167);
          lVar9 = 0;
          do {
            auVar284 = *(undefined1 (*) [16])(local_2660 + lVar9);
            auVar184 = *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10);
            *(long *)dst = auVar284._0_8_;
            uVar5 = vpextrq_avx(auVar284,1);
            *(undefined8 *)(dst + stride * 4) = uVar5;
            *(long *)(dst + stride * 8) = auVar184._0_8_;
            uVar5 = vpextrq_avx(auVar184,1);
            *(undefined8 *)(dst + stride * 0xc) = uVar5;
            dst = dst + stride;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0x80);
          return;
        }
        uVar4 = left[0x27];
        auVar37._2_2_ = uVar4;
        auVar37._0_2_ = uVar4;
        auVar37._4_2_ = uVar4;
        auVar37._6_2_ = uVar4;
        auVar37._8_2_ = uVar4;
        auVar37._10_2_ = uVar4;
        auVar37._12_2_ = uVar4;
        auVar37._14_2_ = uVar4;
        auVar51._16_2_ = uVar4;
        auVar51._0_16_ = auVar37;
        auVar51._18_2_ = uVar4;
        auVar51._20_2_ = uVar4;
        auVar51._22_2_ = uVar4;
        auVar51._24_2_ = uVar4;
        auVar51._26_2_ = uVar4;
        auVar51._28_2_ = uVar4;
        auVar51._30_2_ = uVar4;
        lVar9 = -0x100;
        if (bd < 0xc) {
          lVar12 = 0;
          auVar76._8_2_ = 0x10;
          auVar76._0_8_ = 0x10001000100010;
          auVar76._10_2_ = 0x10;
          auVar76._12_2_ = 0x10;
          auVar76._14_2_ = 0x10;
          auVar76._16_2_ = 0x10;
          auVar76._18_2_ = 0x10;
          auVar76._20_2_ = 0x10;
          auVar76._22_2_ = 0x10;
          auVar76._24_2_ = 0x10;
          auVar76._26_2_ = 0x10;
          auVar76._28_2_ = 0x10;
          auVar76._30_2_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar105._8_2_ = 0x26;
          auVar105._0_8_ = 0x26002600260026;
          auVar105._10_2_ = 0x26;
          auVar105._12_2_ = 0x26;
          auVar105._14_2_ = 0x26;
          auVar105._16_2_ = 0x26;
          auVar105._18_2_ = 0x26;
          auVar105._20_2_ = 0x26;
          auVar105._22_2_ = 0x26;
          auVar105._24_2_ = 0x26;
          auVar105._26_2_ = 0x26;
          auVar105._28_2_ = 0x26;
          auVar105._30_2_ = 0x26;
          uVar14 = dy;
          do {
            iVar18 = (int)uVar14 >> 6;
            lVar22 = lVar9;
            if (iVar18 < 0x27) {
              uVar6 = (ushort)(uVar14 >> 1);
              uVar118 = uVar6 & 0x1f;
              auVar125._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar125._8_2_ = uVar118;
              auVar125._10_2_ = uVar118;
              auVar125._12_2_ = uVar118;
              auVar125._14_2_ = uVar118;
              auVar125._16_2_ = uVar118;
              auVar125._18_2_ = uVar118;
              auVar125._20_2_ = uVar118;
              auVar125._22_2_ = uVar118;
              auVar125._24_2_ = uVar118;
              auVar125._26_2_ = uVar118;
              auVar125._28_2_ = uVar118;
              auVar125._30_2_ = uVar118;
              lVar25 = (long)iVar18;
              lVar22 = 0;
              bVar28 = true;
              do {
                bVar26 = bVar28;
                auVar170 = in_ZMM6._0_32_;
                lVar3 = lVar22 + lVar25;
                auVar167 = auVar51;
                if (lVar3 < 0x27) {
                  auVar167 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar25 + lVar22 + 1),
                                         *(undefined1 (*) [32])(left + lVar25 + lVar22));
                  auVar168 = vpmullw_avx2(auVar167,auVar125);
                  auVar167 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar25 + lVar22),5);
                  auVar167 = vpaddw_avx2(auVar167,auVar76);
                  auVar167 = vpaddw_avx2(auVar168,auVar167);
                  auVar168 = vpsrlw_avx2(auVar167,5);
                  uVar15 = (uint)lVar3;
                  auVar186._0_2_ = (undefined2)lVar3;
                  auVar186._2_2_ = auVar186._0_2_;
                  auVar186._4_2_ = auVar186._0_2_;
                  auVar186._6_2_ = auVar186._0_2_;
                  auVar186._8_2_ = auVar186._0_2_;
                  auVar186._10_2_ = auVar186._0_2_;
                  auVar186._12_2_ = auVar186._0_2_;
                  auVar186._14_2_ = auVar186._0_2_;
                  auVar184 = vpaddw_avx(auVar186,auVar284);
                  auVar283 = vpslldq_avx(auVar184,2);
                  auVar283 = vpblendw_avx(auVar283,ZEXT416(uVar15),1);
                  auVar184 = vpsrldq_avx(auVar184,0xe);
                  auVar220._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar37;
                  auVar220._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * auVar184;
                  auVar317._0_2_ = (undefined2)(uVar15 + 9);
                  auVar317._2_2_ = auVar317._0_2_;
                  auVar317._4_2_ = auVar317._0_2_;
                  auVar317._6_2_ = auVar317._0_2_;
                  auVar317._8_2_ = auVar317._0_2_;
                  auVar317._10_2_ = auVar317._0_2_;
                  auVar317._12_2_ = auVar317._0_2_;
                  auVar317._14_2_ = auVar317._0_2_;
                  auVar317._16_2_ = auVar317._0_2_;
                  auVar317._18_2_ = auVar317._0_2_;
                  auVar317._20_2_ = auVar317._0_2_;
                  auVar317._22_2_ = auVar317._0_2_;
                  auVar317._24_2_ = auVar317._0_2_;
                  auVar317._26_2_ = auVar317._0_2_;
                  auVar317._28_2_ = auVar317._0_2_;
                  auVar317._30_2_ = auVar317._0_2_;
                  auVar167 = vpblendw_avx2(auVar220,auVar317,2);
                  auVar318._0_2_ = (undefined2)(uVar15 + 10);
                  auVar318._2_2_ = auVar318._0_2_;
                  auVar318._4_2_ = auVar318._0_2_;
                  auVar318._6_2_ = auVar318._0_2_;
                  auVar318._8_2_ = auVar318._0_2_;
                  auVar318._10_2_ = auVar318._0_2_;
                  auVar318._12_2_ = auVar318._0_2_;
                  auVar318._14_2_ = auVar318._0_2_;
                  auVar318._16_2_ = auVar318._0_2_;
                  auVar318._18_2_ = auVar318._0_2_;
                  auVar318._20_2_ = auVar318._0_2_;
                  auVar318._22_2_ = auVar318._0_2_;
                  auVar318._24_2_ = auVar318._0_2_;
                  auVar318._26_2_ = auVar318._0_2_;
                  auVar318._28_2_ = auVar318._0_2_;
                  auVar318._30_2_ = auVar318._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar318,4);
                  auVar319._0_2_ = (undefined2)(uVar15 + 0xb);
                  auVar319._2_2_ = auVar319._0_2_;
                  auVar319._4_2_ = auVar319._0_2_;
                  auVar319._6_2_ = auVar319._0_2_;
                  auVar319._8_2_ = auVar319._0_2_;
                  auVar319._10_2_ = auVar319._0_2_;
                  auVar319._12_2_ = auVar319._0_2_;
                  auVar319._14_2_ = auVar319._0_2_;
                  auVar319._16_2_ = auVar319._0_2_;
                  auVar319._18_2_ = auVar319._0_2_;
                  auVar319._20_2_ = auVar319._0_2_;
                  auVar319._22_2_ = auVar319._0_2_;
                  auVar319._24_2_ = auVar319._0_2_;
                  auVar319._26_2_ = auVar319._0_2_;
                  auVar319._28_2_ = auVar319._0_2_;
                  auVar319._30_2_ = auVar319._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar319,8);
                  auVar320._0_2_ = (undefined2)(uVar15 + 0xc);
                  auVar320._2_2_ = auVar320._0_2_;
                  auVar320._4_2_ = auVar320._0_2_;
                  auVar320._6_2_ = auVar320._0_2_;
                  auVar320._8_2_ = auVar320._0_2_;
                  auVar320._10_2_ = auVar320._0_2_;
                  auVar320._12_2_ = auVar320._0_2_;
                  auVar320._14_2_ = auVar320._0_2_;
                  auVar320._16_2_ = auVar320._0_2_;
                  auVar320._18_2_ = auVar320._0_2_;
                  auVar320._20_2_ = auVar320._0_2_;
                  auVar320._22_2_ = auVar320._0_2_;
                  auVar320._24_2_ = auVar320._0_2_;
                  auVar320._26_2_ = auVar320._0_2_;
                  auVar320._28_2_ = auVar320._0_2_;
                  auVar320._30_2_ = auVar320._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar320,0x10);
                  auVar321._0_2_ = (undefined2)(uVar15 + 0xd);
                  auVar321._2_2_ = auVar321._0_2_;
                  auVar321._4_2_ = auVar321._0_2_;
                  auVar321._6_2_ = auVar321._0_2_;
                  auVar321._8_2_ = auVar321._0_2_;
                  auVar321._10_2_ = auVar321._0_2_;
                  auVar321._12_2_ = auVar321._0_2_;
                  auVar321._14_2_ = auVar321._0_2_;
                  auVar321._16_2_ = auVar321._0_2_;
                  auVar321._18_2_ = auVar321._0_2_;
                  auVar321._20_2_ = auVar321._0_2_;
                  auVar321._22_2_ = auVar321._0_2_;
                  auVar321._24_2_ = auVar321._0_2_;
                  auVar321._26_2_ = auVar321._0_2_;
                  auVar321._28_2_ = auVar321._0_2_;
                  auVar321._30_2_ = auVar321._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar321,0x20);
                  auVar322._0_2_ = (undefined2)(uVar15 + 0xe);
                  auVar322._2_2_ = auVar322._0_2_;
                  auVar322._4_2_ = auVar322._0_2_;
                  auVar322._6_2_ = auVar322._0_2_;
                  auVar322._8_2_ = auVar322._0_2_;
                  auVar322._10_2_ = auVar322._0_2_;
                  auVar322._12_2_ = auVar322._0_2_;
                  auVar322._14_2_ = auVar322._0_2_;
                  auVar322._16_2_ = auVar322._0_2_;
                  auVar322._18_2_ = auVar322._0_2_;
                  auVar322._20_2_ = auVar322._0_2_;
                  auVar322._22_2_ = auVar322._0_2_;
                  auVar322._24_2_ = auVar322._0_2_;
                  auVar322._26_2_ = auVar322._0_2_;
                  auVar322._28_2_ = auVar322._0_2_;
                  auVar322._30_2_ = auVar322._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar322,0x40);
                  auVar323._0_2_ = (undefined2)(uVar15 + 0xf);
                  auVar323._2_2_ = auVar323._0_2_;
                  auVar323._4_2_ = auVar323._0_2_;
                  auVar323._6_2_ = auVar323._0_2_;
                  auVar323._8_2_ = auVar323._0_2_;
                  auVar323._10_2_ = auVar323._0_2_;
                  auVar323._12_2_ = auVar323._0_2_;
                  auVar323._14_2_ = auVar323._0_2_;
                  auVar323._16_2_ = auVar323._0_2_;
                  auVar323._18_2_ = auVar323._0_2_;
                  auVar323._20_2_ = auVar323._0_2_;
                  auVar323._22_2_ = auVar323._0_2_;
                  auVar323._24_2_ = auVar323._0_2_;
                  auVar323._26_2_ = auVar323._0_2_;
                  auVar323._28_2_ = auVar323._0_2_;
                  auVar323._30_2_ = auVar323._0_2_;
                  auVar167 = vpblendw_avx2(auVar167,auVar323,0x80);
                  auVar167 = vpblendd_avx2(ZEXT1632(auVar283),auVar167,0xf0);
                  auVar167 = vpcmpgtw_avx2(auVar167,auVar105);
                  auVar167 = vpblendvb_avx2(auVar168,auVar51,auVar167);
                }
                in_ZMM6 = ZEXT3264(auVar167);
                lVar22 = 0x10;
                bVar28 = false;
              } while (bVar26);
              *(undefined1 (*) [32])(local_2060 + lVar12 * 0x20) = auVar170;
              *(undefined1 (*) [32])(local_1f60 + lVar12 * 0x20) = auVar167;
              uVar14 = uVar14 + dy;
            }
            else {
              do {
                *(undefined1 (*) [32])(local_1f60 + lVar22) = auVar51;
                *(undefined1 (*) [32])(local_1e60 + lVar22) = auVar51;
                lVar22 = lVar22 + 0x20;
              } while (lVar22 != 0);
            }
            if (0x26 < iVar18) break;
            lVar12 = lVar12 + 1;
            lVar9 = lVar9 + 0x20;
          } while (lVar12 != 8);
        }
        else {
          auVar81._8_4_ = 0x10;
          auVar81._0_8_ = 0x1000000010;
          auVar81._12_4_ = 0x10;
          auVar81._16_4_ = 0x10;
          auVar81._20_4_ = 0x10;
          auVar81._24_4_ = 0x10;
          auVar81._28_4_ = 0x10;
          auVar284 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar110._8_2_ = 0x26;
          auVar110._0_8_ = 0x26002600260026;
          auVar110._10_2_ = 0x26;
          auVar110._12_2_ = 0x26;
          auVar110._14_2_ = 0x26;
          auVar110._16_2_ = 0x26;
          auVar110._18_2_ = 0x26;
          auVar110._20_2_ = 0x26;
          auVar110._22_2_ = 0x26;
          auVar110._24_2_ = 0x26;
          auVar110._26_2_ = 0x26;
          auVar110._28_2_ = 0x26;
          auVar110._30_2_ = 0x26;
          auVar167 = vpmovsxbw_avx2(_DAT_0051e870);
          uVar14 = dy;
          do {
            uVar15 = (int)uVar14 >> 6;
            if (0x26 < (int)uVar15) goto LAB_003625dd;
            uVar21 = uVar14 >> 1;
            uVar19 = uVar21 & 0x1f801f;
            auVar159._0_8_ = CONCAT44(uVar21,uVar21) & 0x1f801f001f801f;
            auVar159._8_4_ = uVar19;
            auVar159._12_4_ = uVar19;
            auVar159._16_4_ = uVar19;
            auVar159._20_4_ = uVar19;
            auVar159._24_4_ = uVar19;
            auVar159._28_4_ = uVar19;
            auVar184 = auVar37;
            if (uVar15 - 0x28 < 0xfffffff7) {
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 8));
              auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 9));
              auVar168 = vpsubd_avx2(auVar168,auVar170);
              auVar170 = vpslld_avx2(auVar170,5);
              auVar168 = vpmulld_avx2(auVar168,auVar159);
              auVar170 = vpaddd_avx2(auVar170,auVar81);
              auVar170 = vpaddd_avx2(auVar168,auVar170);
              auVar170 = vpsrld_avx2(auVar170,5);
              auVar243._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar170._16_16_;
              auVar243._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37;
              auVar170 = vpackusdw_avx2(auVar170,auVar243);
              auVar184 = auVar170._0_16_;
            }
            auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar15));
            auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 1));
            auVar168 = vpsubd_avx2(auVar168,auVar170);
            auVar170 = vpslld_avx2(auVar170,5);
            auVar168 = vpmulld_avx2(auVar168,auVar159);
            auVar170 = vpaddd_avx2(auVar170,auVar81);
            auVar170 = vpaddd_avx2(auVar168,auVar170);
            auVar170 = vpsrld_avx2(auVar170,5);
            auVar170 = vpackusdw_avx2(auVar170,ZEXT1632(auVar170._16_16_));
            auVar287._0_2_ = (undefined2)uVar15;
            auVar287._2_2_ = auVar287._0_2_;
            auVar287._4_2_ = auVar287._0_2_;
            auVar287._6_2_ = auVar287._0_2_;
            auVar287._8_2_ = auVar287._0_2_;
            auVar287._10_2_ = auVar287._0_2_;
            auVar287._12_2_ = auVar287._0_2_;
            auVar287._14_2_ = auVar287._0_2_;
            auVar283 = vpaddw_avx(auVar287,auVar284);
            auVar299 = vpslldq_avx(auVar283,2);
            auVar299 = vpblendw_avx(auVar299,ZEXT416(uVar15),1);
            auVar283 = vpsrldq_avx(auVar283,0xe);
            auVar293._0_16_ = ZEXT116(0) * auVar283 + ZEXT116(1) * auVar37;
            auVar293._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * auVar283;
            auVar359._0_2_ = (undefined2)(uVar15 + 9);
            auVar359._2_2_ = auVar359._0_2_;
            auVar359._4_2_ = auVar359._0_2_;
            auVar359._6_2_ = auVar359._0_2_;
            auVar359._8_2_ = auVar359._0_2_;
            auVar359._10_2_ = auVar359._0_2_;
            auVar359._12_2_ = auVar359._0_2_;
            auVar359._14_2_ = auVar359._0_2_;
            auVar359._16_2_ = auVar359._0_2_;
            auVar359._18_2_ = auVar359._0_2_;
            auVar359._20_2_ = auVar359._0_2_;
            auVar359._22_2_ = auVar359._0_2_;
            auVar359._24_2_ = auVar359._0_2_;
            auVar359._26_2_ = auVar359._0_2_;
            auVar359._28_2_ = auVar359._0_2_;
            auVar359._30_2_ = auVar359._0_2_;
            auVar168 = vpblendw_avx2(auVar293,auVar359,2);
            auVar360._0_2_ = (undefined2)(uVar15 + 10);
            auVar360._2_2_ = auVar360._0_2_;
            auVar360._4_2_ = auVar360._0_2_;
            auVar360._6_2_ = auVar360._0_2_;
            auVar360._8_2_ = auVar360._0_2_;
            auVar360._10_2_ = auVar360._0_2_;
            auVar360._12_2_ = auVar360._0_2_;
            auVar360._14_2_ = auVar360._0_2_;
            auVar360._16_2_ = auVar360._0_2_;
            auVar360._18_2_ = auVar360._0_2_;
            auVar360._20_2_ = auVar360._0_2_;
            auVar360._22_2_ = auVar360._0_2_;
            auVar360._24_2_ = auVar360._0_2_;
            auVar360._26_2_ = auVar360._0_2_;
            auVar360._28_2_ = auVar360._0_2_;
            auVar360._30_2_ = auVar360._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar360,4);
            auVar361._0_2_ = (undefined2)(uVar15 + 0xb);
            auVar361._2_2_ = auVar361._0_2_;
            auVar361._4_2_ = auVar361._0_2_;
            auVar361._6_2_ = auVar361._0_2_;
            auVar361._8_2_ = auVar361._0_2_;
            auVar361._10_2_ = auVar361._0_2_;
            auVar361._12_2_ = auVar361._0_2_;
            auVar361._14_2_ = auVar361._0_2_;
            auVar361._16_2_ = auVar361._0_2_;
            auVar361._18_2_ = auVar361._0_2_;
            auVar361._20_2_ = auVar361._0_2_;
            auVar361._22_2_ = auVar361._0_2_;
            auVar361._24_2_ = auVar361._0_2_;
            auVar361._26_2_ = auVar361._0_2_;
            auVar361._28_2_ = auVar361._0_2_;
            auVar361._30_2_ = auVar361._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar361,8);
            auVar362._0_2_ = (undefined2)(uVar15 + 0xc);
            auVar362._2_2_ = auVar362._0_2_;
            auVar362._4_2_ = auVar362._0_2_;
            auVar362._6_2_ = auVar362._0_2_;
            auVar362._8_2_ = auVar362._0_2_;
            auVar362._10_2_ = auVar362._0_2_;
            auVar362._12_2_ = auVar362._0_2_;
            auVar362._14_2_ = auVar362._0_2_;
            auVar362._16_2_ = auVar362._0_2_;
            auVar362._18_2_ = auVar362._0_2_;
            auVar362._20_2_ = auVar362._0_2_;
            auVar362._22_2_ = auVar362._0_2_;
            auVar362._24_2_ = auVar362._0_2_;
            auVar362._26_2_ = auVar362._0_2_;
            auVar362._28_2_ = auVar362._0_2_;
            auVar362._30_2_ = auVar362._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar362,0x10);
            auVar363._0_2_ = (undefined2)(uVar15 + 0xd);
            auVar363._2_2_ = auVar363._0_2_;
            auVar363._4_2_ = auVar363._0_2_;
            auVar363._6_2_ = auVar363._0_2_;
            auVar363._8_2_ = auVar363._0_2_;
            auVar363._10_2_ = auVar363._0_2_;
            auVar363._12_2_ = auVar363._0_2_;
            auVar363._14_2_ = auVar363._0_2_;
            auVar363._16_2_ = auVar363._0_2_;
            auVar363._18_2_ = auVar363._0_2_;
            auVar363._20_2_ = auVar363._0_2_;
            auVar363._22_2_ = auVar363._0_2_;
            auVar363._24_2_ = auVar363._0_2_;
            auVar363._26_2_ = auVar363._0_2_;
            auVar363._28_2_ = auVar363._0_2_;
            auVar363._30_2_ = auVar363._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar363,0x20);
            auVar364._0_2_ = (undefined2)(uVar15 + 0xe);
            auVar364._2_2_ = auVar364._0_2_;
            auVar364._4_2_ = auVar364._0_2_;
            auVar364._6_2_ = auVar364._0_2_;
            auVar364._8_2_ = auVar364._0_2_;
            auVar364._10_2_ = auVar364._0_2_;
            auVar364._12_2_ = auVar364._0_2_;
            auVar364._14_2_ = auVar364._0_2_;
            auVar364._16_2_ = auVar364._0_2_;
            auVar364._18_2_ = auVar364._0_2_;
            auVar364._20_2_ = auVar364._0_2_;
            auVar364._22_2_ = auVar364._0_2_;
            auVar364._24_2_ = auVar364._0_2_;
            auVar364._26_2_ = auVar364._0_2_;
            auVar364._28_2_ = auVar364._0_2_;
            auVar364._30_2_ = auVar364._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar364,0x40);
            auVar365._0_2_ = (undefined2)(uVar15 + 0xf);
            auVar365._2_2_ = auVar365._0_2_;
            auVar365._4_2_ = auVar365._0_2_;
            auVar365._6_2_ = auVar365._0_2_;
            auVar365._8_2_ = auVar365._0_2_;
            auVar365._10_2_ = auVar365._0_2_;
            auVar365._12_2_ = auVar365._0_2_;
            auVar365._14_2_ = auVar365._0_2_;
            auVar365._16_2_ = auVar365._0_2_;
            auVar365._18_2_ = auVar365._0_2_;
            auVar365._20_2_ = auVar365._0_2_;
            auVar365._22_2_ = auVar365._0_2_;
            auVar365._24_2_ = auVar365._0_2_;
            auVar365._26_2_ = auVar365._0_2_;
            auVar365._28_2_ = auVar365._0_2_;
            auVar365._30_2_ = auVar365._0_2_;
            auVar168 = vpblendw_avx2(auVar168,auVar365,0x80);
            auVar168 = vpblendd_avx2(ZEXT1632(auVar299),auVar168,0xf0);
            auVar168 = vpcmpgtw_avx2(auVar168,auVar110);
            auVar173._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar170._0_16_;
            auVar173._16_16_ = ZEXT116(0) * auVar170._16_16_ + ZEXT116(1) * auVar184;
            auVar170 = vpblendvb_avx2(auVar173,auVar51,auVar168);
            *(undefined1 (*) [32])(local_1f60 + lVar9) = auVar170;
            auVar170 = auVar51;
            if ((int)uVar15 < 0x17) {
              auVar184 = auVar37;
              if (uVar15 - 0x18 < 0xfffffff7) {
                auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x18));
                auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x19));
                auVar168 = vpsubd_avx2(auVar168,auVar170);
                auVar170 = vpslld_avx2(auVar170,5);
                auVar168 = vpmulld_avx2(auVar168,auVar159);
                auVar170 = vpaddd_avx2(auVar170,auVar81);
                auVar170 = vpaddd_avx2(auVar168,auVar170);
                auVar170 = vpsrld_avx2(auVar170,5);
                auVar244._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar170._16_16_;
                auVar244._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37;
                auVar170 = vpackusdw_avx2(auVar170,auVar244);
                auVar184 = auVar170._0_16_;
              }
              auVar170 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x10));
              auVar168 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar15 + 0x11));
              auVar168 = vpsubd_avx2(auVar168,auVar170);
              auVar170 = vpslld_avx2(auVar170,5);
              auVar168 = vpmulld_avx2(auVar168,auVar159);
              auVar170 = vpaddd_avx2(auVar170,auVar81);
              auVar170 = vpaddd_avx2(auVar168,auVar170);
              auVar170 = vpsrld_avx2(auVar170,5);
              auVar170 = vpackusdw_avx2(auVar170,ZEXT1632(auVar170._16_16_));
              auVar245._2_2_ = auVar287._0_2_;
              auVar245._0_2_ = auVar287._0_2_;
              auVar245._4_2_ = auVar287._0_2_;
              auVar245._6_2_ = auVar287._0_2_;
              auVar245._8_2_ = auVar287._0_2_;
              auVar245._10_2_ = auVar287._0_2_;
              auVar245._12_2_ = auVar287._0_2_;
              auVar245._14_2_ = auVar287._0_2_;
              auVar245._16_2_ = auVar287._0_2_;
              auVar245._18_2_ = auVar287._0_2_;
              auVar245._20_2_ = auVar287._0_2_;
              auVar245._22_2_ = auVar287._0_2_;
              auVar245._24_2_ = auVar287._0_2_;
              auVar245._26_2_ = auVar287._0_2_;
              auVar245._28_2_ = auVar287._0_2_;
              auVar245._30_2_ = auVar287._0_2_;
              auVar168 = vpaddw_avx2(auVar245,auVar167);
              auVar168 = vpcmpgtw_avx2(auVar168,auVar110);
              auVar160._0_16_ = ZEXT116(0) * auVar184 + ZEXT116(1) * auVar170._0_16_;
              auVar160._16_16_ = ZEXT116(0) * auVar170._16_16_ + ZEXT116(1) * auVar184;
              auVar170 = vpblendvb_avx2(auVar160,auVar51,auVar168);
            }
            *(undefined1 (*) [32])(local_1e60 + lVar9) = auVar170;
            uVar14 = uVar14 + dy;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0);
        }
        goto LAB_003625f5;
      }
      if (bd < 0xc) {
        uStackY_26a8 = 0x361695;
        highbd_dr_prediction_z1_64xN_avx2(0x10,(uint16_t *)local_2060,0x40,left,dy,iVar18);
      }
      else {
        uStackY_26a8 = 0x362961;
        highbd_dr_prediction_32bit_z1_64xN_avx2(0x10,(uint16_t *)local_2060,0x40,left,dy,iVar18);
      }
      iVar18 = 0x10;
      pitchDst = stride;
      puVar13 = dst;
    }
  }
  pitchSrc = 0x40;
  iVar23 = 0x40;
LAB_00363a94:
  uStackY_26a8 = 0x363a99;
  highbd_transpose((uint16_t *)local_2060,pitchSrc,puVar13,pitchDst,iVar18,iVar23);
  return;
LAB_00363087:
  do {
    *(undefined1 (*) [32])(local_1e60 + lVar9) = auVar53;
    *(undefined1 (*) [32])(local_1c60 + lVar9) = auVar53;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
LAB_0036309f:
  uVar11 = 0xfffffffffffffff8;
  lVar9 = 0xe0;
  do {
    auVar170 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2140 + lVar9),
                               *(undefined1 (*) [32])(auStack_2120 + lVar9));
    auVar168 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2100 + lVar9),
                               *(undefined1 (*) [32])(auStack_20e0 + lVar9));
    auVar130 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_20c0 + lVar9),
                               *(undefined1 (*) [32])(auStack_20a0 + lVar9));
    auVar161 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2080 + lVar9),
                               *(undefined1 (*) [32])(local_2060 + lVar9));
    auVar167 = vpunpckldq_avx2(auVar170,auVar168);
    auVar175 = vpunpckldq_avx2(auVar130,auVar161);
    auVar176 = vpunpcklqdq_avx2(auVar167,auVar175);
    *(undefined1 (*) [32])(auStackY_2740 + lVar9) = auVar176;
    auVar167 = vpunpckhqdq_avx2(auVar167,auVar175);
    *(undefined1 (*) [32])(auStackY_2720 + lVar9) = auVar167;
    auVar167 = vpunpckhdq_avx2(auVar170,auVar168);
    auVar170 = vpunpckhdq_avx2(auVar130,auVar161);
    auVar168 = vpunpcklqdq_avx2(auVar167,auVar170);
    *(undefined1 (*) [32])(auStackY_2700 + lVar9) = auVar168;
    auVar167 = vpunpckhqdq_avx2(auVar167,auVar170);
    *(undefined1 (*) [32])((long)auStackY_26e0 + lVar9) = auVar167;
    auVar167 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2140 + lVar9),
                               *(undefined1 (*) [32])(auStack_2120 + lVar9));
    auVar170 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2100 + lVar9),
                               *(undefined1 (*) [32])(auStack_20e0 + lVar9));
    auVar168 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_20c0 + lVar9),
                               *(undefined1 (*) [32])(auStack_20a0 + lVar9));
    auVar130 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2080 + lVar9),
                               *(undefined1 (*) [32])(local_2060 + lVar9));
    auVar161 = vpunpckldq_avx2(auVar167,auVar170);
    auVar175 = vpunpckldq_avx2(auVar168,auVar130);
    auVar176 = vpunpcklqdq_avx2(auVar161,auVar175);
    *(undefined1 (*) [32])(auStackY_26c0 + lVar9) = auVar176;
    auVar161 = vpunpckhqdq_avx2(auVar161,auVar175);
    *(undefined1 (*) [32])(local_2680 + lVar9 + -0x20) = auVar161;
    auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
    auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
    auVar168 = vpunpcklqdq_avx2(auVar167,auVar170);
    *(undefined1 (*) [32])(local_2680 + lVar9) = auVar168;
    auVar167 = vpunpckhqdq_avx2(auVar167,auVar170);
    *(undefined1 (*) [32])(local_2660 + lVar9) = auVar167;
    uVar11 = uVar11 + 8;
    lVar9 = lVar9 + 0x100;
  } while (uVar11 < 0x18);
  lVar9 = stride * 2;
  lVar12 = 0;
  bVar28 = true;
  do {
    bVar26 = bVar28;
    lVar22 = lVar12 * 0x20;
    puVar13 = (uint16_t *)((long)dst + lVar9 * lVar12);
    lVar25 = 0;
    do {
      uVar5 = *(undefined8 *)((long)(local_2660 + lVar25 + lVar22) + 8);
      *(undefined8 *)puVar13 = *(undefined8 *)(local_2660 + lVar25 + lVar22);
      *(undefined8 *)(puVar13 + 4) = uVar5;
      lVar25 = lVar25 + 0x20;
      puVar13 = puVar13 + stride;
    } while (lVar25 != 0x100);
    puVar24 = (undefined8 *)((long)dst + lVar9 * lVar12 + 0x10);
    lVar25 = 0;
    do {
      uVar5 = *(undefined8 *)((long)(local_2560 + lVar25 + lVar22 + -0x2560 + 0x2560) + 8);
      *puVar24 = *(undefined8 *)(local_2560 + lVar25 + lVar22 + -0x2560 + 0x2560);
      puVar24[1] = uVar5;
      lVar25 = lVar25 + 0x20;
      puVar24 = (undefined8 *)((long)puVar24 + stride * 2);
    } while (lVar25 != 0x100);
    pauVar20 = (undefined1 (*) [32])((lVar12 + 8) * lVar9 + (long)dst);
    lVar12 = 0;
    do {
      auVar167 = vpblendd_avx2(ZEXT1632(*(undefined1 (*) [16])(local_2660 + lVar12 + lVar22 + 0x10))
                               ,*(undefined1 (*) [32])
                                 (local_2560 + lVar12 + lVar22 + -0x2560 + 0x2560),0xf0);
      *pauVar20 = auVar167;
      lVar12 = lVar12 + 0x20;
      pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar9);
    } while (lVar12 != 0x100);
    lVar12 = 0x10;
    bVar28 = false;
  } while (bVar26);
  return;
LAB_003625dd:
  do {
    *(undefined1 (*) [32])(local_1f60 + lVar9) = auVar51;
    *(undefined1 (*) [32])(local_1e60 + lVar9) = auVar51;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
LAB_003625f5:
  pauVar20 = (undefined1 (*) [32])local_2660;
  pauVar16 = &local_2060;
  bVar28 = true;
  do {
    bVar26 = bVar28;
    auVar167 = *pauVar16;
    auVar170 = pauVar16[1];
    auVar168 = pauVar16[2];
    auVar130 = pauVar16[3];
    auVar250 = vpunpcklwd_avx2(auVar167,auVar170);
    auVar251 = vpunpcklwd_avx2(auVar168,auVar130);
    auVar161 = pauVar16[4];
    auVar175 = pauVar16[5];
    auVar252 = vpunpcklwd_avx2(auVar161,auVar175);
    auVar176 = pauVar16[6];
    auVar248 = pauVar16[7];
    auVar253 = vpunpcklwd_avx2(auVar176,auVar248);
    auVar249 = vpunpckldq_avx2(auVar250,auVar251);
    auVar254 = vpunpckldq_avx2(auVar252,auVar253);
    auVar77 = vpunpcklqdq_avx2(auVar249,auVar254);
    *pauVar20 = auVar77;
    auVar249 = vpunpckhqdq_avx2(auVar249,auVar254);
    pauVar20[1] = auVar249;
    auVar249 = vpunpckhdq_avx2(auVar250,auVar251);
    auVar250 = vpunpckhdq_avx2(auVar252,auVar253);
    auVar251 = vpunpcklqdq_avx2(auVar249,auVar250);
    pauVar20[2] = auVar251;
    auVar249 = vpunpckhqdq_avx2(auVar249,auVar250);
    pauVar20[3] = auVar249;
    auVar167 = vpunpckhwd_avx2(auVar167,auVar170);
    auVar170 = vpunpckhwd_avx2(auVar168,auVar130);
    auVar168 = vpunpckhwd_avx2(auVar161,auVar175);
    auVar130 = vpunpckhwd_avx2(auVar176,auVar248);
    auVar161 = vpunpckldq_avx2(auVar167,auVar170);
    auVar175 = vpunpckldq_avx2(auVar168,auVar130);
    auVar176 = vpunpcklqdq_avx2(auVar161,auVar175);
    pauVar20[4] = auVar176;
    auVar161 = vpunpckhqdq_avx2(auVar161,auVar175);
    pauVar20[5] = auVar161;
    auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
    auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
    auVar168 = vpunpcklqdq_avx2(auVar167,auVar170);
    pauVar20[6] = auVar168;
    auVar167 = vpunpckhqdq_avx2(auVar167,auVar170);
    pauVar20[7] = auVar167;
    pauVar20 = &local_2560;
    pauVar16 = &local_1f60;
    bVar28 = false;
  } while (bVar26);
  lVar9 = 0;
  puVar13 = dst;
  do {
    uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
    *(undefined8 *)puVar13 = *(undefined8 *)(local_2660 + lVar9);
    *(undefined8 *)(puVar13 + 4) = uVar5;
    lVar9 = lVar9 + 0x20;
    puVar13 = puVar13 + stride;
  } while (lVar9 != 0x100);
  puVar13 = dst + stride * 8;
  lVar9 = 0;
  do {
    uVar5 = *(undefined8 *)(local_2640 + lVar9 + -8);
    *(undefined8 *)(puVar13 + 8) = *(undefined8 *)(local_2660 + lVar9 + 0x10);
    *(undefined8 *)(puVar13 + 0xc) = uVar5;
    puVar13 = puVar13 + stride;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x100);
  puVar13 = dst + stride * 0x10;
  lVar9 = 0x100;
  do {
    uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
    *(undefined8 *)puVar13 = *(undefined8 *)(local_2660 + lVar9);
    *(undefined8 *)(puVar13 + 4) = uVar5;
    lVar9 = lVar9 + 0x20;
    puVar13 = puVar13 + stride;
  } while (lVar9 != 0x200);
  puVar13 = dst + stride * 0x18;
  lVar9 = 0x100;
  do {
    uVar5 = *(undefined8 *)(local_2640 + lVar9 + -8);
    *(undefined8 *)(puVar13 + 8) = *(undefined8 *)(local_2660 + lVar9 + 0x10);
    *(undefined8 *)(puVar13 + 0xc) = uVar5;
    puVar13 = puVar13 + stride;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  return;
LAB_00360627:
  do {
    *(undefined1 (*) [32])(local_1c60 + lVar9) = auVar46;
    *(undefined1 (*) [32])(auStack_1860 + lVar9) = auVar46;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
LAB_0036063f:
  auVar167 = vpunpcklwd_avx2(local_2060,local_2040);
  auVar170 = vpunpcklwd_avx2(local_2020,local_2000);
  auVar168 = vpunpcklwd_avx2(local_1fe0,local_1fc0);
  auVar130 = vpunpcklwd_avx2(local_1fa0,local_1f80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2620 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2600 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_2060,local_2040);
  auVar170 = vpunpckhwd_avx2(local_2020,local_2000);
  auVar168 = vpunpckhwd_avx2(local_1fe0,local_1fc0);
  auVar130 = vpunpckhwd_avx2(local_1fa0,local_1f80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_25e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_25c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_25a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2580 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpcklwd_avx2(local_1f60,local_1f40);
  auVar170 = vpunpcklwd_avx2(local_1f20,local_1f00);
  auVar168 = vpunpcklwd_avx2(local_1ee0,local_1ec0);
  auVar130 = vpunpcklwd_avx2(local_1ea0,local_1e80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_2560 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2540 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2520 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2500 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_1f60,local_1f40);
  auVar170 = vpunpckhwd_avx2(local_1f20,local_1f00);
  auVar168 = vpunpckhwd_avx2(local_1ee0,local_1ec0);
  auVar130 = vpunpckhwd_avx2(local_1ea0,local_1e80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_24e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_24c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_24a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2480 = vpunpckhqdq_avx2(auVar167,auVar170);
  lVar9 = 0x100;
  do {
    auVar167 = *(undefined1 (*) [32])(local_2660 + lVar9);
    auVar170 = vperm2i128_avx2(auVar167,*(undefined1 (*) [32])((long)auStackY_2760 + lVar9),2);
    auVar47._0_16_ =
         ZEXT116(1) * *(undefined1 (*) [16])(auStackY_2750 + lVar9) + ZEXT116(0) * auVar167._0_16_;
    auVar47._16_16_ =
         ZEXT116(1) * auVar167._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])(auStackY_2750 + lVar9);
    *(undefined1 (*) [32])(auStack_2360 + lVar9) = auVar170;
    *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar47;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  lVar9 = 0;
  puVar13 = dst;
  do {
    uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
    uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
    uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
    *(undefined8 *)puVar13 = *(undefined8 *)((long)auStack_2260 + lVar9);
    *(undefined8 *)(puVar13 + 4) = uVar5;
    *(undefined8 *)(puVar13 + 8) = uVar7;
    *(undefined8 *)(puVar13 + 0xc) = uVar8;
    lVar9 = lVar9 + 0x20;
    puVar13 = puVar13 + stride;
  } while (lVar9 != 0x200);
  auVar167 = vpunpcklwd_avx2(local_1e60,local_1e40);
  auVar170 = vpunpcklwd_avx2(local_1e20,local_1e00);
  auVar168 = vpunpcklwd_avx2(local_1de0,local_1dc0);
  auVar130 = vpunpcklwd_avx2(local_1da0,local_1d80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2620 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2600 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_1e60,local_1e40);
  auVar170 = vpunpckhwd_avx2(local_1e20,local_1e00);
  auVar168 = vpunpckhwd_avx2(local_1de0,local_1dc0);
  auVar130 = vpunpckhwd_avx2(local_1da0,local_1d80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_25e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_25c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_25a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2580 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpcklwd_avx2(local_1d60,local_1d40);
  auVar170 = vpunpcklwd_avx2(local_1d20,local_1d00);
  auVar168 = vpunpcklwd_avx2(local_1ce0,local_1cc0);
  auVar130 = vpunpcklwd_avx2(local_1ca0,local_1c80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_2560 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2540 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2520 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2500 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_1d60,local_1d40);
  auVar170 = vpunpckhwd_avx2(local_1d20,local_1d00);
  auVar168 = vpunpckhwd_avx2(local_1ce0,local_1cc0);
  auVar130 = vpunpckhwd_avx2(local_1ca0,local_1c80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_24e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_24c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_24a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2480 = vpunpckhqdq_avx2(auVar167,auVar170);
  lVar9 = 0x100;
  do {
    auVar167 = *(undefined1 (*) [32])(local_2660 + lVar9);
    auVar170 = vperm2i128_avx2(auVar167,*(undefined1 (*) [32])((long)auStackY_2760 + lVar9),2);
    auVar48._0_16_ =
         ZEXT116(1) * *(undefined1 (*) [16])(auStackY_2750 + lVar9) + ZEXT116(0) * auVar167._0_16_;
    auVar48._16_16_ =
         ZEXT116(1) * auVar167._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])(auStackY_2750 + lVar9);
    *(undefined1 (*) [32])(auStack_2360 + lVar9) = auVar170;
    *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar48;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  puVar13 = dst + 0x10;
  lVar9 = 0;
  do {
    uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
    uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
    uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
    *(undefined8 *)puVar13 = *(undefined8 *)((long)auStack_2260 + lVar9);
    *(undefined8 *)(puVar13 + 4) = uVar5;
    *(undefined8 *)(puVar13 + 8) = uVar7;
    *(undefined8 *)(puVar13 + 0xc) = uVar8;
    lVar9 = lVar9 + 0x20;
    puVar13 = puVar13 + stride;
  } while (lVar9 != 0x200);
  auVar167 = vpunpcklwd_avx2(local_1c60,local_1c40);
  auVar170 = vpunpcklwd_avx2(local_1c20,local_1c00);
  auVar168 = vpunpcklwd_avx2(local_1be0,local_1bc0);
  auVar130 = vpunpcklwd_avx2(local_1ba0,local_1b80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2620 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2600 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_1c60,local_1c40);
  auVar170 = vpunpckhwd_avx2(local_1c20,local_1c00);
  auVar168 = vpunpckhwd_avx2(local_1be0,local_1bc0);
  auVar130 = vpunpckhwd_avx2(local_1ba0,local_1b80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_25e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_25c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_25a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2580 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpcklwd_avx2(local_1b60,local_1b40);
  auVar170 = vpunpcklwd_avx2(local_1b20,local_1b00);
  auVar168 = vpunpcklwd_avx2(local_1ae0,local_1ac0);
  auVar130 = vpunpcklwd_avx2(local_1aa0,local_1a80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_2560 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2540 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2520 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2500 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_1b60,local_1b40);
  auVar170 = vpunpckhwd_avx2(local_1b20,local_1b00);
  auVar168 = vpunpckhwd_avx2(local_1ae0,local_1ac0);
  auVar130 = vpunpckhwd_avx2(local_1aa0,local_1a80);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_24e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_24c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_24a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2480 = vpunpckhqdq_avx2(auVar167,auVar170);
  lVar9 = 0x100;
  do {
    auVar167 = *(undefined1 (*) [32])(local_2660 + lVar9);
    auVar170 = vperm2i128_avx2(auVar167,*(undefined1 (*) [32])((long)auStackY_2760 + lVar9),2);
    auVar49._0_16_ =
         ZEXT116(1) * *(undefined1 (*) [16])(auStackY_2750 + lVar9) + ZEXT116(0) * auVar167._0_16_;
    auVar49._16_16_ =
         ZEXT116(1) * auVar167._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])(auStackY_2750 + lVar9);
    *(undefined1 (*) [32])(auStack_2360 + lVar9) = auVar170;
    *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar49;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  puVar13 = dst + stride * 0x10;
  lVar9 = 0;
  do {
    uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
    uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
    uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
    *(undefined8 *)puVar13 = *(undefined8 *)((long)auStack_2260 + lVar9);
    *(undefined8 *)(puVar13 + 4) = uVar5;
    *(undefined8 *)(puVar13 + 8) = uVar7;
    *(undefined8 *)(puVar13 + 0xc) = uVar8;
    puVar13 = puVar13 + stride;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  auVar167 = vpunpcklwd_avx2(local_1a60,local_1a40);
  auVar170 = vpunpcklwd_avx2(local_1a20,local_1a00);
  auVar168 = vpunpcklwd_avx2(local_19e0,local_19c0);
  auVar130 = vpunpcklwd_avx2(local_19a0,local_1980);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  _local_2660 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2640 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2620 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2600 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_1a60,local_1a40);
  auVar170 = vpunpckhwd_avx2(local_1a20,local_1a00);
  auVar168 = vpunpckhwd_avx2(local_19e0,local_19c0);
  auVar130 = vpunpckhwd_avx2(local_19a0,local_1980);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_25e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_25c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_25a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2580 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpcklwd_avx2(local_1960,local_1940);
  auVar170 = vpunpcklwd_avx2(local_1920,local_1900);
  auVar168 = vpunpcklwd_avx2(local_18e0,local_18c0);
  auVar130 = vpunpcklwd_avx2(local_18a0,local_1880);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_2560 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_2540 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_2520 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2500 = vpunpckhqdq_avx2(auVar167,auVar170);
  auVar167 = vpunpckhwd_avx2(local_1960,local_1940);
  auVar170 = vpunpckhwd_avx2(local_1920,local_1900);
  auVar168 = vpunpckhwd_avx2(local_18e0,local_18c0);
  auVar130 = vpunpckhwd_avx2(local_18a0,local_1880);
  auVar161 = vpunpckldq_avx2(auVar167,auVar170);
  auVar175 = vpunpckldq_avx2(auVar168,auVar130);
  local_24e0 = vpunpcklqdq_avx2(auVar161,auVar175);
  local_24c0 = vpunpckhqdq_avx2(auVar161,auVar175);
  auVar167 = vpunpckhdq_avx2(auVar167,auVar170);
  auVar170 = vpunpckhdq_avx2(auVar168,auVar130);
  local_24a0 = vpunpcklqdq_avx2(auVar167,auVar170);
  local_2480 = vpunpckhqdq_avx2(auVar167,auVar170);
  lVar9 = 0x100;
  do {
    auVar167 = *(undefined1 (*) [32])(local_2660 + lVar9);
    auVar170 = vperm2i128_avx2(auVar167,*(undefined1 (*) [32])((long)auStackY_2760 + lVar9),2);
    auVar50._0_16_ =
         ZEXT116(1) * *(undefined1 (*) [16])(auStackY_2750 + lVar9) + ZEXT116(0) * auVar167._0_16_;
    auVar50._16_16_ =
         ZEXT116(1) * auVar167._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])(auStackY_2750 + lVar9);
    *(undefined1 (*) [32])(auStack_2360 + lVar9) = auVar170;
    *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar50;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  puVar13 = dst + stride * 0x10 + 0x10;
  lVar9 = 0;
  do {
    uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
    uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
    uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
    *(undefined8 *)puVar13 = *(undefined8 *)((long)auStack_2260 + lVar9);
    *(undefined8 *)(puVar13 + 4) = uVar5;
    *(undefined8 *)(puVar13 + 8) = uVar7;
    *(undefined8 *)(puVar13 + 0xc) = uVar8;
    puVar13 = puVar13 + stride;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  return;
}

Assistant:

void av1_highbd_dr_prediction_z3_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_left,
                                      int dx, int dy, int bd) {
  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);
  if (bw == bh) {
    switch (bw) {
      case 4:
        highbd_dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 8:
        highbd_dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 16:
        highbd_dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 32:
        highbd_dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 64:
        highbd_dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            highbd_dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            highbd_dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
  return;
}